

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined4 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined8 uVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  uint uVar124;
  ulong uVar125;
  long lVar126;
  Geometry *pGVar127;
  RTCIntersectArguments *pRVar128;
  long lVar129;
  ulong uVar130;
  RTCIntersectArguments *pRVar131;
  ulong uVar132;
  ulong uVar133;
  undefined4 uVar134;
  undefined8 unaff_R14;
  float fVar136;
  float fVar137;
  float fVar135;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar158;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar167;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar169;
  float fVar168;
  float fVar186;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar184;
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar193;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar195;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar194;
  undefined1 auVar202 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar210;
  float fVar212;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar221 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar222;
  float fVar223;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar233;
  float fVar235;
  float fVar240;
  float fVar243;
  float fVar246;
  undefined1 auVar226 [32];
  float fVar237;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar234;
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  float fVar247;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar248;
  float fVar255;
  float fVar256;
  undefined1 auVar249 [16];
  float fVar257;
  undefined1 auVar250 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar251 [32];
  float fVar261;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar262;
  float fVar263;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar270;
  float fVar272;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar266 [32];
  float fVar274;
  undefined1 auVar267 [32];
  float fVar271;
  float fVar273;
  undefined1 auVar268 [32];
  float fVar278;
  undefined1 auVar269 [32];
  float fVar279;
  float fVar280;
  undefined1 auVar281 [16];
  float fVar291;
  float fVar293;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar300 [64];
  float fVar307;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar318;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  float fVar326;
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float in_register_0000151c;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar336;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar343;
  float fVar344;
  float fVar348;
  float fVar350;
  float fVar352;
  float in_register_0000159c;
  undefined1 auVar345 [32];
  float fVar349;
  float fVar351;
  float fVar353;
  undefined1 auVar346 [32];
  undefined1 auVar347 [64];
  float fVar354;
  float fVar355;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float in_register_000015dc;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar362 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_804;
  undefined1 local_800 [16];
  long local_7f0;
  Precalculations *local_7e8;
  Primitive *local_7e0;
  undefined4 local_7d4;
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined8 local_630;
  undefined4 local_628;
  float local_624;
  uint local_620;
  undefined4 local_61c;
  undefined4 local_618;
  uint local_614;
  uint local_610;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined1 local_530 [8];
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar174 [24];
  undefined1 auVar208 [64];
  undefined1 auVar330 [12];
  
  PVar16 = prim[1];
  uVar125 = (ulong)(byte)PVar16;
  fVar262 = *(float *)(prim + uVar125 * 0x19 + 0x12);
  auVar201 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar125 * 0x19 + 6));
  auVar249._0_4_ = fVar262 * (ray->dir).field_0.m128[0];
  auVar249._4_4_ = fVar262 * (ray->dir).field_0.m128[1];
  auVar249._8_4_ = fVar262 * (ray->dir).field_0.m128[2];
  auVar249._12_4_ = fVar262 * (ray->dir).field_0.m128[3];
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar170._0_4_ = fVar262 * auVar201._0_4_;
  auVar170._4_4_ = fVar262 * auVar201._4_4_;
  auVar170._8_4_ = fVar262 * auVar201._8_4_;
  auVar170._12_4_ = fVar262 * auVar201._12_4_;
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 10)));
  auVar140._16_16_ = auVar201;
  auVar140._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 5 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 5 + 10)));
  auVar203._16_16_ = auVar201;
  auVar203._0_16_ = auVar362;
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 10)));
  auVar310 = vcvtdq2ps_avx(auVar203);
  auVar216._16_16_ = auVar201;
  auVar216._0_16_ = auVar362;
  auVar20 = vcvtdq2ps_avx(auVar216);
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xb + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xb + 10)));
  auVar217._16_16_ = auVar201;
  auVar217._0_16_ = auVar362;
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xc + 6)));
  auVar21 = vcvtdq2ps_avx(auVar217);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xc + 10)));
  auVar266._16_16_ = auVar201;
  auVar266._0_16_ = auVar362;
  auVar22 = vcvtdq2ps_avx(auVar266);
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xd + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xd + 10)));
  auVar282._16_16_ = auVar201;
  auVar282._0_16_ = auVar362;
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x12 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x12 + 10)));
  auVar23 = vcvtdq2ps_avx(auVar282);
  auVar283._16_16_ = auVar201;
  auVar283._0_16_ = auVar362;
  auVar24 = vcvtdq2ps_avx(auVar283);
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x13 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x13 + 10)));
  auVar308._16_16_ = auVar201;
  auVar308._0_16_ = auVar362;
  auVar362 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x14 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar308);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x14 + 10)));
  auVar319._16_16_ = auVar201;
  auVar319._0_16_ = auVar362;
  auVar26 = vcvtdq2ps_avx(auVar319);
  auVar362 = vshufps_avx(auVar249,auVar249,0);
  auVar201 = vshufps_avx(auVar249,auVar249,0x55);
  auVar221 = vshufps_avx(auVar249,auVar249,0xaa);
  fVar262 = auVar221._0_4_;
  fVar270 = auVar221._4_4_;
  fVar272 = auVar221._8_4_;
  fVar274 = auVar221._12_4_;
  fVar275 = auVar201._0_4_;
  fVar276 = auVar201._4_4_;
  fVar277 = auVar201._8_4_;
  fVar222 = auVar201._12_4_;
  fVar233 = auVar362._0_4_;
  fVar235 = auVar362._4_4_;
  fVar237 = auVar362._8_4_;
  fVar240 = auVar362._12_4_;
  auVar331._0_4_ = fVar233 * auVar140._0_4_ + fVar275 * auVar310._0_4_ + fVar262 * auVar20._0_4_;
  auVar331._4_4_ = fVar235 * auVar140._4_4_ + fVar276 * auVar310._4_4_ + fVar270 * auVar20._4_4_;
  auVar331._8_4_ = fVar237 * auVar140._8_4_ + fVar277 * auVar310._8_4_ + fVar272 * auVar20._8_4_;
  auVar331._12_4_ = fVar240 * auVar140._12_4_ + fVar222 * auVar310._12_4_ + fVar274 * auVar20._12_4_
  ;
  auVar331._16_4_ = fVar233 * auVar140._16_4_ + fVar275 * auVar310._16_4_ + fVar262 * auVar20._16_4_
  ;
  auVar331._20_4_ = fVar235 * auVar140._20_4_ + fVar276 * auVar310._20_4_ + fVar270 * auVar20._20_4_
  ;
  auVar331._24_4_ = fVar237 * auVar140._24_4_ + fVar277 * auVar310._24_4_ + fVar272 * auVar20._24_4_
  ;
  auVar331._28_4_ = fVar222 + in_register_000015dc + in_register_0000151c;
  auVar328._0_4_ = fVar233 * auVar21._0_4_ + fVar275 * auVar22._0_4_ + auVar23._0_4_ * fVar262;
  auVar328._4_4_ = fVar235 * auVar21._4_4_ + fVar276 * auVar22._4_4_ + auVar23._4_4_ * fVar270;
  auVar328._8_4_ = fVar237 * auVar21._8_4_ + fVar277 * auVar22._8_4_ + auVar23._8_4_ * fVar272;
  auVar328._12_4_ = fVar240 * auVar21._12_4_ + fVar222 * auVar22._12_4_ + auVar23._12_4_ * fVar274;
  auVar328._16_4_ = fVar233 * auVar21._16_4_ + fVar275 * auVar22._16_4_ + auVar23._16_4_ * fVar262;
  auVar328._20_4_ = fVar235 * auVar21._20_4_ + fVar276 * auVar22._20_4_ + auVar23._20_4_ * fVar270;
  auVar328._24_4_ = fVar237 * auVar21._24_4_ + fVar277 * auVar22._24_4_ + auVar23._24_4_ * fVar272;
  auVar328._28_4_ = fVar222 + in_register_000015dc + in_register_0000159c;
  auVar251._0_4_ = fVar233 * auVar24._0_4_ + fVar275 * auVar25._0_4_ + auVar26._0_4_ * fVar262;
  auVar251._4_4_ = fVar235 * auVar24._4_4_ + fVar276 * auVar25._4_4_ + auVar26._4_4_ * fVar270;
  auVar251._8_4_ = fVar237 * auVar24._8_4_ + fVar277 * auVar25._8_4_ + auVar26._8_4_ * fVar272;
  auVar251._12_4_ = fVar240 * auVar24._12_4_ + fVar222 * auVar25._12_4_ + auVar26._12_4_ * fVar274;
  auVar251._16_4_ = fVar233 * auVar24._16_4_ + fVar275 * auVar25._16_4_ + auVar26._16_4_ * fVar262;
  auVar251._20_4_ = fVar235 * auVar24._20_4_ + fVar276 * auVar25._20_4_ + auVar26._20_4_ * fVar270;
  auVar251._24_4_ = fVar237 * auVar24._24_4_ + fVar277 * auVar25._24_4_ + auVar26._24_4_ * fVar272;
  auVar251._28_4_ = fVar240 + fVar222 + fVar274;
  auVar362 = vshufps_avx(auVar170,auVar170,0);
  auVar201 = vshufps_avx(auVar170,auVar170,0x55);
  auVar221 = vshufps_avx(auVar170,auVar170,0xaa);
  fVar270 = auVar221._0_4_;
  fVar272 = auVar221._4_4_;
  fVar274 = auVar221._8_4_;
  fVar275 = auVar221._12_4_;
  fVar235 = auVar201._0_4_;
  fVar237 = auVar201._4_4_;
  fVar240 = auVar201._8_4_;
  fVar243 = auVar201._12_4_;
  fVar276 = auVar362._0_4_;
  fVar277 = auVar362._4_4_;
  fVar222 = auVar362._8_4_;
  fVar233 = auVar362._12_4_;
  fVar262 = auVar140._28_4_;
  auVar175._0_4_ = fVar276 * auVar140._0_4_ + fVar235 * auVar310._0_4_ + fVar270 * auVar20._0_4_;
  auVar175._4_4_ = fVar277 * auVar140._4_4_ + fVar237 * auVar310._4_4_ + fVar272 * auVar20._4_4_;
  auVar175._8_4_ = fVar222 * auVar140._8_4_ + fVar240 * auVar310._8_4_ + fVar274 * auVar20._8_4_;
  auVar175._12_4_ = fVar233 * auVar140._12_4_ + fVar243 * auVar310._12_4_ + fVar275 * auVar20._12_4_
  ;
  auVar175._16_4_ = fVar276 * auVar140._16_4_ + fVar235 * auVar310._16_4_ + fVar270 * auVar20._16_4_
  ;
  auVar175._20_4_ = fVar277 * auVar140._20_4_ + fVar237 * auVar310._20_4_ + fVar272 * auVar20._20_4_
  ;
  auVar175._24_4_ = fVar222 * auVar140._24_4_ + fVar240 * auVar310._24_4_ + fVar274 * auVar20._24_4_
  ;
  auVar175._28_4_ = fVar262 + auVar310._28_4_ + auVar20._28_4_;
  auVar218._0_4_ = fVar276 * auVar21._0_4_ + auVar23._0_4_ * fVar270 + fVar235 * auVar22._0_4_;
  auVar218._4_4_ = fVar277 * auVar21._4_4_ + auVar23._4_4_ * fVar272 + fVar237 * auVar22._4_4_;
  auVar218._8_4_ = fVar222 * auVar21._8_4_ + auVar23._8_4_ * fVar274 + fVar240 * auVar22._8_4_;
  auVar218._12_4_ = fVar233 * auVar21._12_4_ + auVar23._12_4_ * fVar275 + fVar243 * auVar22._12_4_;
  auVar218._16_4_ = fVar276 * auVar21._16_4_ + auVar23._16_4_ * fVar270 + fVar235 * auVar22._16_4_;
  auVar218._20_4_ = fVar277 * auVar21._20_4_ + auVar23._20_4_ * fVar272 + fVar237 * auVar22._20_4_;
  auVar218._24_4_ = fVar222 * auVar21._24_4_ + auVar23._24_4_ * fVar274 + fVar240 * auVar22._24_4_;
  auVar218._28_4_ = fVar262 + auVar23._28_4_ + auVar20._28_4_;
  auVar284._8_4_ = 0x7fffffff;
  auVar284._0_8_ = 0x7fffffff7fffffff;
  auVar284._12_4_ = 0x7fffffff;
  auVar284._16_4_ = 0x7fffffff;
  auVar284._20_4_ = 0x7fffffff;
  auVar284._24_4_ = 0x7fffffff;
  auVar284._28_4_ = 0x7fffffff;
  auVar204._0_4_ = fVar276 * auVar24._0_4_ + fVar235 * auVar25._0_4_ + auVar26._0_4_ * fVar270;
  auVar204._4_4_ = fVar277 * auVar24._4_4_ + fVar237 * auVar25._4_4_ + auVar26._4_4_ * fVar272;
  auVar204._8_4_ = fVar222 * auVar24._8_4_ + fVar240 * auVar25._8_4_ + auVar26._8_4_ * fVar274;
  auVar204._12_4_ = fVar233 * auVar24._12_4_ + fVar243 * auVar25._12_4_ + auVar26._12_4_ * fVar275;
  auVar204._16_4_ = fVar276 * auVar24._16_4_ + fVar235 * auVar25._16_4_ + auVar26._16_4_ * fVar270;
  auVar204._20_4_ = fVar277 * auVar24._20_4_ + fVar237 * auVar25._20_4_ + auVar26._20_4_ * fVar272;
  auVar204._24_4_ = fVar222 * auVar24._24_4_ + fVar240 * auVar25._24_4_ + auVar26._24_4_ * fVar274;
  auVar204._28_4_ = fVar262 + auVar22._28_4_ + fVar275;
  auVar140 = vandps_avx(auVar331,auVar284);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar226._16_4_ = 0x219392ef;
  auVar226._20_4_ = 0x219392ef;
  auVar226._24_4_ = 0x219392ef;
  auVar226._28_4_ = 0x219392ef;
  auVar140 = vcmpps_avx(auVar140,auVar226,1);
  auVar310 = vblendvps_avx(auVar331,auVar226,auVar140);
  auVar140 = vandps_avx(auVar328,auVar284);
  auVar140 = vcmpps_avx(auVar140,auVar226,1);
  auVar20 = vblendvps_avx(auVar328,auVar226,auVar140);
  auVar140 = vandps_avx(auVar251,auVar284);
  auVar140 = vcmpps_avx(auVar140,auVar226,1);
  auVar21 = vrcpps_avx(auVar310);
  auVar140 = vblendvps_avx(auVar251,auVar226,auVar140);
  auVar309._8_4_ = 0x3f800000;
  auVar309._0_8_ = 0x3f8000003f800000;
  auVar309._12_4_ = 0x3f800000;
  auVar309._16_4_ = 0x3f800000;
  auVar309._20_4_ = 0x3f800000;
  auVar309._24_4_ = 0x3f800000;
  auVar309._28_4_ = 0x3f800000;
  fVar222 = auVar21._0_4_;
  fVar233 = auVar21._4_4_;
  auVar22._4_4_ = fVar233 * auVar310._4_4_;
  auVar22._0_4_ = fVar222 * auVar310._0_4_;
  fVar235 = auVar21._8_4_;
  auVar22._8_4_ = fVar235 * auVar310._8_4_;
  fVar237 = auVar21._12_4_;
  auVar22._12_4_ = fVar237 * auVar310._12_4_;
  fVar240 = auVar21._16_4_;
  auVar22._16_4_ = fVar240 * auVar310._16_4_;
  fVar243 = auVar21._20_4_;
  auVar22._20_4_ = fVar243 * auVar310._20_4_;
  fVar246 = auVar21._24_4_;
  auVar22._24_4_ = fVar246 * auVar310._24_4_;
  auVar22._28_4_ = auVar310._28_4_;
  auVar310 = vsubps_avx(auVar309,auVar22);
  fVar222 = fVar222 + fVar222 * auVar310._0_4_;
  fVar233 = fVar233 + fVar233 * auVar310._4_4_;
  fVar235 = fVar235 + fVar235 * auVar310._8_4_;
  fVar237 = fVar237 + fVar237 * auVar310._12_4_;
  fVar240 = fVar240 + fVar240 * auVar310._16_4_;
  fVar243 = fVar243 + fVar243 * auVar310._20_4_;
  fVar246 = fVar246 + fVar246 * auVar310._24_4_;
  auVar310 = vrcpps_avx(auVar20);
  fVar262 = auVar310._0_4_;
  fVar270 = auVar310._4_4_;
  auVar21._4_4_ = fVar270 * auVar20._4_4_;
  auVar21._0_4_ = fVar262 * auVar20._0_4_;
  fVar272 = auVar310._8_4_;
  auVar21._8_4_ = fVar272 * auVar20._8_4_;
  fVar274 = auVar310._12_4_;
  auVar21._12_4_ = fVar274 * auVar20._12_4_;
  fVar275 = auVar310._16_4_;
  auVar21._16_4_ = fVar275 * auVar20._16_4_;
  fVar276 = auVar310._20_4_;
  auVar21._20_4_ = fVar276 * auVar20._20_4_;
  fVar277 = auVar310._24_4_;
  auVar21._24_4_ = fVar277 * auVar20._24_4_;
  auVar21._28_4_ = auVar20._28_4_;
  auVar21 = vsubps_avx(auVar309,auVar21);
  auVar20 = vrcpps_avx(auVar140);
  fVar262 = fVar262 + fVar262 * auVar21._0_4_;
  fVar270 = fVar270 + fVar270 * auVar21._4_4_;
  fVar272 = fVar272 + fVar272 * auVar21._8_4_;
  fVar274 = fVar274 + fVar274 * auVar21._12_4_;
  fVar275 = fVar275 + fVar275 * auVar21._16_4_;
  fVar276 = fVar276 + fVar276 * auVar21._20_4_;
  fVar277 = fVar277 + fVar277 * auVar21._24_4_;
  fVar248 = auVar20._0_4_;
  fVar255 = auVar20._4_4_;
  auVar23._4_4_ = fVar255 * auVar140._4_4_;
  auVar23._0_4_ = fVar248 * auVar140._0_4_;
  fVar256 = auVar20._8_4_;
  auVar23._8_4_ = fVar256 * auVar140._8_4_;
  fVar257 = auVar20._12_4_;
  auVar23._12_4_ = fVar257 * auVar140._12_4_;
  fVar258 = auVar20._16_4_;
  auVar23._16_4_ = fVar258 * auVar140._16_4_;
  fVar259 = auVar20._20_4_;
  auVar23._20_4_ = fVar259 * auVar140._20_4_;
  fVar260 = auVar20._24_4_;
  auVar23._24_4_ = fVar260 * auVar140._24_4_;
  auVar23._28_4_ = auVar310._28_4_;
  auVar140 = vsubps_avx(auVar309,auVar23);
  auVar362._8_8_ = 0;
  auVar362._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar362 = vpmovsxwd_avx(auVar362);
  fVar248 = fVar248 + fVar248 * auVar140._0_4_;
  fVar255 = fVar255 + fVar255 * auVar140._4_4_;
  fVar256 = fVar256 + fVar256 * auVar140._8_4_;
  fVar257 = fVar257 + fVar257 * auVar140._12_4_;
  fVar258 = fVar258 + fVar258 * auVar140._16_4_;
  fVar259 = fVar259 + fVar259 * auVar140._20_4_;
  fVar260 = fVar260 + fVar260 * auVar140._24_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar125 * 7 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar201);
  auVar141._16_16_ = auVar201;
  auVar141._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar141);
  auVar140 = vsubps_avx(auVar140,auVar175);
  auVar138._0_4_ = fVar222 * auVar140._0_4_;
  auVar138._4_4_ = fVar233 * auVar140._4_4_;
  auVar138._8_4_ = fVar235 * auVar140._8_4_;
  auVar138._12_4_ = fVar237 * auVar140._12_4_;
  auVar20._16_4_ = fVar240 * auVar140._16_4_;
  auVar20._0_16_ = auVar138;
  auVar20._20_4_ = fVar243 * auVar140._20_4_;
  auVar20._24_4_ = fVar246 * auVar140._24_4_;
  auVar20._28_4_ = auVar140._28_4_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar362 = vpmovsxwd_avx(auVar221);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar125 * 9 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar215);
  auVar285._16_16_ = auVar201;
  auVar285._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar285);
  auVar140 = vsubps_avx(auVar140,auVar175);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar125 * 0xe + 6);
  auVar362 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar125 * 0xe + 0xe);
  auVar201 = vpmovsxwd_avx(auVar9);
  auVar171._0_4_ = fVar222 * auVar140._0_4_;
  auVar171._4_4_ = fVar233 * auVar140._4_4_;
  auVar171._8_4_ = fVar235 * auVar140._8_4_;
  auVar171._12_4_ = fVar237 * auVar140._12_4_;
  auVar24._16_4_ = fVar240 * auVar140._16_4_;
  auVar24._0_16_ = auVar171;
  auVar24._20_4_ = fVar243 * auVar140._20_4_;
  auVar24._24_4_ = fVar246 * auVar140._24_4_;
  auVar24._28_4_ = auVar140._28_4_;
  auVar227._16_16_ = auVar201;
  auVar227._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar227);
  auVar140 = vsubps_avx(auVar140,auVar218);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  auVar362 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar11);
  auVar224._0_4_ = fVar262 * auVar140._0_4_;
  auVar224._4_4_ = fVar270 * auVar140._4_4_;
  auVar224._8_4_ = fVar272 * auVar140._8_4_;
  auVar224._12_4_ = fVar274 * auVar140._12_4_;
  auVar310._16_4_ = fVar275 * auVar140._16_4_;
  auVar310._0_16_ = auVar224;
  auVar310._20_4_ = fVar276 * auVar140._20_4_;
  auVar310._24_4_ = fVar277 * auVar140._24_4_;
  auVar310._28_4_ = auVar140._28_4_;
  auVar286._16_16_ = auVar201;
  auVar286._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar286);
  auVar140 = vsubps_avx(auVar140,auVar218);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar125 * 0x15 + 6);
  auVar362 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar125 * 0x15 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar13);
  auVar214._0_4_ = fVar262 * auVar140._0_4_;
  auVar214._4_4_ = fVar270 * auVar140._4_4_;
  auVar214._8_4_ = fVar272 * auVar140._8_4_;
  auVar214._12_4_ = fVar274 * auVar140._12_4_;
  auVar25._16_4_ = fVar275 * auVar140._16_4_;
  auVar25._0_16_ = auVar214;
  auVar25._20_4_ = fVar276 * auVar140._20_4_;
  auVar25._24_4_ = fVar277 * auVar140._24_4_;
  auVar25._28_4_ = auVar140._28_4_;
  auVar267._16_16_ = auVar201;
  auVar267._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar267);
  auVar140 = vsubps_avx(auVar140,auVar204);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar125 * 0x17 + 6);
  auVar362 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar125 * 0x17 + 0xe);
  auVar201 = vpmovsxwd_avx(auVar15);
  auVar264._0_4_ = fVar248 * auVar140._0_4_;
  auVar264._4_4_ = fVar255 * auVar140._4_4_;
  auVar264._8_4_ = fVar256 * auVar140._8_4_;
  auVar264._12_4_ = fVar257 * auVar140._12_4_;
  auVar26._16_4_ = fVar258 * auVar140._16_4_;
  auVar26._0_16_ = auVar264;
  auVar26._20_4_ = fVar259 * auVar140._20_4_;
  auVar26._24_4_ = fVar260 * auVar140._24_4_;
  auVar26._28_4_ = auVar140._28_4_;
  auVar287._16_16_ = auVar201;
  auVar287._0_16_ = auVar362;
  auVar140 = vcvtdq2ps_avx(auVar287);
  auVar140 = vsubps_avx(auVar140,auVar204);
  auVar196._0_4_ = fVar248 * auVar140._0_4_;
  auVar196._4_4_ = fVar255 * auVar140._4_4_;
  auVar196._8_4_ = fVar256 * auVar140._8_4_;
  auVar196._12_4_ = fVar257 * auVar140._12_4_;
  auVar27._16_4_ = fVar258 * auVar140._16_4_;
  auVar27._0_16_ = auVar196;
  auVar27._20_4_ = fVar259 * auVar140._20_4_;
  auVar27._24_4_ = fVar260 * auVar140._24_4_;
  auVar27._28_4_ = auVar140._28_4_;
  auVar362 = vpminsd_avx(auVar20._16_16_,auVar24._16_16_);
  auVar201 = vpminsd_avx(auVar138,auVar171);
  auVar320._16_16_ = auVar362;
  auVar320._0_16_ = auVar201;
  auVar221 = auVar25._16_16_;
  auVar300 = ZEXT1664(auVar221);
  auVar215 = auVar310._16_16_;
  auVar314 = ZEXT1664(auVar215);
  auVar362 = vpminsd_avx(auVar215,auVar221);
  auVar201 = vpminsd_avx(auVar224,auVar214);
  auVar329._16_16_ = auVar362;
  auVar329._0_16_ = auVar201;
  auVar140 = vmaxps_avx(auVar320,auVar329);
  auVar362 = vpminsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar201 = vpminsd_avx(auVar264,auVar196);
  auVar337._16_16_ = auVar362;
  auVar337._0_16_ = auVar201;
  uVar134 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar345._4_4_ = uVar134;
  auVar345._0_4_ = uVar134;
  auVar345._8_4_ = uVar134;
  auVar345._12_4_ = uVar134;
  auVar345._16_4_ = uVar134;
  auVar345._20_4_ = uVar134;
  auVar345._24_4_ = uVar134;
  auVar345._28_4_ = uVar134;
  auVar310 = vmaxps_avx(auVar337,auVar345);
  auVar140 = vmaxps_avx(auVar140,auVar310);
  local_80._4_4_ = auVar140._4_4_ * 0.99999964;
  local_80._0_4_ = auVar140._0_4_ * 0.99999964;
  local_80._8_4_ = auVar140._8_4_ * 0.99999964;
  local_80._12_4_ = auVar140._12_4_ * 0.99999964;
  local_80._16_4_ = auVar140._16_4_ * 0.99999964;
  local_80._20_4_ = auVar140._20_4_ * 0.99999964;
  local_80._24_4_ = auVar140._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar362 = vpmaxsd_avx(auVar20._16_16_,auVar24._16_16_);
  auVar201 = vpmaxsd_avx(auVar138,auVar171);
  auVar142._16_16_ = auVar362;
  auVar142._0_16_ = auVar201;
  auVar362 = vpmaxsd_avx(auVar215,auVar221);
  auVar201 = vpmaxsd_avx(auVar224,auVar214);
  auVar176._16_16_ = auVar362;
  auVar176._0_16_ = auVar201;
  auVar140 = vminps_avx(auVar142,auVar176);
  auVar362 = vpmaxsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar201 = vpmaxsd_avx(auVar264,auVar196);
  fVar262 = ray->tfar;
  auVar219._4_4_ = fVar262;
  auVar219._0_4_ = fVar262;
  auVar219._8_4_ = fVar262;
  auVar219._12_4_ = fVar262;
  auVar219._16_4_ = fVar262;
  auVar219._20_4_ = fVar262;
  auVar219._24_4_ = fVar262;
  auVar219._28_4_ = fVar262;
  auVar177._16_16_ = auVar362;
  auVar177._0_16_ = auVar201;
  auVar310 = vminps_avx(auVar177,auVar219);
  auVar140 = vminps_avx(auVar140,auVar310);
  auVar19._4_4_ = auVar140._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar140._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar140._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar140._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar140._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar140._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar140._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar140._28_4_;
  auVar140 = vcmpps_avx(local_80,auVar19,2);
  auVar362 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar178._16_16_ = auVar362;
  auVar178._0_16_ = auVar362;
  auVar310 = vcvtdq2ps_avx(auVar178);
  auVar310 = vcmpps_avx(_DAT_01f7b060,auVar310,1);
  auVar140 = vandps_avx(auVar140,auVar310);
  local_4e0 = mm_lookupmask_ps._16_8_;
  uStack_4d8 = mm_lookupmask_ps._24_8_;
  uStack_4d0 = mm_lookupmask_ps._16_8_;
  uStack_4c8 = mm_lookupmask_ps._24_8_;
  uVar134 = vmovmskps_avx(auVar140);
  uVar133 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar134);
  local_7e8 = pre;
  local_7e0 = prim;
  while (uVar133 != 0) {
    auVar310 = auVar314._0_32_;
    auVar140 = auVar300._0_32_;
    lVar126 = 0;
    if (uVar133 != 0) {
      for (; (uVar133 >> lVar126 & 1) == 0; lVar126 = lVar126 + 1) {
      }
    }
    uVar132 = uVar133 - 1 & uVar133;
    local_7d4 = *(undefined4 *)(local_7e0 + lVar126 * 4 + 6);
    lVar126 = lVar126 * 0x40;
    lVar129 = 0;
    if (uVar132 != 0) {
      for (; (uVar132 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    local_728 = (ulong)*(uint *)(local_7e0 + 2);
    pGVar17 = (context->scene->geometries).items[*(uint *)(local_7e0 + 2)].ptr;
    _local_7d0 = *(undefined1 (*) [16])(prim + lVar126 + uVar125 * 0x19 + 0x16);
    if (((uVar132 != 0) && (uVar130 = uVar132 - 1 & uVar132, uVar130 != 0)) &&
       (lVar129 = 0, uVar130 != 0)) {
      for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    _local_530 = *(undefined1 (*) [16])(prim + lVar126 + uVar125 * 0x19 + 0x26);
    _local_540 = *(undefined1 (*) [16])(prim + lVar126 + uVar125 * 0x19 + 0x36);
    _local_550 = *(undefined1 (*) [16])(prim + lVar126 + uVar125 * 0x19 + 0x46);
    uVar124 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->org).field_0;
    auVar221 = vsubps_avx(_local_7d0,(undefined1  [16])aVar7);
    auVar10 = _local_7d0;
    auVar362 = vshufps_avx(auVar221,auVar221,0);
    auVar201 = vshufps_avx(auVar221,auVar221,0x55);
    auVar221 = vshufps_avx(auVar221,auVar221,0xaa);
    fVar262 = (local_7e8->ray_space).vx.field_0.m128[0];
    fVar270 = (local_7e8->ray_space).vx.field_0.m128[1];
    fVar272 = (local_7e8->ray_space).vx.field_0.m128[2];
    fVar274 = (local_7e8->ray_space).vx.field_0.m128[3];
    fVar275 = (local_7e8->ray_space).vy.field_0.m128[0];
    fVar276 = (local_7e8->ray_space).vy.field_0.m128[1];
    fVar277 = (local_7e8->ray_space).vy.field_0.m128[2];
    fVar222 = (local_7e8->ray_space).vy.field_0.m128[3];
    fVar233 = (local_7e8->ray_space).vz.field_0.m128[0];
    fVar235 = (local_7e8->ray_space).vz.field_0.m128[1];
    fVar237 = (local_7e8->ray_space).vz.field_0.m128[2];
    fVar240 = (local_7e8->ray_space).vz.field_0.m128[3];
    auVar225._0_4_ = auVar362._0_4_ * fVar262 + auVar221._0_4_ * fVar233 + auVar201._0_4_ * fVar275;
    auVar225._4_4_ = auVar362._4_4_ * fVar270 + auVar221._4_4_ * fVar235 + auVar201._4_4_ * fVar276;
    auVar225._8_4_ = auVar362._8_4_ * fVar272 + auVar221._8_4_ * fVar237 + auVar201._8_4_ * fVar277;
    auVar225._12_4_ =
         auVar362._12_4_ * fVar274 + auVar221._12_4_ * fVar240 + auVar201._12_4_ * fVar222;
    auVar362 = vblendps_avx(auVar225,_local_7d0,8);
    auVar215 = vsubps_avx(_local_530,(undefined1  [16])aVar7);
    auVar201 = vshufps_avx(auVar215,auVar215,0);
    auVar221 = vshufps_avx(auVar215,auVar215,0x55);
    auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
    auVar197._0_4_ = auVar201._0_4_ * fVar262 + auVar215._0_4_ * fVar233 + auVar221._0_4_ * fVar275;
    auVar197._4_4_ = auVar201._4_4_ * fVar270 + auVar215._4_4_ * fVar235 + auVar221._4_4_ * fVar276;
    auVar197._8_4_ = auVar201._8_4_ * fVar272 + auVar215._8_4_ * fVar237 + auVar221._8_4_ * fVar277;
    auVar197._12_4_ =
         auVar201._12_4_ * fVar274 + auVar215._12_4_ * fVar240 + auVar221._12_4_ * fVar222;
    auVar201 = vblendps_avx(auVar197,_local_530,8);
    auVar8 = vsubps_avx(_local_540,(undefined1  [16])aVar7);
    auVar221 = vshufps_avx(auVar8,auVar8,0);
    auVar215 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar281._0_4_ = auVar221._0_4_ * fVar262 + auVar215._0_4_ * fVar275 + auVar8._0_4_ * fVar233;
    auVar281._4_4_ = auVar221._4_4_ * fVar270 + auVar215._4_4_ * fVar276 + auVar8._4_4_ * fVar235;
    auVar281._8_4_ = auVar221._8_4_ * fVar272 + auVar215._8_4_ * fVar277 + auVar8._8_4_ * fVar237;
    auVar281._12_4_ =
         auVar221._12_4_ * fVar274 + auVar215._12_4_ * fVar222 + auVar8._12_4_ * fVar240;
    auVar221 = vblendps_avx(auVar281,_local_540,8);
    auVar9 = vsubps_avx(_local_550,(undefined1  [16])aVar7);
    auVar215 = vshufps_avx(auVar9,auVar9,0);
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar172._0_4_ = auVar215._0_4_ * fVar262 + auVar9._0_4_ * fVar233 + auVar8._0_4_ * fVar275;
    auVar172._4_4_ = auVar215._4_4_ * fVar270 + auVar9._4_4_ * fVar235 + auVar8._4_4_ * fVar276;
    auVar172._8_4_ = auVar215._8_4_ * fVar272 + auVar9._8_4_ * fVar237 + auVar8._8_4_ * fVar277;
    auVar172._12_4_ = auVar215._12_4_ * fVar274 + auVar9._12_4_ * fVar240 + auVar8._12_4_ * fVar222;
    auVar215 = vblendps_avx(auVar172,_local_550,8);
    auVar265._8_4_ = 0x7fffffff;
    auVar265._0_8_ = 0x7fffffff7fffffff;
    auVar265._12_4_ = 0x7fffffff;
    auVar362 = vandps_avx(auVar362,auVar265);
    auVar201 = vandps_avx(auVar201,auVar265);
    auVar8 = vmaxps_avx(auVar362,auVar201);
    auVar362 = vandps_avx(auVar221,auVar265);
    auVar201 = vandps_avx(auVar215,auVar265);
    auVar362 = vmaxps_avx(auVar362,auVar201);
    auVar362 = vmaxps_avx(auVar8,auVar362);
    auVar201 = vmovshdup_avx(auVar362);
    auVar201 = vmaxss_avx(auVar201,auVar362);
    auVar362 = vshufpd_avx(auVar362,auVar362,1);
    auVar362 = vmaxss_avx(auVar362,auVar201);
    local_7f0 = (long)(int)uVar124;
    lVar126 = local_7f0 * 0x44;
    fVar262 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x908);
    fVar270 = *(float *)(bspline_basis0 + lVar126 + 0x90c);
    fVar272 = *(float *)(bspline_basis0 + lVar126 + 0x910);
    fVar274 = *(float *)(bspline_basis0 + lVar126 + 0x914);
    fVar275 = *(float *)(bspline_basis0 + lVar126 + 0x918);
    fVar276 = *(float *)(bspline_basis0 + lVar126 + 0x91c);
    fVar277 = *(float *)(bspline_basis0 + lVar126 + 0x920);
    auVar123 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x908);
    auVar201 = vshufps_avx(auVar281,auVar281,0);
    register0x00001250 = auVar201;
    _local_7a0 = auVar201;
    auVar221 = vshufps_avx(auVar281,auVar281,0x55);
    local_6e0._16_16_ = auVar221;
    local_6e0._0_16_ = auVar221;
    fVar222 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0xd8c);
    fVar233 = *(float *)(bspline_basis0 + lVar126 + 0xd90);
    fVar235 = *(float *)(bspline_basis0 + lVar126 + 0xd94);
    fVar237 = *(float *)(bspline_basis0 + lVar126 + 0xd98);
    fVar240 = *(float *)(bspline_basis0 + lVar126 + 0xd9c);
    fVar243 = *(float *)(bspline_basis0 + lVar126 + 0xda0);
    fVar246 = *(float *)(bspline_basis0 + lVar126 + 0xda4);
    auVar122 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0xd8c);
    auVar215 = vshufps_avx(auVar172,auVar172,0);
    register0x00001210 = auVar215;
    _local_440 = auVar215;
    fVar135 = auVar215._0_4_;
    fVar155 = auVar215._4_4_;
    fVar158 = auVar215._8_4_;
    fVar161 = auVar215._12_4_;
    fVar168 = auVar201._0_4_;
    fVar184 = auVar201._4_4_;
    fVar186 = auVar201._8_4_;
    fVar188 = auVar201._12_4_;
    auVar201 = vshufps_avx(auVar172,auVar172,0x55);
    register0x00001590 = auVar201;
    _local_580 = auVar201;
    fVar343 = auVar201._0_4_;
    fVar348 = auVar201._4_4_;
    fVar350 = auVar201._8_4_;
    fVar352 = auVar201._12_4_;
    fVar194 = auVar221._0_4_;
    fVar209 = auVar221._4_4_;
    fVar211 = auVar221._8_4_;
    fVar278 = auVar221._12_4_;
    auVar9 = _local_540;
    auVar201 = vshufps_avx(_local_540,_local_540,0xff);
    register0x00001390 = auVar201;
    _local_a0 = auVar201;
    auVar221 = vshufps_avx(_local_550,_local_550,0xff);
    register0x00001450 = auVar221;
    _local_c0 = auVar221;
    fVar307 = auVar221._0_4_;
    fVar315 = auVar221._4_4_;
    fVar316 = auVar221._8_4_;
    fVar317 = auVar221._12_4_;
    fVar263 = auVar201._0_4_;
    fVar271 = auVar201._4_4_;
    fVar273 = auVar201._8_4_;
    auVar221 = vshufps_avx(auVar197,auVar197,0);
    register0x00001290 = auVar221;
    _local_340 = auVar221;
    fVar248 = *(float *)(bspline_basis0 + lVar126 + 0x484);
    fVar255 = *(float *)(bspline_basis0 + lVar126 + 0x488);
    fVar256 = *(float *)(bspline_basis0 + lVar126 + 0x48c);
    fVar257 = *(float *)(bspline_basis0 + lVar126 + 0x490);
    fVar258 = *(float *)(bspline_basis0 + lVar126 + 0x494);
    fVar259 = *(float *)(bspline_basis0 + lVar126 + 0x498);
    fVar260 = *(float *)(bspline_basis0 + lVar126 + 0x49c);
    fVar195 = auVar221._0_4_;
    fVar210 = auVar221._4_4_;
    fVar167 = auVar221._8_4_;
    fVar212 = auVar221._12_4_;
    auVar221 = vshufps_avx(auVar197,auVar197,0x55);
    register0x00001210 = auVar221;
    _local_600 = auVar221;
    fVar136 = auVar221._0_4_;
    fVar156 = auVar221._4_4_;
    fVar159 = auVar221._8_4_;
    fVar162 = auVar221._12_4_;
    auVar11 = _local_530;
    auVar221 = vshufps_avx(_local_530,_local_530,0xff);
    register0x000015d0 = auVar221;
    _local_e0 = auVar221;
    fVar354 = auVar221._0_4_;
    fVar358 = auVar221._4_4_;
    fVar280 = auVar221._8_4_;
    fVar292 = auVar221._12_4_;
    auVar221 = vshufps_avx(auVar225,auVar225,0);
    register0x000014d0 = auVar221;
    _local_320 = auVar221;
    local_480 = *(float *)(bspline_basis0 + lVar126);
    fStack_47c = *(float *)(bspline_basis0 + lVar126 + 4);
    fStack_478 = *(float *)(bspline_basis0 + lVar126 + 8);
    fStack_474 = *(float *)(bspline_basis0 + lVar126 + 0xc);
    fStack_470 = *(float *)(bspline_basis0 + lVar126 + 0x10);
    fStack_46c = *(float *)(bspline_basis0 + lVar126 + 0x14);
    fStack_468 = *(float *)(bspline_basis0 + lVar126 + 0x18);
    fVar326 = auVar221._0_4_;
    fStack_49c = auVar221._4_4_;
    fStack_498 = auVar221._8_4_;
    fStack_494 = auVar221._12_4_;
    auVar321._0_4_ = fVar326 * local_480 + fVar195 * fVar248 + fVar168 * fVar262 + fVar135 * fVar222
    ;
    auVar321._4_4_ =
         fStack_49c * fStack_47c + fVar210 * fVar255 + fVar184 * fVar270 + fVar155 * fVar233;
    auVar321._8_4_ =
         fStack_498 * fStack_478 + fVar167 * fVar256 + fVar186 * fVar272 + fVar158 * fVar235;
    auVar321._12_4_ =
         fStack_494 * fStack_474 + fVar212 * fVar257 + fVar188 * fVar274 + fVar161 * fVar237;
    auVar321._16_4_ =
         fVar326 * fStack_470 + fVar195 * fVar258 + fVar168 * fVar275 + fVar135 * fVar240;
    auVar321._20_4_ =
         fStack_49c * fStack_46c + fVar210 * fVar259 + fVar184 * fVar276 + fVar155 * fVar243;
    auVar321._24_4_ =
         fStack_498 * fStack_468 + fVar167 * fVar260 + fVar186 * fVar277 + fVar158 * fVar246;
    auVar321._28_4_ = *(float *)(bspline_basis0 + lVar126 + 0x924) + fVar188 + fVar161 + 0.0;
    auVar215 = vshufps_avx(auVar225,auVar225,0x55);
    register0x00001250 = auVar215;
    _local_660 = auVar215;
    fVar169 = auVar215._0_4_;
    fVar185 = auVar215._4_4_;
    fVar187 = auVar215._8_4_;
    fVar189 = auVar215._12_4_;
    local_360._0_4_ =
         fVar169 * local_480 + fVar136 * fVar248 + fVar194 * fVar262 + fVar343 * fVar222;
    local_360._4_4_ =
         fVar185 * fStack_47c + fVar156 * fVar255 + fVar209 * fVar270 + fVar348 * fVar233;
    local_360._8_4_ =
         fVar187 * fStack_478 + fVar159 * fVar256 + fVar211 * fVar272 + fVar350 * fVar235;
    local_360._12_4_ =
         fVar189 * fStack_474 + fVar162 * fVar257 + fVar278 * fVar274 + fVar352 * fVar237;
    local_360._16_4_ =
         fVar169 * fStack_470 + fVar136 * fVar258 + fVar194 * fVar275 + fVar343 * fVar240;
    local_360._20_4_ =
         fVar185 * fStack_46c + fVar156 * fVar259 + fVar209 * fVar276 + fVar348 * fVar243;
    local_360._24_4_ =
         fVar187 * fStack_468 + fVar159 * fVar260 + fVar211 * fVar277 + fVar350 * fVar246;
    local_360._28_4_ = 0.0;
    auVar215 = vpermilps_avx(_local_7d0,0xff);
    register0x000013d0 = auVar215;
    _local_140 = auVar215;
    fStack_464 = (float)*(undefined4 *)(bspline_basis0 + lVar126 + 0x1c);
    fVar279 = auVar215._0_4_;
    fVar291 = auVar215._4_4_;
    fVar293 = auVar215._8_4_;
    local_780._0_4_ =
         fVar279 * local_480 + fVar354 * fVar248 + fVar263 * fVar262 + fVar307 * fVar222;
    local_780._4_4_ =
         fVar291 * fStack_47c + fVar358 * fVar255 + fVar271 * fVar270 + fVar315 * fVar233;
    local_780._8_4_ =
         fVar293 * fStack_478 + fVar280 * fVar256 + fVar273 * fVar272 + fVar316 * fVar235;
    local_780._12_4_ =
         auVar215._12_4_ * fStack_474 +
         fVar292 * fVar257 + auVar201._12_4_ * fVar274 + fVar317 * fVar237;
    local_780._16_4_ =
         fVar279 * fStack_470 + fVar354 * fVar258 + fVar263 * fVar275 + fVar307 * fVar240;
    local_780._20_4_ =
         fVar291 * fStack_46c + fVar358 * fVar259 + fVar271 * fVar276 + fVar315 * fVar243;
    local_780._24_4_ =
         fVar293 * fStack_468 + fVar280 * fVar260 + fVar273 * fVar277 + fVar316 * fVar246;
    local_780._28_4_ = 0;
    fVar239 = *(float *)(bspline_basis1 + lVar126 + 0x908);
    fVar190 = *(float *)(bspline_basis1 + lVar126 + 0x90c);
    fVar301 = *(float *)(bspline_basis1 + lVar126 + 0x910);
    fVar302 = *(float *)(bspline_basis1 + lVar126 + 0x914);
    fVar242 = *(float *)(bspline_basis1 + lVar126 + 0x918);
    fVar191 = *(float *)(bspline_basis1 + lVar126 + 0x91c);
    fVar303 = *(float *)(bspline_basis1 + lVar126 + 0x920);
    fVar304 = *(float *)(bspline_basis1 + lVar126 + 0xd8c);
    fVar245 = *(float *)(bspline_basis1 + lVar126 + 0xd90);
    fVar192 = *(float *)(bspline_basis1 + lVar126 + 0xd94);
    fVar305 = *(float *)(bspline_basis1 + lVar126 + 0xd98);
    fVar306 = *(float *)(bspline_basis1 + lVar126 + 0xd9c);
    fVar247 = *(float *)(bspline_basis1 + lVar126 + 0xda0);
    fVar193 = *(float *)(bspline_basis1 + lVar126 + 0xda4);
    fVar213 = *(float *)(bspline_basis1 + lVar126 + 0x484);
    fVar137 = *(float *)(bspline_basis1 + lVar126 + 0x488);
    fVar157 = *(float *)(bspline_basis1 + lVar126 + 0x48c);
    fVar160 = *(float *)(bspline_basis1 + lVar126 + 0x490);
    fVar163 = *(float *)(bspline_basis1 + lVar126 + 0x494);
    fVar164 = *(float *)(bspline_basis1 + lVar126 + 0x498);
    fVar165 = *(float *)(bspline_basis1 + lVar126 + 0x49c);
    fVar261 = fVar317 + 0.0 + 0.0;
    fVar166 = *(float *)(bspline_basis1 + lVar126);
    fVar223 = *(float *)(bspline_basis1 + lVar126 + 4);
    fVar234 = *(float *)(bspline_basis1 + lVar126 + 8);
    fVar236 = *(float *)(bspline_basis1 + lVar126 + 0xc);
    fVar238 = *(float *)(bspline_basis1 + lVar126 + 0x10);
    fVar241 = *(float *)(bspline_basis1 + lVar126 + 0x14);
    fVar244 = *(float *)(bspline_basis1 + lVar126 + 0x18);
    auVar205._0_4_ = fVar326 * fVar166 + fVar213 * fVar195 + fVar239 * fVar168 + fVar304 * fVar135;
    auVar205._4_4_ =
         fStack_49c * fVar223 + fVar137 * fVar210 + fVar190 * fVar184 + fVar245 * fVar155;
    auVar205._8_4_ =
         fStack_498 * fVar234 + fVar157 * fVar167 + fVar301 * fVar186 + fVar192 * fVar158;
    auVar205._12_4_ =
         fStack_494 * fVar236 + fVar160 * fVar212 + fVar302 * fVar188 + fVar305 * fVar161;
    auVar205._16_4_ = fVar326 * fVar238 + fVar163 * fVar195 + fVar242 * fVar168 + fVar306 * fVar135;
    auVar205._20_4_ =
         fStack_49c * fVar241 + fVar164 * fVar210 + fVar191 * fVar184 + fVar247 * fVar155;
    auVar205._24_4_ =
         fStack_498 * fVar244 + fVar165 * fVar167 + fVar303 * fVar186 + fVar193 * fVar158;
    auVar205._28_4_ = fVar292 + fVar352 + 0.0;
    auVar208 = ZEXT3264(auVar205);
    local_380._0_4_ = fVar169 * fVar166 + fVar213 * fVar136 + fVar239 * fVar194 + fVar343 * fVar304;
    local_380._4_4_ = fVar185 * fVar223 + fVar137 * fVar156 + fVar190 * fVar209 + fVar348 * fVar245;
    local_380._8_4_ = fVar187 * fVar234 + fVar157 * fVar159 + fVar301 * fVar211 + fVar350 * fVar192;
    local_380._12_4_ = fVar189 * fVar236 + fVar160 * fVar162 + fVar302 * fVar278 + fVar352 * fVar305
    ;
    local_380._16_4_ = fVar169 * fVar238 + fVar163 * fVar136 + fVar242 * fVar194 + fVar343 * fVar306
    ;
    local_380._20_4_ = fVar185 * fVar241 + fVar164 * fVar156 + fVar191 * fVar209 + fVar348 * fVar247
    ;
    local_380._24_4_ = fVar187 * fVar244 + fVar165 * fVar159 + fVar303 * fVar211 + fVar350 * fVar193
    ;
    local_380._28_4_ = fVar352 + 0.0 + 0.0;
    local_6c0._0_4_ = fVar279 * fVar166 + fVar354 * fVar213 + fVar239 * fVar263 + fVar307 * fVar304;
    local_6c0._4_4_ = fVar291 * fVar223 + fVar358 * fVar137 + fVar190 * fVar271 + fVar315 * fVar245;
    local_6c0._8_4_ = fVar293 * fVar234 + fVar280 * fVar157 + fVar301 * fVar273 + fVar316 * fVar192;
    local_6c0._12_4_ =
         auVar215._12_4_ * fVar236 +
         fVar292 * fVar160 + fVar302 * auVar201._12_4_ + fVar317 * fVar305;
    local_6c0._16_4_ = fVar279 * fVar238 + fVar354 * fVar163 + fVar242 * fVar263 + fVar307 * fVar306
    ;
    local_6c0._20_4_ = fVar291 * fVar241 + fVar358 * fVar164 + fVar191 * fVar271 + fVar315 * fVar247
    ;
    local_6c0._24_4_ = fVar293 * fVar244 + fVar280 * fVar165 + fVar303 * fVar273 + fVar316 * fVar193
    ;
    local_6c0._28_4_ = fVar261 + 0.0;
    local_3c0 = vsubps_avx(auVar205,auVar321);
    auVar22 = vsubps_avx(local_380,local_360);
    fVar262 = local_3c0._0_4_;
    fVar272 = local_3c0._4_4_;
    auVar29._4_4_ = local_360._4_4_ * fVar272;
    auVar29._0_4_ = local_360._0_4_ * fVar262;
    fVar275 = local_3c0._8_4_;
    auVar29._8_4_ = local_360._8_4_ * fVar275;
    fVar277 = local_3c0._12_4_;
    auVar29._12_4_ = local_360._12_4_ * fVar277;
    fVar233 = local_3c0._16_4_;
    auVar29._16_4_ = local_360._16_4_ * fVar233;
    fVar237 = local_3c0._20_4_;
    auVar29._20_4_ = local_360._20_4_ * fVar237;
    fVar243 = local_3c0._24_4_;
    auVar29._24_4_ = local_360._24_4_ * fVar243;
    auVar29._28_4_ = 0;
    fVar270 = auVar22._0_4_;
    fVar274 = auVar22._4_4_;
    auVar30._4_4_ = auVar321._4_4_ * fVar274;
    auVar30._0_4_ = auVar321._0_4_ * fVar270;
    fVar276 = auVar22._8_4_;
    auVar30._8_4_ = auVar321._8_4_ * fVar276;
    fVar222 = auVar22._12_4_;
    auVar30._12_4_ = auVar321._12_4_ * fVar222;
    fVar235 = auVar22._16_4_;
    auVar30._16_4_ = auVar321._16_4_ * fVar235;
    fVar240 = auVar22._20_4_;
    auVar30._20_4_ = auVar321._20_4_ * fVar240;
    fVar246 = auVar22._24_4_;
    auVar30._24_4_ = auVar321._24_4_ * fVar246;
    auVar30._28_4_ = fVar261;
    auVar21 = vsubps_avx(auVar29,auVar30);
    auVar20 = vmaxps_avx(local_780,local_6c0);
    auVar31._4_4_ = auVar20._4_4_ * auVar20._4_4_ * (fVar272 * fVar272 + fVar274 * fVar274);
    auVar31._0_4_ = auVar20._0_4_ * auVar20._0_4_ * (fVar262 * fVar262 + fVar270 * fVar270);
    auVar31._8_4_ = auVar20._8_4_ * auVar20._8_4_ * (fVar275 * fVar275 + fVar276 * fVar276);
    auVar31._12_4_ = auVar20._12_4_ * auVar20._12_4_ * (fVar277 * fVar277 + fVar222 * fVar222);
    auVar31._16_4_ = auVar20._16_4_ * auVar20._16_4_ * (fVar233 * fVar233 + fVar235 * fVar235);
    auVar31._20_4_ = auVar20._20_4_ * auVar20._20_4_ * (fVar237 * fVar237 + fVar240 * fVar240);
    auVar31._24_4_ = auVar20._24_4_ * auVar20._24_4_ * (fVar243 * fVar243 + fVar246 * fVar246);
    auVar31._28_4_ = auVar22._28_4_ + fVar261;
    auVar32._4_4_ = auVar21._4_4_ * auVar21._4_4_;
    auVar32._0_4_ = auVar21._0_4_ * auVar21._0_4_;
    auVar32._8_4_ = auVar21._8_4_ * auVar21._8_4_;
    auVar32._12_4_ = auVar21._12_4_ * auVar21._12_4_;
    auVar32._16_4_ = auVar21._16_4_ * auVar21._16_4_;
    auVar32._20_4_ = auVar21._20_4_ * auVar21._20_4_;
    auVar32._24_4_ = auVar21._24_4_ * auVar21._24_4_;
    auVar32._28_4_ = auVar21._28_4_;
    auVar20 = vcmpps_avx(auVar32,auVar31,2);
    local_800 = ZEXT416((uint)(auVar362._0_4_ * 4.7683716e-07));
    auVar250._0_4_ = (float)(int)uVar124;
    auVar250._4_12_ = auVar221._4_12_;
    local_4a0 = auVar250._0_4_;
    auVar362 = vshufps_avx(auVar250,auVar250,0);
    auVar252._16_16_ = auVar362;
    auVar252._0_16_ = auVar362;
    auVar21 = vcmpps_avx(_DAT_01f7b060,auVar252,1);
    auVar362 = vpermilps_avx(auVar225,0xaa);
    register0x000013d0 = auVar362;
    _local_160 = auVar362;
    auVar201 = vpermilps_avx(auVar197,0xaa);
    register0x00001590 = auVar201;
    _local_420 = auVar201;
    auVar221 = vpermilps_avx(auVar281,0xaa);
    register0x000015d0 = auVar221;
    _local_300 = auVar221;
    auVar215 = vpermilps_avx(auVar172,0xaa);
    register0x00001550 = auVar215;
    _local_520 = auVar215;
    auVar23 = auVar21 & auVar20;
    auVar8 = vpermilps_avx((undefined1  [16])aVar7,0xff);
    _local_760 = ZEXT1632(auVar8);
    fVar262 = fVar168;
    fVar270 = fVar184;
    fVar272 = fVar186;
    fVar274 = fVar169;
    fVar275 = fVar185;
    fVar276 = fVar187;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
      uVar130 = 0;
      auVar300 = ZEXT3264(auVar140);
      auVar314 = ZEXT3264(auVar310);
      auVar325 = ZEXT3264(local_6e0);
      auVar347 = ZEXT3264(_local_600);
      _local_540 = auVar9;
      _local_530 = auVar11;
    }
    else {
      local_4c0._0_8_ = pGVar17;
      auVar20 = vandps_avx(auVar20,auVar21);
      fVar280 = auVar362._0_4_;
      fVar292 = auVar362._4_4_;
      fVar294 = auVar362._8_4_;
      fVar295 = auVar362._12_4_;
      fVar344 = auVar201._0_4_;
      fVar349 = auVar201._4_4_;
      fVar351 = auVar201._8_4_;
      fVar353 = auVar201._12_4_;
      fVar355 = auVar221._0_4_;
      fVar359 = auVar221._4_4_;
      fVar360 = auVar221._8_4_;
      fVar361 = auVar221._12_4_;
      fVar336 = auVar215._0_4_;
      fVar340 = auVar215._4_4_;
      fVar341 = auVar215._8_4_;
      fVar342 = auVar215._12_4_;
      fVar277 = auVar20._28_4_ + auVar21._28_4_ + 0.0;
      local_3a0 = fVar280 * fVar166 + fVar344 * fVar213 + fVar355 * fVar239 + fVar336 * fVar304;
      fStack_39c = fVar292 * fVar223 + fVar349 * fVar137 + fVar359 * fVar190 + fVar340 * fVar245;
      fStack_398 = fVar294 * fVar234 + fVar351 * fVar157 + fVar360 * fVar301 + fVar341 * fVar192;
      fStack_394 = fVar295 * fVar236 + fVar353 * fVar160 + fVar361 * fVar302 + fVar342 * fVar305;
      fStack_390 = fVar280 * fVar238 + fVar344 * fVar163 + fVar355 * fVar242 + fVar336 * fVar306;
      fStack_38c = fVar292 * fVar241 + fVar349 * fVar164 + fVar359 * fVar191 + fVar340 * fVar247;
      fStack_388 = fVar294 * fVar244 + fVar351 * fVar165 + fVar360 * fVar303 + fVar341 * fVar193;
      fStack_384 = *(float *)(bspline_basis1 + lVar126 + 0x1c) + fVar277;
      local_460._0_4_ = auVar123._0_4_;
      local_460._4_4_ = auVar123._4_4_;
      fStack_458 = auVar123._8_4_;
      fStack_454 = auVar123._12_4_;
      fStack_450 = auVar123._16_4_;
      fStack_44c = auVar123._20_4_;
      fStack_448 = auVar123._24_4_;
      local_500._0_4_ = auVar122._0_4_;
      local_500._4_4_ = auVar122._4_4_;
      fStack_4f8 = auVar122._8_4_;
      fStack_4f4 = auVar122._12_4_;
      fStack_4f0 = auVar122._16_4_;
      fStack_4ec = auVar122._20_4_;
      fStack_4e8 = auVar122._24_4_;
      local_460._0_4_ =
           fVar280 * local_480 +
           fVar344 * fVar248 + fVar355 * (float)local_460._0_4_ + fVar336 * (float)local_500._0_4_;
      local_460._4_4_ =
           fVar292 * fStack_47c +
           fVar349 * fVar255 + fVar359 * (float)local_460._4_4_ + fVar340 * (float)local_500._4_4_;
      fStack_458 = fVar294 * fStack_478 +
                   fVar351 * fVar256 + fVar360 * fStack_458 + fVar341 * fStack_4f8;
      fStack_454 = fVar295 * fStack_474 +
                   fVar353 * fVar257 + fVar361 * fStack_454 + fVar342 * fStack_4f4;
      fStack_450 = fVar280 * fStack_470 +
                   fVar344 * fVar258 + fVar355 * fStack_450 + fVar336 * fStack_4f0;
      fStack_44c = fVar292 * fStack_46c +
                   fVar349 * fVar259 + fVar359 * fStack_44c + fVar340 * fStack_4ec;
      fStack_448 = fVar294 * fStack_468 +
                   fVar351 * fVar260 + fVar360 * fStack_448 + fVar341 * fStack_4e8;
      fStack_444 = fStack_384 + fVar162 + *(float *)(bspline_basis1 + lVar126 + 0x1c) + fVar277;
      fVar277 = *(float *)(bspline_basis0 + lVar126 + 0x1210);
      fVar222 = *(float *)(bspline_basis0 + lVar126 + 0x1214);
      fVar233 = *(float *)(bspline_basis0 + lVar126 + 0x1218);
      fVar235 = *(float *)(bspline_basis0 + lVar126 + 0x121c);
      fVar237 = *(float *)(bspline_basis0 + lVar126 + 0x1220);
      fVar240 = *(float *)(bspline_basis0 + lVar126 + 0x1224);
      fVar243 = *(float *)(bspline_basis0 + lVar126 + 0x1228);
      fVar246 = *(float *)(bspline_basis0 + lVar126 + 0x1694);
      fVar248 = *(float *)(bspline_basis0 + lVar126 + 0x1698);
      fVar255 = *(float *)(bspline_basis0 + lVar126 + 0x169c);
      fVar256 = *(float *)(bspline_basis0 + lVar126 + 0x16a0);
      fVar257 = *(float *)(bspline_basis0 + lVar126 + 0x16a4);
      fVar258 = *(float *)(bspline_basis0 + lVar126 + 0x16a8);
      fVar259 = *(float *)(bspline_basis0 + lVar126 + 0x16ac);
      fVar260 = *(float *)(bspline_basis0 + lVar126 + 0x1b18);
      fVar239 = *(float *)(bspline_basis0 + lVar126 + 0x1b1c);
      fVar190 = *(float *)(bspline_basis0 + lVar126 + 0x1b20);
      fVar301 = *(float *)(bspline_basis0 + lVar126 + 0x1b24);
      fVar302 = *(float *)(bspline_basis0 + lVar126 + 0x1b28);
      fVar242 = *(float *)(bspline_basis0 + lVar126 + 0x1b2c);
      fVar191 = *(float *)(bspline_basis0 + lVar126 + 0x1b30);
      fVar303 = *(float *)(bspline_basis0 + lVar126 + 0x1f9c);
      fVar304 = *(float *)(bspline_basis0 + lVar126 + 0x1fa0);
      fVar245 = *(float *)(bspline_basis0 + lVar126 + 0x1fa4);
      fVar192 = *(float *)(bspline_basis0 + lVar126 + 0x1fa8);
      fVar305 = *(float *)(bspline_basis0 + lVar126 + 0x1fac);
      fVar306 = *(float *)(bspline_basis0 + lVar126 + 0x1fb0);
      fVar247 = *(float *)(bspline_basis0 + lVar126 + 0x1fb4);
      fVar296 = *(float *)(bspline_basis1 + lVar126 + 0x4a0) + fVar295;
      _local_500 = auVar205;
      fVar193 = *(float *)(bspline_basis0 + lVar126 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar126 + 0x1fb8);
      fVar318 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) + fVar193;
      auVar179._0_4_ = fVar169 * fVar277 + fVar194 * fVar260 + fVar343 * fVar303 + fVar136 * fVar246
      ;
      auVar179._4_4_ = fVar185 * fVar222 + fVar209 * fVar239 + fVar348 * fVar304 + fVar156 * fVar248
      ;
      auVar179._8_4_ = fVar187 * fVar233 + fVar211 * fVar190 + fVar350 * fVar245 + fVar159 * fVar255
      ;
      auVar179._12_4_ =
           fVar189 * fVar235 + fVar278 * fVar301 + fVar352 * fVar192 + fVar162 * fVar256;
      auVar179._16_4_ =
           fVar169 * fVar237 + fVar194 * fVar302 + fVar343 * fVar305 + fVar136 * fVar257;
      auVar179._20_4_ =
           fVar185 * fVar240 + fVar209 * fVar242 + fVar348 * fVar306 + fVar156 * fVar258;
      auVar179._24_4_ =
           fVar187 * fVar243 + fVar211 * fVar191 + fVar350 * fVar247 + fVar159 * fVar259;
      auVar179._28_4_ =
           fVar193 + *(float *)(bspline_basis1 + lVar126 + 0x4a0) +
                     *(float *)(bspline_basis1 + lVar126 + 0x924) + fVar296;
      auVar220._0_4_ = fVar344 * fVar246 + fVar355 * fVar260 + fVar336 * fVar303 + fVar280 * fVar277
      ;
      auVar220._4_4_ = fVar349 * fVar248 + fVar359 * fVar239 + fVar340 * fVar304 + fVar292 * fVar222
      ;
      auVar220._8_4_ = fVar351 * fVar255 + fVar360 * fVar190 + fVar341 * fVar245 + fVar294 * fVar233
      ;
      auVar220._12_4_ =
           fVar353 * fVar256 + fVar361 * fVar301 + fVar342 * fVar192 + fVar295 * fVar235;
      auVar220._16_4_ =
           fVar344 * fVar257 + fVar355 * fVar302 + fVar336 * fVar305 + fVar280 * fVar237;
      auVar220._20_4_ =
           fVar349 * fVar258 + fVar359 * fVar242 + fVar340 * fVar306 + fVar292 * fVar240;
      auVar220._24_4_ =
           fVar351 * fVar259 + fVar360 * fVar191 + fVar341 * fVar247 + fVar294 * fVar243;
      auVar220._28_4_ = fVar318 + *(float *)(bspline_basis0 + lVar126 + 0x122c);
      fVar193 = *(float *)(bspline_basis1 + lVar126 + 0x1b18);
      fVar213 = *(float *)(bspline_basis1 + lVar126 + 0x1b1c);
      fVar137 = *(float *)(bspline_basis1 + lVar126 + 0x1b20);
      fVar157 = *(float *)(bspline_basis1 + lVar126 + 0x1b24);
      fVar160 = *(float *)(bspline_basis1 + lVar126 + 0x1b28);
      fVar163 = *(float *)(bspline_basis1 + lVar126 + 0x1b2c);
      fVar164 = *(float *)(bspline_basis1 + lVar126 + 0x1b30);
      fVar165 = *(float *)(bspline_basis1 + lVar126 + 0x1f9c);
      fVar166 = *(float *)(bspline_basis1 + lVar126 + 0x1fa0);
      fVar223 = *(float *)(bspline_basis1 + lVar126 + 0x1fa4);
      fVar234 = *(float *)(bspline_basis1 + lVar126 + 0x1fa8);
      fVar236 = *(float *)(bspline_basis1 + lVar126 + 0x1fac);
      fVar238 = *(float *)(bspline_basis1 + lVar126 + 0x1fb0);
      fVar241 = *(float *)(bspline_basis1 + lVar126 + 0x1fb4);
      fVar244 = *(float *)(bspline_basis1 + lVar126 + 0x1694);
      fVar261 = *(float *)(bspline_basis1 + lVar126 + 0x1698);
      fVar263 = *(float *)(bspline_basis1 + lVar126 + 0x169c);
      fVar271 = *(float *)(bspline_basis1 + lVar126 + 0x16a0);
      fVar273 = *(float *)(bspline_basis1 + lVar126 + 0x16a4);
      fVar279 = *(float *)(bspline_basis1 + lVar126 + 0x16a8);
      fVar291 = *(float *)(bspline_basis1 + lVar126 + 0x16ac);
      fVar293 = *(float *)(bspline_basis1 + lVar126 + 0x1210);
      fVar307 = *(float *)(bspline_basis1 + lVar126 + 0x1214);
      fVar315 = *(float *)(bspline_basis1 + lVar126 + 0x1218);
      fVar316 = *(float *)(bspline_basis1 + lVar126 + 0x121c);
      fVar317 = *(float *)(bspline_basis1 + lVar126 + 0x1220);
      fVar354 = *(float *)(bspline_basis1 + lVar126 + 0x1224);
      fVar358 = *(float *)(bspline_basis1 + lVar126 + 0x1228);
      auVar297._0_4_ = fVar293 * fVar326 + fVar195 * fVar244 + fVar168 * fVar193 + fVar135 * fVar165
      ;
      auVar297._4_4_ =
           fVar307 * fStack_49c + fVar210 * fVar261 + fVar184 * fVar213 + fVar155 * fVar166;
      auVar297._8_4_ =
           fVar315 * fStack_498 + fVar167 * fVar263 + fVar186 * fVar137 + fVar158 * fVar223;
      auVar297._12_4_ =
           fVar316 * fStack_494 + fVar212 * fVar271 + fVar188 * fVar157 + fVar161 * fVar234;
      auVar297._16_4_ =
           fVar317 * fVar326 + fVar195 * fVar273 + fVar168 * fVar160 + fVar135 * fVar236;
      auVar297._20_4_ =
           fVar354 * fStack_49c + fVar210 * fVar279 + fVar184 * fVar163 + fVar155 * fVar238;
      auVar297._24_4_ =
           fVar358 * fStack_498 + fVar167 * fVar291 + fVar186 * fVar164 + fVar158 * fVar241;
      auVar297._28_4_ = fVar161 + fVar161 + fVar318 + fVar161;
      auVar311._0_4_ = fVar169 * fVar293 + fVar136 * fVar244 + fVar194 * fVar193 + fVar343 * fVar165
      ;
      auVar311._4_4_ = fVar185 * fVar307 + fVar156 * fVar261 + fVar209 * fVar213 + fVar348 * fVar166
      ;
      auVar311._8_4_ = fVar187 * fVar315 + fVar159 * fVar263 + fVar211 * fVar137 + fVar350 * fVar223
      ;
      auVar311._12_4_ =
           fVar189 * fVar316 + fVar162 * fVar271 + fVar278 * fVar157 + fVar352 * fVar234;
      auVar311._16_4_ =
           fVar169 * fVar317 + fVar136 * fVar273 + fVar194 * fVar160 + fVar343 * fVar236;
      auVar311._20_4_ =
           fVar185 * fVar354 + fVar156 * fVar279 + fVar209 * fVar163 + fVar348 * fVar238;
      auVar311._24_4_ =
           fVar187 * fVar358 + fVar159 * fVar291 + fVar211 * fVar164 + fVar350 * fVar241;
      auVar311._28_4_ = fVar161 + fVar161 + fVar161 + fVar318;
      auVar228._0_4_ = fVar280 * fVar293 + fVar344 * fVar244 + fVar355 * fVar193 + fVar336 * fVar165
      ;
      auVar228._4_4_ = fVar292 * fVar307 + fVar349 * fVar261 + fVar359 * fVar213 + fVar340 * fVar166
      ;
      auVar228._8_4_ = fVar294 * fVar315 + fVar351 * fVar263 + fVar360 * fVar137 + fVar341 * fVar223
      ;
      auVar228._12_4_ =
           fVar295 * fVar316 + fVar353 * fVar271 + fVar361 * fVar157 + fVar342 * fVar234;
      auVar228._16_4_ =
           fVar280 * fVar317 + fVar344 * fVar273 + fVar355 * fVar160 + fVar336 * fVar236;
      auVar228._20_4_ =
           fVar292 * fVar354 + fVar349 * fVar279 + fVar359 * fVar163 + fVar340 * fVar238;
      auVar228._24_4_ =
           fVar294 * fVar358 + fVar351 * fVar291 + fVar360 * fVar164 + fVar341 * fVar241;
      auVar228._28_4_ =
           *(float *)(bspline_basis1 + lVar126 + 0x122c) +
           *(float *)(bspline_basis1 + lVar126 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar126 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar126 + 0x1fb8);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar206._16_4_ = 0x7fffffff;
      auVar206._20_4_ = 0x7fffffff;
      auVar206._24_4_ = 0x7fffffff;
      auVar206._28_4_ = 0x7fffffff;
      auVar114._4_4_ =
           fVar222 * fStack_49c + fVar210 * fVar248 + fVar184 * fVar239 + fVar155 * fVar304;
      auVar114._0_4_ = fVar277 * fVar326 + fVar195 * fVar246 + fVar168 * fVar260 + fVar135 * fVar303
      ;
      auVar114._8_4_ =
           fVar233 * fStack_498 + fVar167 * fVar255 + fVar186 * fVar190 + fVar158 * fVar245;
      auVar114._12_4_ =
           fVar235 * fStack_494 + fVar212 * fVar256 + fVar188 * fVar301 + fVar161 * fVar192;
      auVar114._16_4_ =
           fVar237 * fVar326 + fVar195 * fVar257 + fVar168 * fVar302 + fVar135 * fVar305;
      auVar114._20_4_ =
           fVar240 * fStack_49c + fVar210 * fVar258 + fVar184 * fVar242 + fVar155 * fVar306;
      auVar114._24_4_ =
           fVar243 * fStack_498 + fVar167 * fVar259 + fVar186 * fVar191 + fVar158 * fVar247;
      auVar114._28_4_ =
           *(float *)(bspline_basis0 + lVar126 + 0x16b0) +
           *(float *)(bspline_basis0 + lVar126 + 0x1fb8) + fVar296;
      auVar21 = vandps_avx(auVar114,auVar206);
      auVar23 = vandps_avx(auVar179,auVar206);
      auVar23 = vmaxps_avx(auVar21,auVar23);
      auVar21 = vandps_avx(auVar220,auVar206);
      auVar21 = vmaxps_avx(auVar23,auVar21);
      auVar362 = vpermilps_avx(local_800,0);
      auVar288._16_16_ = auVar362;
      auVar288._0_16_ = auVar362;
      auVar21 = vcmpps_avx(auVar21,auVar288,1);
      auVar24 = vblendvps_avx(auVar114,local_3c0,auVar21);
      auVar25 = vblendvps_avx(auVar179,auVar22,auVar21);
      auVar21 = vandps_avx(auVar297,auVar206);
      auVar23 = vandps_avx(auVar311,auVar206);
      auVar26 = vmaxps_avx(auVar21,auVar23);
      auVar21 = vandps_avx(auVar228,auVar206);
      auVar21 = vmaxps_avx(auVar26,auVar21);
      auVar26 = vcmpps_avx(auVar21,auVar288,1);
      auVar21 = vblendvps_avx(auVar297,local_3c0,auVar26);
      auVar22 = vblendvps_avx(auVar311,auVar22,auVar26);
      fVar137 = auVar24._0_4_;
      fVar157 = auVar24._4_4_;
      fVar160 = auVar24._8_4_;
      fVar163 = auVar24._12_4_;
      fVar164 = auVar24._16_4_;
      fVar165 = auVar24._20_4_;
      fVar166 = auVar24._24_4_;
      fVar223 = auVar21._0_4_;
      fVar234 = auVar21._4_4_;
      fVar236 = auVar21._8_4_;
      fVar238 = auVar21._12_4_;
      fVar241 = auVar21._16_4_;
      fVar244 = auVar21._20_4_;
      fVar135 = auVar21._24_4_;
      fVar277 = auVar25._0_4_;
      fVar237 = auVar25._4_4_;
      fVar248 = auVar25._8_4_;
      fVar258 = auVar25._12_4_;
      fVar190 = auVar25._16_4_;
      fVar191 = auVar25._20_4_;
      fVar192 = auVar25._24_4_;
      auVar143._0_4_ = fVar277 * fVar277 + fVar137 * fVar137;
      auVar143._4_4_ = fVar237 * fVar237 + fVar157 * fVar157;
      auVar143._8_4_ = fVar248 * fVar248 + fVar160 * fVar160;
      auVar143._12_4_ = fVar258 * fVar258 + fVar163 * fVar163;
      auVar143._16_4_ = fVar190 * fVar190 + fVar164 * fVar164;
      auVar143._20_4_ = fVar191 * fVar191 + fVar165 * fVar165;
      auVar143._24_4_ = fVar192 * fVar192 + fVar166 * fVar166;
      auVar143._28_4_ = auVar311._28_4_ + auVar24._28_4_;
      auVar24 = vrsqrtps_avx(auVar143);
      fVar222 = auVar24._0_4_;
      fVar233 = auVar24._4_4_;
      auVar33._4_4_ = fVar233 * 1.5;
      auVar33._0_4_ = fVar222 * 1.5;
      fVar235 = auVar24._8_4_;
      auVar33._8_4_ = fVar235 * 1.5;
      fVar240 = auVar24._12_4_;
      auVar33._12_4_ = fVar240 * 1.5;
      fVar243 = auVar24._16_4_;
      auVar33._16_4_ = fVar243 * 1.5;
      fVar246 = auVar24._20_4_;
      auVar33._20_4_ = fVar246 * 1.5;
      fVar255 = auVar24._24_4_;
      auVar33._24_4_ = fVar255 * 1.5;
      auVar33._28_4_ = auVar23._28_4_;
      auVar34._4_4_ = fVar233 * fVar233 * fVar233 * auVar143._4_4_ * 0.5;
      auVar34._0_4_ = fVar222 * fVar222 * fVar222 * auVar143._0_4_ * 0.5;
      auVar34._8_4_ = fVar235 * fVar235 * fVar235 * auVar143._8_4_ * 0.5;
      auVar34._12_4_ = fVar240 * fVar240 * fVar240 * auVar143._12_4_ * 0.5;
      auVar34._16_4_ = fVar243 * fVar243 * fVar243 * auVar143._16_4_ * 0.5;
      auVar34._20_4_ = fVar246 * fVar246 * fVar246 * auVar143._20_4_ * 0.5;
      auVar34._24_4_ = fVar255 * fVar255 * fVar255 * auVar143._24_4_ * 0.5;
      auVar34._28_4_ = auVar143._28_4_;
      auVar24 = vsubps_avx(auVar33,auVar34);
      fVar222 = auVar24._0_4_;
      fVar240 = auVar24._4_4_;
      fVar255 = auVar24._8_4_;
      fVar259 = auVar24._12_4_;
      fVar301 = auVar24._16_4_;
      fVar303 = auVar24._20_4_;
      fVar305 = auVar24._24_4_;
      fVar193 = auVar25._28_4_;
      fVar233 = auVar22._0_4_;
      fVar243 = auVar22._4_4_;
      fVar256 = auVar22._8_4_;
      fVar260 = auVar22._12_4_;
      fVar302 = auVar22._16_4_;
      fVar304 = auVar22._20_4_;
      fVar306 = auVar22._24_4_;
      auVar144._0_4_ = fVar233 * fVar233 + fVar223 * fVar223;
      auVar144._4_4_ = fVar243 * fVar243 + fVar234 * fVar234;
      auVar144._8_4_ = fVar256 * fVar256 + fVar236 * fVar236;
      auVar144._12_4_ = fVar260 * fVar260 + fVar238 * fVar238;
      auVar144._16_4_ = fVar302 * fVar302 + fVar241 * fVar241;
      auVar144._20_4_ = fVar304 * fVar304 + fVar244 * fVar244;
      auVar144._24_4_ = fVar306 * fVar306 + fVar135 * fVar135;
      auVar144._28_4_ = auVar21._28_4_ + auVar24._28_4_;
      auVar21 = vrsqrtps_avx(auVar144);
      fVar235 = auVar21._0_4_;
      fVar246 = auVar21._4_4_;
      auVar35._4_4_ = fVar246 * 1.5;
      auVar35._0_4_ = fVar235 * 1.5;
      fVar257 = auVar21._8_4_;
      auVar35._8_4_ = fVar257 * 1.5;
      fVar239 = auVar21._12_4_;
      auVar35._12_4_ = fVar239 * 1.5;
      fVar242 = auVar21._16_4_;
      auVar35._16_4_ = fVar242 * 1.5;
      fVar245 = auVar21._20_4_;
      auVar35._20_4_ = fVar245 * 1.5;
      fVar247 = auVar21._24_4_;
      auVar35._24_4_ = fVar247 * 1.5;
      auVar35._28_4_ = auVar23._28_4_;
      fVar213 = auVar21._28_4_;
      auVar36._4_4_ = fVar246 * fVar246 * fVar246 * auVar144._4_4_ * 0.5;
      auVar36._0_4_ = fVar235 * fVar235 * fVar235 * auVar144._0_4_ * 0.5;
      auVar36._8_4_ = fVar257 * fVar257 * fVar257 * auVar144._8_4_ * 0.5;
      auVar36._12_4_ = fVar239 * fVar239 * fVar239 * auVar144._12_4_ * 0.5;
      auVar36._16_4_ = fVar242 * fVar242 * fVar242 * auVar144._16_4_ * 0.5;
      auVar36._20_4_ = fVar245 * fVar245 * fVar245 * auVar144._20_4_ * 0.5;
      auVar36._24_4_ = fVar247 * fVar247 * fVar247 * auVar144._24_4_ * 0.5;
      auVar36._28_4_ = auVar144._28_4_;
      auVar21 = vsubps_avx(auVar35,auVar36);
      fVar235 = auVar21._0_4_;
      fVar246 = auVar21._4_4_;
      fVar257 = auVar21._8_4_;
      fVar239 = auVar21._12_4_;
      fVar242 = auVar21._16_4_;
      fVar245 = auVar21._20_4_;
      fVar247 = auVar21._24_4_;
      fVar277 = (float)local_780._0_4_ * fVar277 * fVar222;
      fVar237 = local_780._4_4_ * fVar237 * fVar240;
      auVar37._4_4_ = fVar237;
      auVar37._0_4_ = fVar277;
      fVar248 = local_780._8_4_ * fVar248 * fVar255;
      auVar37._8_4_ = fVar248;
      fVar258 = local_780._12_4_ * fVar258 * fVar259;
      auVar37._12_4_ = fVar258;
      fVar190 = local_780._16_4_ * fVar190 * fVar301;
      auVar37._16_4_ = fVar190;
      fVar191 = local_780._20_4_ * fVar191 * fVar303;
      auVar37._20_4_ = fVar191;
      fVar192 = local_780._24_4_ * fVar192 * fVar305;
      auVar37._24_4_ = fVar192;
      auVar37._28_4_ = fVar193;
      local_5c0._4_4_ = auVar321._4_4_ + fVar237;
      local_5c0._0_4_ = auVar321._0_4_ + fVar277;
      fStack_5b8 = auVar321._8_4_ + fVar248;
      fStack_5b4 = auVar321._12_4_ + fVar258;
      fStack_5b0 = auVar321._16_4_ + fVar190;
      fStack_5ac = auVar321._20_4_ + fVar191;
      fStack_5a8 = auVar321._24_4_ + fVar192;
      fStack_5a4 = auVar321._28_4_ + fVar193;
      local_5e0 = (float)local_780._0_4_ * fVar222 * -fVar137;
      fStack_5dc = local_780._4_4_ * fVar240 * -fVar157;
      auVar38._4_4_ = fStack_5dc;
      auVar38._0_4_ = local_5e0;
      fStack_5d8 = local_780._8_4_ * fVar255 * -fVar160;
      auVar38._8_4_ = fStack_5d8;
      fStack_5d4 = local_780._12_4_ * fVar259 * -fVar163;
      auVar38._12_4_ = fStack_5d4;
      fStack_5d0 = local_780._16_4_ * fVar301 * -fVar164;
      auVar38._16_4_ = fStack_5d0;
      fStack_5cc = local_780._20_4_ * fVar303 * -fVar165;
      auVar38._20_4_ = fStack_5cc;
      fStack_5c8 = local_780._24_4_ * fVar305 * -fVar166;
      auVar38._24_4_ = fStack_5c8;
      auVar38._28_4_ = 0x3f000000;
      local_5e0 = local_5e0 + local_360._0_4_;
      fStack_5dc = fStack_5dc + local_360._4_4_;
      fStack_5d8 = fStack_5d8 + local_360._8_4_;
      fStack_5d4 = fStack_5d4 + local_360._12_4_;
      fStack_5d0 = fStack_5d0 + local_360._16_4_;
      fStack_5cc = fStack_5cc + local_360._20_4_;
      fStack_5c8 = fStack_5c8 + local_360._24_4_;
      fStack_5c4 = 0.5;
      fVar277 = (float)local_780._0_4_ * fVar222 * 0.0;
      fVar222 = local_780._4_4_ * fVar240 * 0.0;
      auVar39._4_4_ = fVar222;
      auVar39._0_4_ = fVar277;
      fVar237 = local_780._8_4_ * fVar255 * 0.0;
      auVar39._8_4_ = fVar237;
      fVar240 = local_780._12_4_ * fVar259 * 0.0;
      auVar39._12_4_ = fVar240;
      fVar248 = local_780._16_4_ * fVar301 * 0.0;
      auVar39._16_4_ = fVar248;
      fVar255 = local_780._20_4_ * fVar303 * 0.0;
      auVar39._20_4_ = fVar255;
      fVar258 = local_780._24_4_ * fVar305 * 0.0;
      auVar39._24_4_ = fVar258;
      auVar39._28_4_ = fVar295;
      auVar298._0_4_ = fVar277 + (float)local_460._0_4_;
      auVar298._4_4_ = fVar222 + (float)local_460._4_4_;
      auVar298._8_4_ = fVar237 + fStack_458;
      auVar298._12_4_ = fVar240 + fStack_454;
      auVar298._16_4_ = fVar248 + fStack_450;
      auVar298._20_4_ = fVar255 + fStack_44c;
      auVar298._24_4_ = fVar258 + fStack_448;
      auVar298._28_4_ = fVar295 + fStack_444;
      fVar277 = (float)local_6c0._0_4_ * fVar233 * fVar235;
      fVar222 = local_6c0._4_4_ * fVar243 * fVar246;
      auVar40._4_4_ = fVar222;
      auVar40._0_4_ = fVar277;
      fVar233 = local_6c0._8_4_ * fVar256 * fVar257;
      auVar40._8_4_ = fVar233;
      fVar237 = local_6c0._12_4_ * fVar260 * fVar239;
      auVar40._12_4_ = fVar237;
      fVar240 = local_6c0._16_4_ * fVar302 * fVar242;
      auVar40._16_4_ = fVar240;
      fVar243 = local_6c0._20_4_ * fVar304 * fVar245;
      auVar40._20_4_ = fVar243;
      fVar248 = local_6c0._24_4_ * fVar306 * fVar247;
      auVar40._24_4_ = fVar248;
      auVar40._28_4_ = auVar22._28_4_;
      auVar25 = vsubps_avx(auVar321,auVar37);
      auVar322._0_4_ = auVar205._0_4_ + fVar277;
      auVar322._4_4_ = auVar205._4_4_ + fVar222;
      auVar322._8_4_ = auVar205._8_4_ + fVar233;
      auVar322._12_4_ = auVar205._12_4_ + fVar237;
      auVar322._16_4_ = auVar205._16_4_ + fVar240;
      auVar322._20_4_ = auVar205._20_4_ + fVar243;
      auVar322._24_4_ = auVar205._24_4_ + fVar248;
      auVar322._28_4_ = auVar205._28_4_ + auVar22._28_4_;
      fVar277 = (float)local_6c0._0_4_ * -fVar223 * fVar235;
      fVar222 = local_6c0._4_4_ * -fVar234 * fVar246;
      auVar41._4_4_ = fVar222;
      auVar41._0_4_ = fVar277;
      fVar233 = local_6c0._8_4_ * -fVar236 * fVar257;
      auVar41._8_4_ = fVar233;
      fVar237 = local_6c0._12_4_ * -fVar238 * fVar239;
      auVar41._12_4_ = fVar237;
      fVar240 = local_6c0._16_4_ * -fVar241 * fVar242;
      auVar41._16_4_ = fVar240;
      fVar243 = local_6c0._20_4_ * -fVar244 * fVar245;
      auVar41._20_4_ = fVar243;
      fVar248 = local_6c0._24_4_ * -fVar135 * fVar247;
      auVar41._24_4_ = fVar248;
      auVar41._28_4_ = fVar193;
      auVar141 = vsubps_avx(local_360,auVar38);
      auVar346._0_4_ = local_380._0_4_ + fVar277;
      auVar346._4_4_ = local_380._4_4_ + fVar222;
      auVar346._8_4_ = local_380._8_4_ + fVar233;
      auVar346._12_4_ = local_380._12_4_ + fVar237;
      auVar346._16_4_ = local_380._16_4_ + fVar240;
      auVar346._20_4_ = local_380._20_4_ + fVar243;
      auVar346._24_4_ = local_380._24_4_ + fVar248;
      auVar346._28_4_ = local_380._28_4_ + fVar193;
      fVar277 = (float)local_6c0._0_4_ * fVar235 * 0.0;
      fVar222 = local_6c0._4_4_ * fVar246 * 0.0;
      auVar42._4_4_ = fVar222;
      auVar42._0_4_ = fVar277;
      fVar233 = local_6c0._8_4_ * fVar257 * 0.0;
      auVar42._8_4_ = fVar233;
      fVar235 = local_6c0._12_4_ * fVar239 * 0.0;
      auVar42._12_4_ = fVar235;
      fVar237 = local_6c0._16_4_ * fVar242 * 0.0;
      auVar42._16_4_ = fVar237;
      fVar240 = local_6c0._20_4_ * fVar245 * 0.0;
      auVar42._20_4_ = fVar240;
      fVar243 = local_6c0._24_4_ * fVar247 * 0.0;
      auVar42._24_4_ = fVar243;
      auVar42._28_4_ = fVar213;
      auVar27 = vsubps_avx(_local_460,auVar39);
      auVar120._4_4_ = fStack_39c;
      auVar120._0_4_ = local_3a0;
      auVar120._8_4_ = fStack_398;
      auVar120._12_4_ = fStack_394;
      auVar120._16_4_ = fStack_390;
      auVar120._20_4_ = fStack_38c;
      auVar120._24_4_ = fStack_388;
      auVar120._28_4_ = fStack_384;
      auVar356._0_4_ = local_3a0 + fVar277;
      auVar356._4_4_ = fStack_39c + fVar222;
      auVar356._8_4_ = fStack_398 + fVar233;
      auVar356._12_4_ = fStack_394 + fVar235;
      auVar356._16_4_ = fStack_390 + fVar237;
      auVar356._20_4_ = fStack_38c + fVar240;
      auVar356._24_4_ = fStack_388 + fVar243;
      auVar356._28_4_ = fStack_384 + fVar213;
      auVar21 = vsubps_avx(auVar205,auVar40);
      auVar22 = vsubps_avx(local_380,auVar41);
      auVar23 = vsubps_avx(auVar120,auVar42);
      auVar24 = vsubps_avx(auVar346,auVar141);
      auVar26 = vsubps_avx(auVar356,auVar27);
      auVar43._4_4_ = auVar27._4_4_ * auVar24._4_4_;
      auVar43._0_4_ = auVar27._0_4_ * auVar24._0_4_;
      auVar43._8_4_ = auVar27._8_4_ * auVar24._8_4_;
      auVar43._12_4_ = auVar27._12_4_ * auVar24._12_4_;
      auVar43._16_4_ = auVar27._16_4_ * auVar24._16_4_;
      auVar43._20_4_ = auVar27._20_4_ * auVar24._20_4_;
      auVar43._24_4_ = auVar27._24_4_ * auVar24._24_4_;
      auVar43._28_4_ = fVar213;
      auVar44._4_4_ = auVar141._4_4_ * auVar26._4_4_;
      auVar44._0_4_ = auVar141._0_4_ * auVar26._0_4_;
      auVar44._8_4_ = auVar141._8_4_ * auVar26._8_4_;
      auVar44._12_4_ = auVar141._12_4_ * auVar26._12_4_;
      auVar44._16_4_ = auVar141._16_4_ * auVar26._16_4_;
      auVar44._20_4_ = auVar141._20_4_ * auVar26._20_4_;
      auVar44._24_4_ = auVar141._24_4_ * auVar26._24_4_;
      auVar44._28_4_ = fStack_384;
      auVar19 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = auVar25._4_4_ * auVar26._4_4_;
      auVar45._0_4_ = auVar25._0_4_ * auVar26._0_4_;
      auVar45._8_4_ = auVar25._8_4_ * auVar26._8_4_;
      auVar45._12_4_ = auVar25._12_4_ * auVar26._12_4_;
      auVar45._16_4_ = auVar25._16_4_ * auVar26._16_4_;
      auVar45._20_4_ = auVar25._20_4_ * auVar26._20_4_;
      auVar45._24_4_ = auVar25._24_4_ * auVar26._24_4_;
      auVar45._28_4_ = auVar26._28_4_;
      auVar142 = vsubps_avx(auVar322,auVar25);
      auVar46._4_4_ = auVar27._4_4_ * auVar142._4_4_;
      auVar46._0_4_ = auVar27._0_4_ * auVar142._0_4_;
      auVar46._8_4_ = auVar27._8_4_ * auVar142._8_4_;
      auVar46._12_4_ = auVar27._12_4_ * auVar142._12_4_;
      auVar46._16_4_ = auVar27._16_4_ * auVar142._16_4_;
      auVar46._20_4_ = auVar27._20_4_ * auVar142._20_4_;
      auVar46._24_4_ = auVar27._24_4_ * auVar142._24_4_;
      auVar46._28_4_ = local_380._28_4_;
      auVar175 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = auVar141._4_4_ * auVar142._4_4_;
      auVar47._0_4_ = auVar141._0_4_ * auVar142._0_4_;
      auVar47._8_4_ = auVar141._8_4_ * auVar142._8_4_;
      auVar47._12_4_ = auVar141._12_4_ * auVar142._12_4_;
      auVar47._16_4_ = auVar141._16_4_ * auVar142._16_4_;
      auVar47._20_4_ = auVar141._20_4_ * auVar142._20_4_;
      auVar47._24_4_ = auVar141._24_4_ * auVar142._24_4_;
      auVar47._28_4_ = auVar26._28_4_;
      auVar48._4_4_ = auVar25._4_4_ * auVar24._4_4_;
      auVar48._0_4_ = auVar25._0_4_ * auVar24._0_4_;
      auVar48._8_4_ = auVar25._8_4_ * auVar24._8_4_;
      auVar48._12_4_ = auVar25._12_4_ * auVar24._12_4_;
      auVar48._16_4_ = auVar25._16_4_ * auVar24._16_4_;
      auVar48._20_4_ = auVar25._20_4_ * auVar24._20_4_;
      auVar48._24_4_ = auVar25._24_4_ * auVar24._24_4_;
      auVar48._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar48,auVar47);
      auVar145._0_4_ = auVar19._0_4_ * 0.0 + auVar24._0_4_ + auVar175._0_4_ * 0.0;
      auVar145._4_4_ = auVar19._4_4_ * 0.0 + auVar24._4_4_ + auVar175._4_4_ * 0.0;
      auVar145._8_4_ = auVar19._8_4_ * 0.0 + auVar24._8_4_ + auVar175._8_4_ * 0.0;
      auVar145._12_4_ = auVar19._12_4_ * 0.0 + auVar24._12_4_ + auVar175._12_4_ * 0.0;
      auVar145._16_4_ = auVar19._16_4_ * 0.0 + auVar24._16_4_ + auVar175._16_4_ * 0.0;
      auVar145._20_4_ = auVar19._20_4_ * 0.0 + auVar24._20_4_ + auVar175._20_4_ * 0.0;
      auVar145._24_4_ = auVar19._24_4_ * 0.0 + auVar24._24_4_ + auVar175._24_4_ * 0.0;
      auVar145._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar175._28_4_;
      auVar19 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,2);
      _local_7c0 = vblendvps_avx(auVar21,_local_5c0,auVar19);
      auVar115._4_4_ = fStack_5dc;
      auVar115._0_4_ = local_5e0;
      auVar115._8_4_ = fStack_5d8;
      auVar115._12_4_ = fStack_5d4;
      auVar115._16_4_ = fStack_5d0;
      auVar115._20_4_ = fStack_5cc;
      auVar115._24_4_ = fStack_5c8;
      auVar115._28_4_ = 0x3f000000;
      local_5a0 = vblendvps_avx(auVar22,auVar115,auVar19);
      auVar21 = vblendvps_avx(auVar23,auVar298,auVar19);
      auVar22 = vblendvps_avx(auVar25,auVar322,auVar19);
      auVar23 = vblendvps_avx(auVar141,auVar346,auVar19);
      auVar24 = vblendvps_avx(auVar27,auVar356,auVar19);
      auVar25 = vblendvps_avx(auVar322,auVar25,auVar19);
      auVar26 = vblendvps_avx(auVar346,auVar141,auVar19);
      auVar362 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
      auVar27 = vblendvps_avx(auVar356,auVar27,auVar19);
      auVar25 = vsubps_avx(auVar25,_local_7c0);
      auVar26 = vsubps_avx(auVar26,local_5a0);
      auVar27 = vsubps_avx(auVar27,auVar21);
      auVar142 = vsubps_avx(local_5a0,auVar23);
      fVar277 = auVar26._0_4_;
      fVar165 = auVar21._0_4_;
      fVar240 = auVar26._4_4_;
      fVar166 = auVar21._4_4_;
      auVar49._4_4_ = fVar166 * fVar240;
      auVar49._0_4_ = fVar165 * fVar277;
      fVar256 = auVar26._8_4_;
      fVar223 = auVar21._8_4_;
      auVar49._8_4_ = fVar223 * fVar256;
      fVar239 = auVar26._12_4_;
      fVar234 = auVar21._12_4_;
      auVar49._12_4_ = fVar234 * fVar239;
      fVar191 = auVar26._16_4_;
      fVar236 = auVar21._16_4_;
      auVar49._16_4_ = fVar236 * fVar191;
      fVar305 = auVar26._20_4_;
      fVar238 = auVar21._20_4_;
      auVar49._20_4_ = fVar238 * fVar305;
      fVar137 = auVar26._24_4_;
      fVar241 = auVar21._24_4_;
      auVar49._24_4_ = fVar241 * fVar137;
      auVar49._28_4_ = auVar20._28_4_;
      fVar222 = local_5a0._0_4_;
      fVar161 = auVar27._0_4_;
      fVar243 = local_5a0._4_4_;
      fVar162 = auVar27._4_4_;
      auVar50._4_4_ = fVar162 * fVar243;
      auVar50._0_4_ = fVar161 * fVar222;
      fVar257 = local_5a0._8_4_;
      fVar194 = auVar27._8_4_;
      auVar50._8_4_ = fVar194 * fVar257;
      fVar190 = local_5a0._12_4_;
      fVar195 = auVar27._12_4_;
      auVar50._12_4_ = fVar195 * fVar190;
      fVar303 = local_5a0._16_4_;
      fVar209 = auVar27._16_4_;
      auVar50._16_4_ = fVar209 * fVar303;
      fVar306 = local_5a0._20_4_;
      fVar210 = auVar27._20_4_;
      auVar50._20_4_ = fVar210 * fVar306;
      fVar157 = local_5a0._24_4_;
      fVar211 = auVar27._24_4_;
      uVar134 = auVar141._28_4_;
      auVar50._24_4_ = fVar211 * fVar157;
      auVar50._28_4_ = uVar134;
      auVar20 = vsubps_avx(auVar50,auVar49);
      fVar233 = local_7c0._0_4_;
      fVar246 = local_7c0._4_4_;
      auVar51._4_4_ = fVar162 * fVar246;
      auVar51._0_4_ = fVar161 * fVar233;
      fVar258 = local_7c0._8_4_;
      auVar51._8_4_ = fVar194 * fVar258;
      fVar301 = local_7c0._12_4_;
      auVar51._12_4_ = fVar195 * fVar301;
      fVar304 = local_7c0._16_4_;
      auVar51._16_4_ = fVar209 * fVar304;
      fVar247 = local_7c0._20_4_;
      auVar51._20_4_ = fVar210 * fVar247;
      fVar160 = local_7c0._24_4_;
      auVar51._24_4_ = fVar211 * fVar160;
      auVar51._28_4_ = uVar134;
      fVar235 = auVar25._0_4_;
      fVar248 = auVar25._4_4_;
      auVar52._4_4_ = fVar166 * fVar248;
      auVar52._0_4_ = fVar165 * fVar235;
      fVar259 = auVar25._8_4_;
      auVar52._8_4_ = fVar223 * fVar259;
      fVar302 = auVar25._12_4_;
      auVar52._12_4_ = fVar234 * fVar302;
      fVar245 = auVar25._16_4_;
      auVar52._16_4_ = fVar236 * fVar245;
      fVar193 = auVar25._20_4_;
      auVar52._20_4_ = fVar238 * fVar193;
      fVar163 = auVar25._24_4_;
      auVar52._24_4_ = fVar241 * fVar163;
      auVar52._28_4_ = auVar346._28_4_;
      auVar141 = vsubps_avx(auVar52,auVar51);
      auVar53._4_4_ = fVar243 * fVar248;
      auVar53._0_4_ = fVar222 * fVar235;
      auVar53._8_4_ = fVar257 * fVar259;
      auVar53._12_4_ = fVar190 * fVar302;
      auVar53._16_4_ = fVar303 * fVar245;
      auVar53._20_4_ = fVar306 * fVar193;
      auVar53._24_4_ = fVar157 * fVar163;
      auVar53._28_4_ = uVar134;
      auVar54._4_4_ = fVar246 * fVar240;
      auVar54._0_4_ = fVar233 * fVar277;
      auVar54._8_4_ = fVar258 * fVar256;
      auVar54._12_4_ = fVar301 * fVar239;
      auVar54._16_4_ = fVar304 * fVar191;
      auVar54._20_4_ = fVar247 * fVar305;
      auVar54._24_4_ = fVar160 * fVar137;
      auVar54._28_4_ = auVar356._28_4_;
      auVar175 = vsubps_avx(auVar54,auVar53);
      auVar21 = vsubps_avx(auVar21,auVar24);
      fVar237 = auVar175._28_4_ + auVar141._28_4_;
      auVar229._0_4_ = auVar175._0_4_ + auVar141._0_4_ * 0.0 + auVar20._0_4_ * 0.0;
      auVar229._4_4_ = auVar175._4_4_ + auVar141._4_4_ * 0.0 + auVar20._4_4_ * 0.0;
      auVar229._8_4_ = auVar175._8_4_ + auVar141._8_4_ * 0.0 + auVar20._8_4_ * 0.0;
      auVar229._12_4_ = auVar175._12_4_ + auVar141._12_4_ * 0.0 + auVar20._12_4_ * 0.0;
      auVar229._16_4_ = auVar175._16_4_ + auVar141._16_4_ * 0.0 + auVar20._16_4_ * 0.0;
      auVar229._20_4_ = auVar175._20_4_ + auVar141._20_4_ * 0.0 + auVar20._20_4_ * 0.0;
      auVar229._24_4_ = auVar175._24_4_ + auVar141._24_4_ * 0.0 + auVar20._24_4_ * 0.0;
      auVar229._28_4_ = fVar237 + 0.0;
      fVar244 = auVar142._0_4_;
      fVar135 = auVar142._4_4_;
      auVar55._4_4_ = fVar135 * auVar24._4_4_;
      auVar55._0_4_ = fVar244 * auVar24._0_4_;
      fVar136 = auVar142._8_4_;
      auVar55._8_4_ = fVar136 * auVar24._8_4_;
      fVar155 = auVar142._12_4_;
      auVar55._12_4_ = fVar155 * auVar24._12_4_;
      fVar156 = auVar142._16_4_;
      auVar55._16_4_ = fVar156 * auVar24._16_4_;
      fVar158 = auVar142._20_4_;
      auVar55._20_4_ = fVar158 * auVar24._20_4_;
      fVar159 = auVar142._24_4_;
      auVar55._24_4_ = fVar159 * auVar24._24_4_;
      auVar55._28_4_ = fVar237;
      fVar237 = auVar21._0_4_;
      fVar255 = auVar21._4_4_;
      auVar56._4_4_ = auVar23._4_4_ * fVar255;
      auVar56._0_4_ = auVar23._0_4_ * fVar237;
      fVar260 = auVar21._8_4_;
      auVar56._8_4_ = auVar23._8_4_ * fVar260;
      fVar242 = auVar21._12_4_;
      auVar56._12_4_ = auVar23._12_4_ * fVar242;
      fVar192 = auVar21._16_4_;
      auVar56._16_4_ = auVar23._16_4_ * fVar192;
      fVar213 = auVar21._20_4_;
      auVar56._20_4_ = auVar23._20_4_ * fVar213;
      fVar164 = auVar21._24_4_;
      auVar56._24_4_ = auVar23._24_4_ * fVar164;
      auVar56._28_4_ = auVar175._28_4_;
      auVar20 = vsubps_avx(auVar56,auVar55);
      auVar141 = vsubps_avx(_local_7c0,auVar22);
      fVar167 = auVar141._0_4_;
      fVar278 = auVar141._4_4_;
      auVar57._4_4_ = fVar278 * auVar24._4_4_;
      auVar57._0_4_ = fVar167 * auVar24._0_4_;
      fVar212 = auVar141._8_4_;
      auVar57._8_4_ = fVar212 * auVar24._8_4_;
      fVar261 = auVar141._12_4_;
      auVar57._12_4_ = fVar261 * auVar24._12_4_;
      fVar263 = auVar141._16_4_;
      auVar57._16_4_ = fVar263 * auVar24._16_4_;
      fVar271 = auVar141._20_4_;
      auVar57._20_4_ = fVar271 * auVar24._20_4_;
      fVar273 = auVar141._24_4_;
      auVar57._24_4_ = fVar273 * auVar24._24_4_;
      auVar57._28_4_ = auVar24._28_4_;
      auVar58._4_4_ = auVar22._4_4_ * fVar255;
      auVar58._0_4_ = auVar22._0_4_ * fVar237;
      auVar58._8_4_ = auVar22._8_4_ * fVar260;
      auVar58._12_4_ = auVar22._12_4_ * fVar242;
      auVar58._16_4_ = auVar22._16_4_ * fVar192;
      auVar58._20_4_ = auVar22._20_4_ * fVar213;
      auVar58._24_4_ = auVar22._24_4_ * fVar164;
      auVar58._28_4_ = 0;
      auVar141 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = auVar23._4_4_ * fVar278;
      auVar59._0_4_ = auVar23._0_4_ * fVar167;
      auVar59._8_4_ = auVar23._8_4_ * fVar212;
      auVar59._12_4_ = auVar23._12_4_ * fVar261;
      auVar59._16_4_ = auVar23._16_4_ * fVar263;
      auVar59._20_4_ = auVar23._20_4_ * fVar271;
      auVar59._24_4_ = auVar23._24_4_ * fVar273;
      auVar59._28_4_ = auVar24._28_4_;
      auVar60._4_4_ = auVar22._4_4_ * fVar135;
      auVar60._0_4_ = auVar22._0_4_ * fVar244;
      auVar60._8_4_ = auVar22._8_4_ * fVar136;
      auVar60._12_4_ = auVar22._12_4_ * fVar155;
      auVar60._16_4_ = auVar22._16_4_ * fVar156;
      auVar60._20_4_ = auVar22._20_4_ * fVar158;
      auVar60._24_4_ = auVar22._24_4_ * fVar159;
      auVar60._28_4_ = auVar22._28_4_;
      auVar22 = vsubps_avx(auVar60,auVar59);
      auVar207._0_4_ = auVar20._0_4_ * 0.0 + auVar22._0_4_ + auVar141._0_4_ * 0.0;
      auVar207._4_4_ = auVar20._4_4_ * 0.0 + auVar22._4_4_ + auVar141._4_4_ * 0.0;
      auVar207._8_4_ = auVar20._8_4_ * 0.0 + auVar22._8_4_ + auVar141._8_4_ * 0.0;
      auVar207._12_4_ = auVar20._12_4_ * 0.0 + auVar22._12_4_ + auVar141._12_4_ * 0.0;
      auVar207._16_4_ = auVar20._16_4_ * 0.0 + auVar22._16_4_ + auVar141._16_4_ * 0.0;
      auVar207._20_4_ = auVar20._20_4_ * 0.0 + auVar22._20_4_ + auVar141._20_4_ * 0.0;
      auVar207._24_4_ = auVar20._24_4_ * 0.0 + auVar22._24_4_ + auVar141._24_4_ * 0.0;
      auVar207._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar141._28_4_;
      auVar208 = ZEXT3264(auVar207);
      auVar20 = vmaxps_avx(auVar229,auVar207);
      auVar20 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,2);
      auVar201 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
      auVar362 = vpand_avx(auVar362,auVar201);
      auVar201 = vpmovsxwd_avx(auVar362);
      auVar221 = vpunpckhwd_avx(auVar362,auVar362);
      auVar146._16_16_ = auVar221;
      auVar146._0_16_ = auVar201;
      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar146 >> 0x7f,0) == '\0') &&
            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar221 >> 0x3f,0) == '\0') &&
          (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar221[0xf]
         ) {
LAB_009b6b78:
        auVar183 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        auVar300 = ZEXT3264(auVar140);
        auVar314 = ZEXT3264(auVar310);
      }
      else {
        auVar61._4_4_ = fVar255 * fVar240;
        auVar61._0_4_ = fVar237 * fVar277;
        auVar61._8_4_ = fVar260 * fVar256;
        auVar61._12_4_ = fVar242 * fVar239;
        auVar61._16_4_ = fVar192 * fVar191;
        auVar61._20_4_ = fVar213 * fVar305;
        auVar61._24_4_ = fVar164 * fVar137;
        auVar61._28_4_ = auVar221._12_4_;
        auVar332._0_4_ = fVar244 * fVar161;
        auVar332._4_4_ = fVar135 * fVar162;
        auVar332._8_4_ = fVar136 * fVar194;
        auVar332._12_4_ = fVar155 * fVar195;
        auVar332._16_4_ = fVar156 * fVar209;
        auVar332._20_4_ = fVar158 * fVar210;
        auVar332._24_4_ = fVar159 * fVar211;
        auVar332._28_4_ = 0;
        auVar22 = vsubps_avx(auVar332,auVar61);
        auVar62._4_4_ = fVar278 * fVar162;
        auVar62._0_4_ = fVar167 * fVar161;
        auVar62._8_4_ = fVar212 * fVar194;
        auVar62._12_4_ = fVar261 * fVar195;
        auVar62._16_4_ = fVar263 * fVar209;
        auVar62._20_4_ = fVar271 * fVar210;
        auVar62._24_4_ = fVar273 * fVar211;
        auVar62._28_4_ = auVar27._28_4_;
        auVar63._4_4_ = fVar255 * fVar248;
        auVar63._0_4_ = fVar237 * fVar235;
        auVar63._8_4_ = fVar260 * fVar259;
        auVar63._12_4_ = fVar242 * fVar302;
        auVar63._16_4_ = fVar192 * fVar245;
        auVar63._20_4_ = fVar213 * fVar193;
        auVar63._24_4_ = fVar164 * fVar163;
        auVar63._28_4_ = auVar21._28_4_;
        auVar23 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = fVar135 * fVar248;
        auVar64._0_4_ = fVar244 * fVar235;
        auVar64._8_4_ = fVar136 * fVar259;
        auVar64._12_4_ = fVar155 * fVar302;
        auVar64._16_4_ = fVar156 * fVar245;
        auVar64._20_4_ = fVar158 * fVar193;
        auVar64._24_4_ = fVar159 * fVar163;
        auVar64._28_4_ = auVar25._28_4_;
        auVar65._4_4_ = fVar278 * fVar240;
        auVar65._0_4_ = fVar167 * fVar277;
        auVar65._8_4_ = fVar212 * fVar256;
        auVar65._12_4_ = fVar261 * fVar239;
        auVar65._16_4_ = fVar263 * fVar191;
        auVar65._20_4_ = fVar271 * fVar305;
        auVar65._24_4_ = fVar273 * fVar137;
        auVar65._28_4_ = auVar26._28_4_;
        auVar24 = vsubps_avx(auVar65,auVar64);
        auVar289._0_4_ = auVar22._0_4_ * 0.0 + auVar24._0_4_ + auVar23._0_4_ * 0.0;
        auVar289._4_4_ = auVar22._4_4_ * 0.0 + auVar24._4_4_ + auVar23._4_4_ * 0.0;
        auVar289._8_4_ = auVar22._8_4_ * 0.0 + auVar24._8_4_ + auVar23._8_4_ * 0.0;
        auVar289._12_4_ = auVar22._12_4_ * 0.0 + auVar24._12_4_ + auVar23._12_4_ * 0.0;
        auVar289._16_4_ = auVar22._16_4_ * 0.0 + auVar24._16_4_ + auVar23._16_4_ * 0.0;
        auVar289._20_4_ = auVar22._20_4_ * 0.0 + auVar24._20_4_ + auVar23._20_4_ * 0.0;
        auVar289._24_4_ = auVar22._24_4_ * 0.0 + auVar24._24_4_ + auVar23._24_4_ * 0.0;
        auVar289._28_4_ = auVar26._28_4_ + auVar24._28_4_ + auVar25._28_4_;
        auVar20 = vrcpps_avx(auVar289);
        fVar235 = auVar20._0_4_;
        fVar237 = auVar20._4_4_;
        auVar66._4_4_ = auVar289._4_4_ * fVar237;
        auVar66._0_4_ = auVar289._0_4_ * fVar235;
        fVar240 = auVar20._8_4_;
        auVar66._8_4_ = auVar289._8_4_ * fVar240;
        fVar248 = auVar20._12_4_;
        auVar66._12_4_ = auVar289._12_4_ * fVar248;
        fVar255 = auVar20._16_4_;
        auVar66._16_4_ = auVar289._16_4_ * fVar255;
        fVar256 = auVar20._20_4_;
        auVar66._20_4_ = auVar289._20_4_ * fVar256;
        fVar259 = auVar20._24_4_;
        auVar66._24_4_ = auVar289._24_4_ * fVar259;
        auVar66._28_4_ = auVar21._28_4_;
        auVar333._8_4_ = 0x3f800000;
        auVar333._0_8_ = 0x3f8000003f800000;
        auVar333._12_4_ = 0x3f800000;
        auVar333._16_4_ = 0x3f800000;
        auVar333._20_4_ = 0x3f800000;
        auVar333._24_4_ = 0x3f800000;
        auVar333._28_4_ = 0x3f800000;
        auVar20 = vsubps_avx(auVar333,auVar66);
        fVar235 = auVar20._0_4_ * fVar235 + fVar235;
        fVar237 = auVar20._4_4_ * fVar237 + fVar237;
        fVar240 = auVar20._8_4_ * fVar240 + fVar240;
        fVar248 = auVar20._12_4_ * fVar248 + fVar248;
        fVar255 = auVar20._16_4_ * fVar255 + fVar255;
        fVar256 = auVar20._20_4_ * fVar256 + fVar256;
        fVar259 = auVar20._24_4_ * fVar259 + fVar259;
        auVar180._0_4_ =
             (auVar22._0_4_ * fVar233 + auVar23._0_4_ * fVar222 + auVar24._0_4_ * fVar165) * fVar235
        ;
        auVar180._4_4_ =
             (auVar22._4_4_ * fVar246 + auVar23._4_4_ * fVar243 + auVar24._4_4_ * fVar166) * fVar237
        ;
        auVar180._8_4_ =
             (auVar22._8_4_ * fVar258 + auVar23._8_4_ * fVar257 + auVar24._8_4_ * fVar223) * fVar240
        ;
        auVar180._12_4_ =
             (auVar22._12_4_ * fVar301 + auVar23._12_4_ * fVar190 + auVar24._12_4_ * fVar234) *
             fVar248;
        auVar180._16_4_ =
             (auVar22._16_4_ * fVar304 + auVar23._16_4_ * fVar303 + auVar24._16_4_ * fVar236) *
             fVar255;
        auVar180._20_4_ =
             (auVar22._20_4_ * fVar247 + auVar23._20_4_ * fVar306 + auVar24._20_4_ * fVar238) *
             fVar256;
        auVar180._24_4_ =
             (auVar22._24_4_ * fVar160 + auVar23._24_4_ * fVar157 + auVar24._24_4_ * fVar241) *
             fVar259;
        auVar180._28_4_ = 0;
        auVar147._16_16_ = auVar8;
        auVar147._0_16_ = auVar8;
        auVar20 = vcmpps_avx(auVar147,auVar180,2);
        fVar277 = ray->tfar;
        auVar230._4_4_ = fVar277;
        auVar230._0_4_ = fVar277;
        auVar230._8_4_ = fVar277;
        auVar230._12_4_ = fVar277;
        auVar230._16_4_ = fVar277;
        auVar230._20_4_ = fVar277;
        auVar230._24_4_ = fVar277;
        auVar230._28_4_ = fVar277;
        auVar21 = vcmpps_avx(auVar180,auVar230,2);
        auVar20 = vandps_avx(auVar21,auVar20);
        auVar201 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar362 = vpand_avx(auVar362,auVar201);
        auVar201 = vpmovsxwd_avx(auVar362);
        auVar221 = vpshufd_avx(auVar362,0xee);
        auVar221 = vpmovsxwd_avx(auVar221);
        auVar148._16_16_ = auVar221;
        auVar148._0_16_ = auVar201;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar148 >> 0x7f,0) == '\0') &&
              (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar221 >> 0x3f,0) == '\0') &&
            (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar221[0xf]) goto LAB_009b6b78;
        auVar20 = vcmpps_avx(ZEXT832(0) << 0x20,auVar289,4);
        auVar201 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar362 = vpand_avx(auVar362,auVar201);
        auVar201 = vpmovsxwd_avx(auVar362);
        auVar362 = vpunpckhwd_avx(auVar362,auVar362);
        auVar253._16_16_ = auVar362;
        auVar253._0_16_ = auVar201;
        auVar183 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        auVar300 = ZEXT3264(auVar140);
        auVar314 = ZEXT3264(auVar310);
        if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar253 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar253 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar253 >> 0x7f,0) != '\0') ||
              (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar362 >> 0x3f,0) != '\0') ||
            (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar362[0xf] < '\0') {
          auVar149._0_4_ = auVar229._0_4_ * fVar235;
          auVar149._4_4_ = auVar229._4_4_ * fVar237;
          auVar149._8_4_ = auVar229._8_4_ * fVar240;
          auVar149._12_4_ = auVar229._12_4_ * fVar248;
          auVar149._16_4_ = auVar229._16_4_ * fVar255;
          auVar149._20_4_ = auVar229._20_4_ * fVar256;
          auVar149._24_4_ = auVar229._24_4_ * fVar259;
          auVar149._28_4_ = 0;
          auVar67._4_4_ = auVar207._4_4_ * fVar237;
          auVar67._0_4_ = auVar207._0_4_ * fVar235;
          auVar67._8_4_ = auVar207._8_4_ * fVar240;
          auVar67._12_4_ = auVar207._12_4_ * fVar248;
          auVar67._16_4_ = auVar207._16_4_ * fVar255;
          auVar67._20_4_ = auVar207._20_4_ * fVar256;
          auVar67._24_4_ = auVar207._24_4_ * fVar259;
          auVar67._28_4_ = auVar207._28_4_;
          auVar208 = ZEXT3264(auVar67);
          auVar268._8_4_ = 0x3f800000;
          auVar268._0_8_ = 0x3f8000003f800000;
          auVar268._12_4_ = 0x3f800000;
          auVar268._16_4_ = 0x3f800000;
          auVar268._20_4_ = 0x3f800000;
          auVar268._24_4_ = 0x3f800000;
          auVar268._28_4_ = 0x3f800000;
          auVar140 = vsubps_avx(auVar268,auVar149);
          auVar140 = vblendvps_avx(auVar140,auVar149,auVar19);
          auVar300 = ZEXT3264(auVar140);
          auVar140 = vsubps_avx(auVar268,auVar67);
          _local_3e0 = vblendvps_avx(auVar140,auVar67,auVar19);
          auVar183 = ZEXT3264(auVar253);
          auVar314 = ZEXT3264(auVar180);
        }
      }
      auVar347 = ZEXT3264(_local_600);
      auVar325 = ZEXT3264(local_6e0);
      auVar140 = auVar183._0_32_;
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0x7f,0) == '\0') &&
            (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar140 >> 0xbf,0) == '\0') &&
          (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar183[0x1f]) {
        uVar130 = 0;
        _local_7d0 = auVar10;
        _local_760 = auVar8;
LAB_009b589b:
        fVar169 = (float)local_660._0_4_;
        fVar185 = (float)local_660._4_4_;
        fVar187 = fStack_658;
        fVar189 = fStack_654;
        fVar274 = fStack_650;
        fVar275 = fStack_64c;
        fVar276 = fStack_648;
        auVar10 = _local_7d0;
        auVar8 = _local_760;
      }
      else {
        auVar310 = vsubps_avx(local_6c0,local_780);
        fVar222 = (float)local_780._0_4_ + auVar300._0_4_ * auVar310._0_4_;
        fVar233 = local_780._4_4_ + auVar300._4_4_ * auVar310._4_4_;
        fVar235 = local_780._8_4_ + auVar300._8_4_ * auVar310._8_4_;
        fVar237 = local_780._12_4_ + auVar300._12_4_ * auVar310._12_4_;
        fVar240 = local_780._16_4_ + auVar300._16_4_ * auVar310._16_4_;
        fVar243 = local_780._20_4_ + auVar300._20_4_ * auVar310._20_4_;
        fVar246 = local_780._24_4_ + auVar300._24_4_ * auVar310._24_4_;
        fVar248 = auVar310._28_4_ + 0.0;
        fVar277 = local_7e8->depth_scale;
        auVar68._4_4_ = (fVar233 + fVar233) * fVar277;
        auVar68._0_4_ = (fVar222 + fVar222) * fVar277;
        auVar68._8_4_ = (fVar235 + fVar235) * fVar277;
        auVar68._12_4_ = (fVar237 + fVar237) * fVar277;
        auVar68._16_4_ = (fVar240 + fVar240) * fVar277;
        auVar68._20_4_ = (fVar243 + fVar243) * fVar277;
        auVar68._24_4_ = (fVar246 + fVar246) * fVar277;
        auVar68._28_4_ = fVar248 + fVar248;
        local_2a0 = auVar314._0_32_;
        auVar310 = vcmpps_avx(local_2a0,auVar68,6);
        auVar20 = auVar140 & auVar310;
        if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar20 >> 0x7f,0) == '\0') &&
              (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar20 >> 0xbf,0) == '\0') &&
            (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar20[0x1f]) {
          uVar130 = 0;
          _local_540 = auVar9;
          _local_530 = auVar11;
        }
        else {
          local_220 = vandps_avx(auVar310,auVar140);
          local_2c0._0_4_ = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
          local_2c0._4_4_ = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
          fStack_2b8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
          fStack_2b4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
          fStack_2b0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
          fStack_2ac = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
          fStack_2a8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
          fStack_2a4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
          local_2e0 = auVar300._0_32_;
          local_280 = 0;
          local_27c = uVar124;
          local_270 = local_7d0;
          uStack_268 = local_7d0._8_8_;
          local_260 = local_530;
          uStack_258 = uStack_528;
          local_250 = local_540;
          uStack_248 = uStack_538;
          auVar208 = ZEXT1664(_local_550);
          local_240 = _local_550;
          local_3e0._4_4_ = local_2c0._4_4_;
          local_3e0._0_4_ = local_2c0._0_4_;
          uStack_3d8._0_4_ = fStack_2b8;
          uStack_3d8._4_4_ = fStack_2b4;
          uStack_3d0._0_4_ = fStack_2b0;
          uStack_3d0._4_4_ = fStack_2ac;
          auVar174 = _local_3e0;
          uStack_3c8._0_4_ = fStack_2a8;
          uStack_3c8._4_4_ = fStack_2a4;
          auVar140 = _local_3e0;
          _local_540 = auVar9;
          _local_530 = auVar11;
          if ((pGVar17->mask & ray->mask) != 0) {
            pGVar127 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device == (Device *)0x0) &&
               (uVar130 = CONCAT71((int7)((ulong)pGVar17 >> 8),1), pGVar127 = pGVar17,
               pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_009b5cd8;
            auVar198._0_4_ = 1.0 / auVar250._0_4_;
            auVar198._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar362 = vshufps_avx(auVar198,auVar198,0);
            auVar208 = ZEXT3264(CONCAT1616(auVar362,auVar362));
            local_200[0] = auVar362._0_4_ * (auVar300._0_4_ + 0.0);
            local_200[1] = auVar362._4_4_ * (auVar300._4_4_ + 1.0);
            local_200[2] = auVar362._8_4_ * (auVar300._8_4_ + 2.0);
            local_200[3] = auVar362._12_4_ * (auVar300._12_4_ + 3.0);
            fStack_1f0 = auVar362._0_4_ * (auVar300._16_4_ + 4.0);
            fStack_1ec = auVar362._4_4_ * (auVar300._20_4_ + 5.0);
            fStack_1e8 = auVar362._8_4_ * (auVar300._24_4_ + 6.0);
            fStack_1e4 = auVar300._28_4_ + 7.0;
            uStack_3d0 = auVar174._16_8_;
            uStack_3c8 = auVar140._24_8_;
            local_1e0 = local_3e0;
            uStack_1d8 = uStack_3d8;
            uStack_1d0 = uStack_3d0;
            uStack_1c8 = uStack_3c8;
            local_1c0 = local_2a0;
            uVar134 = vmovmskps_avx(local_220);
            uVar130 = CONCAT44((int)((ulong)pGVar127 >> 0x20),uVar134);
            lVar129 = 0;
            if (uVar130 != 0) {
              for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
              }
            }
            local_700 = auVar300._0_32_;
            local_720 = local_2a0;
            fVar262 = (float)local_7d0._0_4_;
            fVar270 = (float)local_7d0._4_4_;
            fVar272 = (float)uStack_7c8;
            fVar277 = uStack_7c8._4_4_;
            _local_7d0 = auVar10;
            _local_3e0 = auVar140;
            while (auVar10 = _local_7d0, auVar8 = _local_760, uVar130 != 0) {
              local_780._0_8_ = uVar130;
              local_624 = local_200[lVar129];
              local_620 = *(undefined4 *)((long)&local_1e0 + lVar129 * 4);
              local_6c0._0_4_ = ray->tfar;
              local_7c0 = (undefined1  [8])lVar129;
              ray->tfar = *(float *)(local_1c0 + lVar129 * 4);
              local_690.context = context->user;
              fVar275 = 1.0 - local_624;
              fVar274 = local_624 * fVar275 * 4.0;
              auVar362 = ZEXT416((uint)(local_624 * local_624 * 0.5));
              auVar362 = vshufps_avx(auVar362,auVar362,0);
              auVar201 = ZEXT416((uint)((fVar275 * fVar275 + fVar274) * 0.5));
              auVar201 = vshufps_avx(auVar201,auVar201,0);
              auVar221 = ZEXT416((uint)((-local_624 * local_624 - fVar274) * 0.5));
              auVar221 = vshufps_avx(auVar221,auVar221,0);
              auVar215 = ZEXT416((uint)(fVar275 * -fVar275 * 0.5));
              auVar215 = vshufps_avx(auVar215,auVar215,0);
              auVar199._0_4_ =
                   fVar262 * auVar215._0_4_ +
                   auVar221._0_4_ * (float)local_530._0_4_ +
                   auVar362._0_4_ * (float)local_550._0_4_ + auVar201._0_4_ * (float)local_540._0_4_
              ;
              auVar199._4_4_ =
                   fVar270 * auVar215._4_4_ +
                   auVar221._4_4_ * (float)local_530._4_4_ +
                   auVar362._4_4_ * (float)local_550._4_4_ + auVar201._4_4_ * (float)local_540._4_4_
              ;
              auVar199._8_4_ =
                   fVar272 * auVar215._8_4_ +
                   auVar221._8_4_ * (float)uStack_528 +
                   auVar362._8_4_ * fStack_548 + auVar201._8_4_ * (float)uStack_538;
              auVar199._12_4_ =
                   fVar277 * auVar215._12_4_ +
                   auVar221._12_4_ * uStack_528._4_4_ +
                   auVar362._12_4_ * fStack_544 + auVar201._12_4_ * uStack_538._4_4_;
              auVar208 = ZEXT1664(auVar199);
              local_630 = vmovlps_avx(auVar199);
              local_628 = vextractps_avx(auVar199,2);
              local_61c = local_7d4;
              local_618 = (int)local_728;
              local_614 = (local_690.context)->instID[0];
              local_610 = (local_690.context)->instPrimID[0];
              local_804 = -1;
              local_690.valid = &local_804;
              local_690.geometryUserPtr = *(void **)(local_4c0._0_8_ + 0x18);
              local_690.ray = (RTCRayN *)ray;
              local_690.hit = (RTCHitN *)&local_630;
              local_690.N = 1;
              if (*(code **)(local_4c0._0_8_ + 0x48) == (code *)0x0) {
LAB_009b5bfc:
                pRVar128 = context->args;
                pRVar131 = pRVar128;
                if ((pRVar128->filter != (RTCFilterFunctionN)0x0) &&
                   (((pRVar128->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (pRVar131 = (RTCIntersectArguments *)local_4c0._0_8_,
                    ((ulong)((RTCIntersectArguments *)(local_4c0._0_8_ + 0x20))->intersect &
                    0x40000000000000) != 0)))) {
                  auVar208 = ZEXT1664(auVar208._0_16_);
                  (*pRVar128->filter)(&local_690);
                  if (*local_690.valid == 0) goto LAB_009b5c47;
                }
                uVar130 = CONCAT71((int7)((ulong)pRVar131 >> 8),1);
                auVar300 = ZEXT3264(local_700);
                auVar314 = ZEXT3264(local_720);
                auVar325 = ZEXT3264(local_6e0);
                auVar347 = ZEXT3264(_local_600);
                fVar168 = (float)local_7a0._0_4_;
                fVar184 = (float)local_7a0._4_4_;
                fVar186 = fStack_798;
                fVar188 = fStack_794;
                fVar262 = fStack_790;
                fVar270 = fStack_78c;
                fVar272 = fStack_788;
                goto LAB_009b589b;
              }
              auVar208 = ZEXT1664(auVar199);
              (**(code **)(local_4c0._0_8_ + 0x48))(&local_690);
              if (*local_690.valid != 0) goto LAB_009b5bfc;
LAB_009b5c47:
              ray->tfar = (float)local_6c0._0_4_;
              uVar130 = local_780._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
              lVar129 = 0;
              if (uVar130 != 0) {
                for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
                }
              }
              auVar300 = ZEXT3264(local_700);
              auVar314 = ZEXT3264(local_720);
              auVar325 = ZEXT3264(local_6e0);
              auVar347 = ZEXT3264(_local_600);
              fVar169 = (float)local_660._0_4_;
              fVar185 = (float)local_660._4_4_;
              fVar187 = fStack_658;
              fVar189 = fStack_654;
              fVar274 = fStack_650;
              fVar275 = fStack_64c;
              fVar276 = fStack_648;
              fVar262 = (float)local_7d0._0_4_;
              fVar270 = (float)local_7d0._4_4_;
              fVar272 = (float)uStack_7c8;
              fVar277 = uStack_7c8._4_4_;
            }
          }
          _local_760 = auVar8;
          _local_7d0 = auVar10;
          uVar130 = 0;
          fVar168 = (float)local_7a0._0_4_;
          fVar184 = (float)local_7a0._4_4_;
          fVar186 = fStack_798;
          fVar188 = fStack_794;
          fVar262 = fStack_790;
          fVar270 = fStack_78c;
          fVar272 = fStack_788;
          auVar10 = _local_7d0;
          auVar8 = _local_760;
        }
      }
    }
LAB_009b5cd8:
    _local_760 = auVar8;
    _local_7d0 = auVar10;
    auVar183 = ZEXT1664(local_800);
    auVar290 = ZEXT3264(_local_580);
    if (8 < (int)uVar124) {
      auVar362 = vpshufd_avx(ZEXT416(uVar124),0);
      local_3a0 = auVar362._0_4_;
      fStack_39c = auVar362._4_4_;
      fStack_398 = auVar362._8_4_;
      fStack_394 = auVar362._12_4_;
      auVar362 = vshufps_avx(local_800,local_800,0);
      local_4c0._16_16_ = auVar362;
      local_4c0._0_16_ = auVar362;
      local_100 = local_760;
      uStack_f8 = uStack_758;
      uStack_f0 = local_760;
      uStack_e8 = uStack_758;
      auVar139._0_4_ = 1.0 / local_4a0;
      auVar139._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar362 = vshufps_avx(auVar139,auVar139,0);
      register0x00001210 = auVar362;
      _local_120 = auVar362;
      auVar154 = ZEXT3264(_local_120);
      local_700 = auVar300._0_32_;
      local_720 = auVar314._0_32_;
      for (lVar129 = 8; lVar129 < local_7f0; lVar129 = lVar129 + 8) {
        uVar134 = (undefined4)uVar130;
        local_780._0_4_ = uVar134;
        pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar129 * 4 + lVar126);
        fVar277 = *(float *)*pauVar1;
        fVar222 = *(float *)(*pauVar1 + 4);
        fVar233 = *(float *)(*pauVar1 + 8);
        fVar235 = *(float *)(*pauVar1 + 0xc);
        fVar237 = *(float *)(*pauVar1 + 0x10);
        fVar240 = *(float *)(*pauVar1 + 0x14);
        fVar243 = *(float *)(*pauVar1 + 0x18);
        auVar123 = *pauVar1;
        pauVar2 = (undefined1 (*) [28])(lVar126 + 0x21fffac + lVar129 * 4);
        fVar246 = *(float *)*pauVar2;
        fVar248 = *(float *)(*pauVar2 + 4);
        fVar255 = *(float *)(*pauVar2 + 8);
        fVar256 = *(float *)(*pauVar2 + 0xc);
        fVar257 = *(float *)(*pauVar2 + 0x10);
        fVar258 = *(float *)(*pauVar2 + 0x14);
        fVar259 = *(float *)(*pauVar2 + 0x18);
        auVar122 = *pauVar2;
        pfVar3 = (float *)(lVar126 + 0x2200430 + lVar129 * 4);
        fVar239 = *pfVar3;
        fVar190 = pfVar3[1];
        fVar301 = pfVar3[2];
        fVar302 = pfVar3[3];
        fVar242 = pfVar3[4];
        fVar191 = pfVar3[5];
        fVar303 = pfVar3[6];
        pfVar3 = (float *)(lVar126 + 0x22008b4 + lVar129 * 4);
        fVar304 = *pfVar3;
        fVar245 = pfVar3[1];
        fVar192 = pfVar3[2];
        fVar305 = pfVar3[3];
        fVar306 = pfVar3[4];
        fVar247 = pfVar3[5];
        fVar193 = pfVar3[6];
        fVar260 = pfVar3[7];
        fVar238 = auVar325._0_4_;
        fVar241 = auVar325._4_4_;
        fVar244 = auVar325._8_4_;
        fVar135 = auVar325._12_4_;
        fVar136 = auVar325._16_4_;
        fVar155 = auVar325._20_4_;
        fVar156 = auVar325._24_4_;
        fVar213 = fVar260 + auVar208._28_4_;
        fStack_744 = fVar260 + fVar260 + auVar154._28_4_;
        fVar158 = auVar347._0_4_;
        fVar159 = auVar347._4_4_;
        fVar161 = auVar347._8_4_;
        fVar162 = auVar347._12_4_;
        fVar194 = auVar347._16_4_;
        fVar195 = auVar347._20_4_;
        fVar209 = auVar347._24_4_;
        local_360._0_4_ =
             fVar277 * (float)local_320._0_4_ +
             fVar246 * (float)local_340._0_4_ + fVar239 * fVar168 + (float)local_440._0_4_ * fVar304
        ;
        local_360._4_4_ =
             fVar222 * (float)local_320._4_4_ +
             fVar248 * (float)local_340._4_4_ + fVar190 * fVar184 + (float)local_440._4_4_ * fVar245
        ;
        local_360._8_4_ =
             fVar233 * fStack_318 + fVar255 * fStack_338 + fVar301 * fVar186 + fStack_438 * fVar192;
        local_360._12_4_ =
             fVar235 * fStack_314 + fVar256 * fStack_334 + fVar302 * fVar188 + fStack_434 * fVar305;
        local_360._16_4_ =
             fVar237 * fStack_310 + fVar257 * fStack_330 + fVar242 * fVar262 + fStack_430 * fVar306;
        local_360._20_4_ =
             fVar240 * fStack_30c + fVar258 * fStack_32c + fVar191 * fVar270 + fStack_42c * fVar247;
        local_360._24_4_ =
             fVar243 * fStack_308 + fVar259 * fStack_328 + fVar303 * fVar272 + fStack_428 * fVar193;
        local_360._28_4_ = fVar213 + fStack_744;
        local_5a0._0_4_ =
             fVar158 * fVar246 + fVar238 * fVar239 + auVar290._0_4_ * fVar304 + fVar277 * fVar169;
        local_5a0._4_4_ =
             fVar159 * fVar248 + fVar241 * fVar190 + auVar290._4_4_ * fVar245 + fVar222 * fVar185;
        local_5a0._8_4_ =
             fVar161 * fVar255 + fVar244 * fVar301 + auVar290._8_4_ * fVar192 + fVar233 * fVar187;
        local_5a0._12_4_ =
             fVar162 * fVar256 + fVar135 * fVar302 + auVar290._12_4_ * fVar305 + fVar235 * fVar189;
        local_5a0._16_4_ =
             fVar194 * fVar257 + fVar136 * fVar242 + auVar290._16_4_ * fVar306 + fVar237 * fVar274;
        local_5a0._20_4_ =
             fVar195 * fVar258 + fVar155 * fVar191 + auVar290._20_4_ * fVar247 + fVar240 * fVar275;
        local_5a0._24_4_ =
             fVar209 * fVar259 + fVar156 * fVar303 + auVar290._24_4_ * fVar193 + fVar243 * fVar276;
        local_5a0._28_4_ = fVar260 + fVar260 + auVar183._28_4_ + fStack_744;
        local_760._0_4_ =
             fVar277 * (float)local_140._0_4_ +
             (float)local_e0._0_4_ * fVar246 +
             (float)local_a0._0_4_ * fVar239 + (float)local_c0._0_4_ * fVar304;
        local_760._4_4_ =
             fVar222 * (float)local_140._4_4_ +
             (float)local_e0._4_4_ * fVar248 +
             (float)local_a0._4_4_ * fVar190 + (float)local_c0._4_4_ * fVar245;
        uStack_758._0_4_ =
             fVar233 * fStack_138 + fStack_d8 * fVar255 + fStack_98 * fVar301 + fStack_b8 * fVar192;
        uStack_758._4_4_ =
             fVar235 * fStack_134 + fStack_d4 * fVar256 + fStack_94 * fVar302 + fStack_b4 * fVar305;
        fStack_750 = fVar237 * fStack_130 +
                     fStack_d0 * fVar257 + fStack_90 * fVar242 + fStack_b0 * fVar306;
        fStack_74c = fVar240 * fStack_12c +
                     fStack_cc * fVar258 + fStack_8c * fVar191 + fStack_ac * fVar247;
        fStack_748 = fVar243 * fStack_128 +
                     fStack_c8 * fVar259 + fStack_88 * fVar303 + fStack_a8 * fVar193;
        fStack_744 = fStack_744 + fVar260 + fVar213;
        auVar174 = *(undefined1 (*) [24])(bspline_basis1 + lVar129 * 4 + lVar126);
        uVar113 = *(undefined8 *)((undefined1 (*) [24])(bspline_basis1 + lVar129 * 4 + lVar126))[1];
        pfVar3 = (float *)(lVar126 + 0x22023cc + lVar129 * 4);
        fVar213 = *pfVar3;
        fVar137 = pfVar3[1];
        fVar157 = pfVar3[2];
        fVar160 = pfVar3[3];
        fVar163 = pfVar3[4];
        fVar164 = pfVar3[5];
        fVar165 = pfVar3[6];
        auVar140 = *(undefined1 (*) [32])(lVar126 + 0x2202850 + lVar129 * 4);
        auVar183 = ZEXT3264(auVar140);
        pfVar4 = (float *)(lVar126 + 0x2202cd4 + lVar129 * 4);
        fVar166 = *pfVar4;
        fVar223 = pfVar4[1];
        fVar234 = pfVar4[2];
        fVar236 = pfVar4[3];
        fStack_490 = pfVar4[4];
        fStack_48c = pfVar4[5];
        fStack_488 = pfVar4[6];
        fStack_484 = pfVar4[7];
        fVar222 = auVar140._0_4_;
        fVar233 = auVar140._4_4_;
        fVar235 = auVar140._8_4_;
        fVar237 = auVar140._12_4_;
        fVar243 = auVar140._16_4_;
        fVar255 = auVar140._20_4_;
        fVar258 = auVar140._24_4_;
        fVar277 = auVar290._28_4_;
        fVar240 = fVar277 + fStack_424 + fVar277;
        local_7c0._0_4_ = auVar174._0_4_;
        local_7c0._4_4_ = auVar174._4_4_;
        fStack_7b8 = auVar174._8_4_;
        fStack_7b4 = auVar174._12_4_;
        fStack_7b0 = auVar174._16_4_;
        fStack_7ac = auVar174._20_4_;
        fStack_7a8 = (float)uVar113;
        fStack_7a4 = (float)((ulong)uVar113 >> 0x20);
        local_380._0_4_ =
             (float)local_320._0_4_ * (float)local_7c0._0_4_ +
             (float)local_340._0_4_ * fVar213 + (float)local_440._0_4_ * fVar166 + fVar168 * fVar222
        ;
        local_380._4_4_ =
             (float)local_320._4_4_ * (float)local_7c0._4_4_ +
             (float)local_340._4_4_ * fVar137 + (float)local_440._4_4_ * fVar223 + fVar184 * fVar233
        ;
        local_380._8_4_ =
             fStack_318 * fStack_7b8 +
             fStack_338 * fVar157 + fStack_438 * fVar234 + fVar186 * fVar235;
        local_380._12_4_ =
             fStack_314 * fStack_7b4 +
             fStack_334 * fVar160 + fStack_434 * fVar236 + fVar188 * fVar237;
        local_380._16_4_ =
             fStack_310 * fStack_7b0 +
             fStack_330 * fVar163 + fStack_430 * fStack_490 + fVar262 * fVar243;
        local_380._20_4_ =
             fStack_30c * fStack_7ac +
             fStack_32c * fVar164 + fStack_42c * fStack_48c + fVar270 * fVar255;
        local_380._24_4_ =
             fStack_308 * fStack_7a8 +
             fStack_328 * fVar165 + fStack_428 * fStack_488 + fVar272 * fVar258;
        local_380._28_4_ = fVar277 + fStack_a4 + fVar240;
        local_460._0_4_ =
             (float)local_7c0._0_4_ * fVar169 +
             fVar166 * auVar290._0_4_ + fVar238 * fVar222 + fVar158 * fVar213;
        local_460._4_4_ =
             (float)local_7c0._4_4_ * fVar185 +
             fVar223 * auVar290._4_4_ + fVar241 * fVar233 + fVar159 * fVar137;
        fStack_458 = fStack_7b8 * fVar187 +
                     fVar234 * auVar290._8_4_ + fVar244 * fVar235 + fVar161 * fVar157;
        fStack_454 = fStack_7b4 * fVar189 +
                     fVar236 * auVar290._12_4_ + fVar135 * fVar237 + fVar162 * fVar160;
        fStack_450 = fStack_7b0 * fVar274 +
                     fStack_490 * auVar290._16_4_ + fVar136 * fVar243 + fVar194 * fVar163;
        fStack_44c = fStack_7ac * fVar275 +
                     fStack_48c * auVar290._20_4_ + fVar155 * fVar255 + fVar195 * fVar164;
        fStack_448 = fStack_7a8 * fVar276 +
                     fStack_488 * auVar290._24_4_ + fVar156 * fVar258 + fVar209 * fVar165;
        fStack_444 = fVar240 + *(float *)pauVar1[1] + fVar277 + fVar277;
        local_6c0._0_4_ =
             (float)local_e0._0_4_ * fVar213 +
             (float)local_a0._0_4_ * fVar222 + fVar166 * (float)local_c0._0_4_ +
             (float)local_7c0._0_4_ * (float)local_140._0_4_;
        local_6c0._4_4_ =
             (float)local_e0._4_4_ * fVar137 +
             (float)local_a0._4_4_ * fVar233 + fVar223 * (float)local_c0._4_4_ +
             (float)local_7c0._4_4_ * (float)local_140._4_4_;
        local_6c0._8_4_ =
             fStack_d8 * fVar157 + fStack_98 * fVar235 + fVar234 * fStack_b8 +
             fStack_7b8 * fStack_138;
        local_6c0._12_4_ =
             fStack_d4 * fVar160 + fStack_94 * fVar237 + fVar236 * fStack_b4 +
             fStack_7b4 * fStack_134;
        local_6c0._16_4_ =
             fStack_d0 * fVar163 + fStack_90 * fVar243 + fStack_490 * fStack_b0 +
             fStack_7b0 * fStack_130;
        local_6c0._20_4_ =
             fStack_cc * fVar164 + fStack_8c * fVar255 + fStack_48c * fStack_ac +
             fStack_7ac * fStack_12c;
        local_6c0._24_4_ =
             fStack_c8 * fVar165 + fStack_88 * fVar258 + fStack_488 * fStack_a8 +
             fStack_7a8 * fStack_128;
        local_6c0._28_4_ = fVar277 + fVar277 + fStack_a4 + fVar240;
        auVar20 = vsubps_avx(local_380,local_360);
        auVar21 = vsubps_avx(_local_460,local_5a0);
        fVar262 = auVar20._0_4_;
        fVar272 = auVar20._4_4_;
        auVar69._4_4_ = local_5a0._4_4_ * fVar272;
        auVar69._0_4_ = (float)local_5a0._0_4_ * fVar262;
        fVar275 = auVar20._8_4_;
        auVar69._8_4_ = local_5a0._8_4_ * fVar275;
        fVar277 = auVar20._12_4_;
        auVar69._12_4_ = local_5a0._12_4_ * fVar277;
        fVar246 = auVar20._16_4_;
        auVar69._16_4_ = local_5a0._16_4_ * fVar246;
        fVar256 = auVar20._20_4_;
        auVar69._20_4_ = local_5a0._20_4_ * fVar256;
        fVar259 = auVar20._24_4_;
        auVar69._24_4_ = local_5a0._24_4_ * fVar259;
        auVar69._28_4_ = fVar240;
        fVar270 = auVar21._0_4_;
        fVar274 = auVar21._4_4_;
        auVar70._4_4_ = local_360._4_4_ * fVar274;
        auVar70._0_4_ = local_360._0_4_ * fVar270;
        fVar276 = auVar21._8_4_;
        auVar70._8_4_ = local_360._8_4_ * fVar276;
        fVar240 = auVar21._12_4_;
        auVar70._12_4_ = local_360._12_4_ * fVar240;
        fVar248 = auVar21._16_4_;
        auVar70._16_4_ = local_360._16_4_ * fVar248;
        fVar257 = auVar21._20_4_;
        auVar70._20_4_ = local_360._20_4_ * fVar257;
        fVar260 = auVar21._24_4_;
        auVar70._24_4_ = local_360._24_4_ * fVar260;
        auVar70._28_4_ = fStack_444;
        auVar22 = vsubps_avx(auVar69,auVar70);
        auVar154 = ZEXT3264(_local_760);
        auVar310 = vmaxps_avx(_local_760,local_6c0);
        auVar71._4_4_ = auVar310._4_4_ * auVar310._4_4_ * (fVar272 * fVar272 + fVar274 * fVar274);
        auVar71._0_4_ = auVar310._0_4_ * auVar310._0_4_ * (fVar262 * fVar262 + fVar270 * fVar270);
        auVar71._8_4_ = auVar310._8_4_ * auVar310._8_4_ * (fVar275 * fVar275 + fVar276 * fVar276);
        auVar71._12_4_ = auVar310._12_4_ * auVar310._12_4_ * (fVar277 * fVar277 + fVar240 * fVar240)
        ;
        auVar71._16_4_ = auVar310._16_4_ * auVar310._16_4_ * (fVar246 * fVar246 + fVar248 * fVar248)
        ;
        auVar71._20_4_ = auVar310._20_4_ * auVar310._20_4_ * (fVar256 * fVar256 + fVar257 * fVar257)
        ;
        auVar71._24_4_ = auVar310._24_4_ * auVar310._24_4_ * (fVar259 * fVar259 + fVar260 * fVar260)
        ;
        auVar71._28_4_ = local_380._28_4_ + fStack_444;
        auVar72._4_4_ = auVar22._4_4_ * auVar22._4_4_;
        auVar72._0_4_ = auVar22._0_4_ * auVar22._0_4_;
        auVar72._8_4_ = auVar22._8_4_ * auVar22._8_4_;
        auVar72._12_4_ = auVar22._12_4_ * auVar22._12_4_;
        auVar72._16_4_ = auVar22._16_4_ * auVar22._16_4_;
        auVar72._20_4_ = auVar22._20_4_ * auVar22._20_4_;
        auVar72._24_4_ = auVar22._24_4_ * auVar22._24_4_;
        auVar72._28_4_ = auVar22._28_4_;
        auVar310 = vcmpps_avx(auVar72,auVar71,2);
        local_800._0_8_ = lVar129;
        local_280 = (uint)lVar129;
        auVar201 = vpshufd_avx(ZEXT416(local_280),0);
        auVar362 = vpor_avx(auVar201,_DAT_01f4ad30);
        auVar201 = vpor_avx(auVar201,_DAT_01f7afa0);
        auVar119._4_4_ = fStack_39c;
        auVar119._0_4_ = local_3a0;
        auVar119._8_4_ = fStack_398;
        auVar119._12_4_ = fStack_394;
        auVar362 = vpcmpgtd_avx(auVar119,auVar362);
        auVar201 = vpcmpgtd_avx(auVar119,auVar201);
        local_3c0._16_16_ = auVar201;
        local_3c0._0_16_ = auVar362;
        auVar208 = ZEXT3264(local_3c0);
        auVar22 = local_3c0 & auVar310;
        fVar168 = (float)local_7a0._0_4_;
        fVar184 = (float)local_7a0._4_4_;
        fVar186 = fStack_798;
        fVar188 = fStack_794;
        fVar262 = fStack_790;
        fVar270 = fStack_78c;
        fVar272 = fStack_788;
        fVar169 = (float)local_660._0_4_;
        fVar185 = (float)local_660._4_4_;
        fVar187 = fStack_658;
        fVar189 = fStack_654;
        fVar274 = fStack_650;
        fVar275 = fStack_64c;
        fVar276 = fStack_648;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0x7f,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0xbf,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar22[0x1f]) {
          auVar300 = ZEXT3264(local_700);
          auVar314 = ZEXT3264(local_720);
          auVar325 = ZEXT3264(auVar325._0_32_);
          auVar290 = ZEXT3264(_local_580);
          auVar347 = ZEXT3264(auVar347._0_32_);
          uVar130 = uVar130 & 0xffffffff;
        }
        else {
          local_4a0 = (float)local_7c0._0_4_ * (float)local_160._0_4_ +
                      fVar213 * (float)local_420._0_4_ +
                      (float)local_300._0_4_ * fVar222 + (float)local_520._0_4_ * fVar166;
          fStack_49c = (float)local_7c0._4_4_ * (float)local_160._4_4_ +
                       fVar137 * (float)local_420._4_4_ +
                       (float)local_300._4_4_ * fVar233 + (float)local_520._4_4_ * fVar223;
          fStack_498 = fStack_7b8 * fStack_158 +
                       fVar157 * fStack_418 + fStack_2f8 * fVar235 + fStack_518 * fVar234;
          fStack_494 = fStack_7b4 * fStack_154 +
                       fVar160 * fStack_414 + fStack_2f4 * fVar237 + fStack_514 * fVar236;
          fStack_490 = fStack_7b0 * fStack_150 +
                       fVar163 * fStack_410 + fStack_2f0 * fVar243 + fStack_510 * fStack_490;
          fStack_48c = fStack_7ac * fStack_14c +
                       fVar164 * fStack_40c + fStack_2ec * fVar255 + fStack_50c * fStack_48c;
          fStack_488 = fStack_7a8 * fStack_148 +
                       fVar165 * fStack_408 + fStack_2e8 * fVar258 + fStack_508 * fStack_488;
          fStack_484 = fStack_7a4 + fStack_744 + auVar140._28_4_ + 0.0;
          local_5c0._0_4_ = auVar122._0_4_;
          local_5c0._4_4_ = auVar122._4_4_;
          fStack_5b8 = auVar122._8_4_;
          fStack_5b4 = auVar122._12_4_;
          fStack_5b0 = auVar122._16_4_;
          fStack_5ac = auVar122._20_4_;
          fStack_5a8 = auVar122._24_4_;
          pfVar4 = (float *)(lVar126 + 0x2201640 + lVar129 * 4);
          fVar277 = *pfVar4;
          fVar222 = pfVar4[1];
          fVar233 = pfVar4[2];
          fVar235 = pfVar4[3];
          fVar237 = pfVar4[4];
          fVar240 = pfVar4[5];
          fVar243 = pfVar4[6];
          pfVar5 = (float *)(lVar126 + 0x2201ac4 + lVar129 * 4);
          fVar246 = *pfVar5;
          fVar248 = pfVar5[1];
          fVar255 = pfVar5[2];
          fVar256 = pfVar5[3];
          fVar257 = pfVar5[4];
          fVar258 = pfVar5[5];
          fVar259 = pfVar5[6];
          fVar278 = pfVar3[7] + 0.0;
          pfVar6 = (float *)(lVar126 + 0x22011bc + lVar129 * 4);
          fVar260 = *pfVar6;
          fVar213 = pfVar6[1];
          fVar137 = pfVar6[2];
          fVar157 = pfVar6[3];
          fVar160 = pfVar6[4];
          fVar163 = pfVar6[5];
          fVar164 = pfVar6[6];
          fVar167 = pfVar4[7] + pfVar5[7];
          fStack_464 = pfVar5[7] + fVar278;
          fVar278 = pfVar3[7] + local_360._28_4_ + fVar278;
          pfVar3 = (float *)(lVar126 + 0x2200d38 + lVar129 * 4);
          fVar165 = *pfVar3;
          fVar166 = pfVar3[1];
          fVar223 = pfVar3[2];
          fVar234 = pfVar3[3];
          fVar236 = pfVar3[4];
          fVar210 = pfVar3[5];
          fVar211 = pfVar3[6];
          local_5e0 = (float)local_320._0_4_ * fVar165 +
                      (float)local_340._0_4_ * fVar260 +
                      (float)local_7a0._0_4_ * fVar277 + (float)local_440._0_4_ * fVar246;
          fStack_5dc = (float)local_320._4_4_ * fVar166 +
                       (float)local_340._4_4_ * fVar213 +
                       (float)local_7a0._4_4_ * fVar222 + (float)local_440._4_4_ * fVar248;
          fStack_5d8 = fStack_318 * fVar223 +
                       fStack_338 * fVar137 + fStack_798 * fVar233 + fStack_438 * fVar255;
          fStack_5d4 = fStack_314 * fVar234 +
                       fStack_334 * fVar157 + fStack_794 * fVar235 + fStack_434 * fVar256;
          fStack_5d0 = fStack_310 * fVar236 +
                       fStack_330 * fVar160 + fStack_790 * fVar237 + fStack_430 * fVar257;
          fStack_5cc = fStack_30c * fVar210 +
                       fStack_32c * fVar163 + fStack_78c * fVar240 + fStack_42c * fVar258;
          fStack_5c8 = fStack_308 * fVar211 +
                       fStack_328 * fVar164 + fStack_788 * fVar243 + fStack_428 * fVar259;
          fStack_5c4 = fVar167 + fStack_464;
          local_480 = fVar165 * (float)local_660._0_4_ +
                      fVar238 * fVar277 + fVar246 * (float)local_580._0_4_ + fVar158 * fVar260;
          fStack_47c = fVar166 * (float)local_660._4_4_ +
                       fVar241 * fVar222 + fVar248 * (float)local_580._4_4_ + fVar159 * fVar213;
          fStack_478 = fVar223 * fStack_658 +
                       fVar244 * fVar233 + fVar255 * fStack_578 + fVar161 * fVar137;
          fStack_474 = fVar234 * fStack_654 +
                       fVar135 * fVar235 + fVar256 * fStack_574 + fVar162 * fVar157;
          fStack_470 = fVar236 * fStack_650 +
                       fVar136 * fVar237 + fVar257 * fStack_570 + fVar194 * fVar160;
          fStack_46c = fVar210 * fStack_64c +
                       fVar155 * fVar240 + fVar258 * fStack_56c + fVar195 * fVar163;
          fStack_468 = fVar211 * fStack_648 +
                       fVar156 * fVar243 + fVar259 * fStack_568 + fVar209 * fVar164;
          fStack_464 = fStack_464 + fVar278;
          auVar338._0_4_ =
               fVar260 * (float)local_420._0_4_ +
               (float)local_300._0_4_ * fVar277 + (float)local_520._0_4_ * fVar246 +
               fVar165 * (float)local_160._0_4_;
          auVar338._4_4_ =
               fVar213 * (float)local_420._4_4_ +
               (float)local_300._4_4_ * fVar222 + (float)local_520._4_4_ * fVar248 +
               fVar166 * (float)local_160._4_4_;
          auVar338._8_4_ =
               fVar137 * fStack_418 + fStack_2f8 * fVar233 + fStack_518 * fVar255 +
               fVar223 * fStack_158;
          auVar338._12_4_ =
               fVar157 * fStack_414 + fStack_2f4 * fVar235 + fStack_514 * fVar256 +
               fVar234 * fStack_154;
          auVar338._16_4_ =
               fVar160 * fStack_410 + fStack_2f0 * fVar237 + fStack_510 * fVar257 +
               fVar236 * fStack_150;
          auVar338._20_4_ =
               fVar163 * fStack_40c + fStack_2ec * fVar240 + fStack_50c * fVar258 +
               fVar210 * fStack_14c;
          auVar338._24_4_ =
               fVar164 * fStack_408 + fStack_2e8 * fVar243 + fStack_508 * fVar259 +
               fVar211 * fStack_148;
          auVar338._28_4_ = pfVar6[7] + fVar167 + fVar278;
          pfVar3 = (float *)(lVar126 + 0x2203a60 + lVar129 * 4);
          fVar222 = *pfVar3;
          fVar233 = pfVar3[1];
          fVar235 = pfVar3[2];
          fVar237 = pfVar3[3];
          fVar240 = pfVar3[4];
          fVar243 = pfVar3[5];
          fVar246 = pfVar3[6];
          pfVar4 = (float *)(lVar126 + 0x2203ee4 + lVar129 * 4);
          fVar248 = *pfVar4;
          fVar255 = pfVar4[1];
          fVar256 = pfVar4[2];
          fVar257 = pfVar4[3];
          fVar258 = pfVar4[4];
          fVar259 = pfVar4[5];
          fVar260 = pfVar4[6];
          fVar277 = auVar347._28_4_;
          pfVar5 = (float *)(lVar126 + 0x22035dc + lVar129 * 4);
          fVar213 = *pfVar5;
          fVar137 = pfVar5[1];
          fVar157 = pfVar5[2];
          fVar160 = pfVar5[3];
          fVar163 = pfVar5[4];
          fVar164 = pfVar5[5];
          fVar165 = pfVar5[6];
          pfVar6 = (float *)(lVar126 + 0x2203158 + lVar129 * 4);
          fVar166 = *pfVar6;
          fVar223 = pfVar6[1];
          fVar234 = pfVar6[2];
          fVar236 = pfVar6[3];
          fVar158 = pfVar6[4];
          fVar159 = pfVar6[5];
          fVar161 = pfVar6[6];
          auVar312._0_4_ =
               (float)local_320._0_4_ * fVar166 +
               (float)local_340._0_4_ * fVar213 +
               (float)local_7a0._0_4_ * fVar222 + (float)local_440._0_4_ * fVar248;
          auVar312._4_4_ =
               (float)local_320._4_4_ * fVar223 +
               (float)local_340._4_4_ * fVar137 +
               (float)local_7a0._4_4_ * fVar233 + (float)local_440._4_4_ * fVar255;
          auVar312._8_4_ =
               fStack_318 * fVar234 +
               fStack_338 * fVar157 + fStack_798 * fVar235 + fStack_438 * fVar256;
          auVar312._12_4_ =
               fStack_314 * fVar236 +
               fStack_334 * fVar160 + fStack_794 * fVar237 + fStack_434 * fVar257;
          auVar312._16_4_ =
               fStack_310 * fVar158 +
               fStack_330 * fVar163 + fStack_790 * fVar240 + fStack_430 * fVar258;
          auVar312._20_4_ =
               fStack_30c * fVar159 +
               fStack_32c * fVar164 + fStack_78c * fVar243 + fStack_42c * fVar259;
          auVar312._24_4_ =
               fStack_308 * fVar161 +
               fStack_328 * fVar165 + fStack_788 * fVar246 + fStack_428 * fVar260;
          auVar312._28_4_ = fVar277 + fVar277 + fStack_784 + fVar277;
          auVar334._0_4_ =
               fVar166 * (float)local_660._0_4_ +
               fVar213 * (float)local_600._0_4_ +
               fVar238 * fVar222 + fVar248 * (float)local_580._0_4_;
          auVar334._4_4_ =
               fVar223 * (float)local_660._4_4_ +
               fVar137 * (float)local_600._4_4_ +
               fVar241 * fVar233 + fVar255 * (float)local_580._4_4_;
          auVar334._8_4_ =
               fVar234 * fStack_658 +
               fVar157 * fStack_5f8 + fVar244 * fVar235 + fVar256 * fStack_578;
          auVar334._12_4_ =
               fVar236 * fStack_654 +
               fVar160 * fStack_5f4 + fVar135 * fVar237 + fVar257 * fStack_574;
          auVar334._16_4_ =
               fVar158 * fStack_650 +
               fVar163 * fStack_5f0 + fVar136 * fVar240 + fVar258 * fStack_570;
          auVar334._20_4_ =
               fVar159 * fStack_64c +
               fVar164 * fStack_5ec + fVar155 * fVar243 + fVar259 * fStack_56c;
          auVar334._24_4_ =
               fVar161 * fStack_648 +
               fVar165 * fStack_5e8 + fVar156 * fVar246 + fVar260 * fStack_568;
          auVar334._28_4_ = fVar277 + fVar277 + fStack_424 + fVar277;
          auVar254._8_4_ = 0x7fffffff;
          auVar254._0_8_ = 0x7fffffff7fffffff;
          auVar254._12_4_ = 0x7fffffff;
          auVar254._16_4_ = 0x7fffffff;
          auVar254._20_4_ = 0x7fffffff;
          auVar254._24_4_ = 0x7fffffff;
          auVar254._28_4_ = 0x7fffffff;
          auVar116._4_4_ = fStack_5dc;
          auVar116._0_4_ = local_5e0;
          auVar116._8_4_ = fStack_5d8;
          auVar116._12_4_ = fStack_5d4;
          auVar116._16_4_ = fStack_5d0;
          auVar116._20_4_ = fStack_5cc;
          auVar116._24_4_ = fStack_5c8;
          auVar116._28_4_ = fStack_5c4;
          auVar22 = vandps_avx(auVar116,auVar254);
          auVar118._4_4_ = fStack_47c;
          auVar118._0_4_ = local_480;
          auVar118._8_4_ = fStack_478;
          auVar118._12_4_ = fStack_474;
          auVar118._16_4_ = fStack_470;
          auVar118._20_4_ = fStack_46c;
          auVar118._24_4_ = fStack_468;
          auVar118._28_4_ = fStack_464;
          auVar23 = vandps_avx(auVar118,auVar254);
          auVar23 = vmaxps_avx(auVar22,auVar23);
          auVar22 = vandps_avx(auVar338,auVar254);
          auVar23 = vmaxps_avx(auVar23,auVar22);
          auVar23 = vcmpps_avx(auVar23,local_4c0,1);
          auVar24 = vblendvps_avx(auVar116,auVar20,auVar23);
          auVar151._0_4_ =
               fVar166 * (float)local_160._0_4_ +
               fVar213 * (float)local_420._0_4_ +
               fVar248 * (float)local_520._0_4_ + (float)local_300._0_4_ * fVar222;
          auVar151._4_4_ =
               fVar223 * (float)local_160._4_4_ +
               fVar137 * (float)local_420._4_4_ +
               fVar255 * (float)local_520._4_4_ + (float)local_300._4_4_ * fVar233;
          auVar151._8_4_ =
               fVar234 * fStack_158 +
               fVar157 * fStack_418 + fVar256 * fStack_518 + fStack_2f8 * fVar235;
          auVar151._12_4_ =
               fVar236 * fStack_154 +
               fVar160 * fStack_414 + fVar257 * fStack_514 + fStack_2f4 * fVar237;
          auVar151._16_4_ =
               fVar158 * fStack_150 +
               fVar163 * fStack_410 + fVar258 * fStack_510 + fStack_2f0 * fVar240;
          auVar151._20_4_ =
               fVar159 * fStack_14c +
               fVar164 * fStack_40c + fVar259 * fStack_50c + fStack_2ec * fVar243;
          auVar151._24_4_ =
               fVar161 * fStack_148 +
               fVar165 * fStack_408 + fVar260 * fStack_508 + fStack_2e8 * fVar246;
          auVar151._28_4_ = auVar22._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
          auVar25 = vblendvps_avx(auVar118,auVar21,auVar23);
          auVar22 = vandps_avx(auVar312,auVar254);
          auVar23 = vandps_avx(auVar334,auVar254);
          auVar23 = vmaxps_avx(auVar22,auVar23);
          auVar22 = vandps_avx(auVar151,auVar254);
          auVar22 = vmaxps_avx(auVar23,auVar22);
          local_500._0_4_ = auVar123._0_4_;
          local_500._4_4_ = auVar123._4_4_;
          fStack_4f8 = auVar123._8_4_;
          fStack_4f4 = auVar123._12_4_;
          fStack_4f0 = auVar123._16_4_;
          fStack_4ec = auVar123._20_4_;
          fStack_4e8 = auVar123._24_4_;
          auVar22 = vcmpps_avx(auVar22,local_4c0,1);
          auVar20 = vblendvps_avx(auVar312,auVar20,auVar22);
          auVar152._0_4_ =
               (float)local_160._0_4_ * (float)local_500._0_4_ +
               (float)local_420._0_4_ * (float)local_5c0._0_4_ +
               (float)local_300._0_4_ * fVar239 + (float)local_520._0_4_ * fVar304;
          auVar152._4_4_ =
               (float)local_160._4_4_ * (float)local_500._4_4_ +
               (float)local_420._4_4_ * (float)local_5c0._4_4_ +
               (float)local_300._4_4_ * fVar190 + (float)local_520._4_4_ * fVar245;
          auVar152._8_4_ =
               fStack_158 * fStack_4f8 +
               fStack_418 * fStack_5b8 + fStack_2f8 * fVar301 + fStack_518 * fVar192;
          auVar152._12_4_ =
               fStack_154 * fStack_4f4 +
               fStack_414 * fStack_5b4 + fStack_2f4 * fVar302 + fStack_514 * fVar305;
          auVar152._16_4_ =
               fStack_150 * fStack_4f0 +
               fStack_410 * fStack_5b0 + fStack_2f0 * fVar242 + fStack_510 * fVar306;
          auVar152._20_4_ =
               fStack_14c * fStack_4ec +
               fStack_40c * fStack_5ac + fStack_2ec * fVar191 + fStack_50c * fVar247;
          auVar152._24_4_ =
               fStack_148 * fStack_4e8 +
               fStack_408 * fStack_5a8 + fStack_2e8 * fVar303 + fStack_508 * fVar193;
          auVar152._28_4_ = auVar23._28_4_ + fStack_484 + auVar140._28_4_ + 0.0;
          auVar140 = vblendvps_avx(auVar334,auVar21,auVar22);
          fVar165 = auVar24._0_4_;
          fVar166 = auVar24._4_4_;
          fVar223 = auVar24._8_4_;
          fVar234 = auVar24._12_4_;
          fVar236 = auVar24._16_4_;
          fVar238 = auVar24._20_4_;
          fVar241 = auVar24._24_4_;
          fVar244 = auVar24._28_4_;
          fVar260 = auVar20._0_4_;
          fVar190 = auVar20._4_4_;
          fVar302 = auVar20._8_4_;
          fVar191 = auVar20._12_4_;
          fVar304 = auVar20._16_4_;
          fVar192 = auVar20._20_4_;
          fVar306 = auVar20._24_4_;
          fVar277 = auVar25._0_4_;
          fVar233 = auVar25._4_4_;
          fVar237 = auVar25._8_4_;
          fVar243 = auVar25._12_4_;
          fVar248 = auVar25._16_4_;
          fVar256 = auVar25._20_4_;
          fVar258 = auVar25._24_4_;
          auVar323._0_4_ = fVar277 * fVar277 + fVar165 * fVar165;
          auVar323._4_4_ = fVar233 * fVar233 + fVar166 * fVar166;
          auVar323._8_4_ = fVar237 * fVar237 + fVar223 * fVar223;
          auVar323._12_4_ = fVar243 * fVar243 + fVar234 * fVar234;
          auVar323._16_4_ = fVar248 * fVar248 + fVar236 * fVar236;
          auVar323._20_4_ = fVar256 * fVar256 + fVar238 * fVar238;
          auVar323._24_4_ = fVar258 * fVar258 + fVar241 * fVar241;
          auVar323._28_4_ = fStack_324 + auVar21._28_4_;
          auVar21 = vrsqrtps_avx(auVar323);
          fVar222 = auVar21._0_4_;
          fVar235 = auVar21._4_4_;
          auVar73._4_4_ = fVar235 * 1.5;
          auVar73._0_4_ = fVar222 * 1.5;
          fVar240 = auVar21._8_4_;
          auVar73._8_4_ = fVar240 * 1.5;
          fVar246 = auVar21._12_4_;
          auVar73._12_4_ = fVar246 * 1.5;
          fVar255 = auVar21._16_4_;
          auVar73._16_4_ = fVar255 * 1.5;
          fVar257 = auVar21._20_4_;
          auVar73._20_4_ = fVar257 * 1.5;
          fVar259 = auVar21._24_4_;
          auVar73._24_4_ = fVar259 * 1.5;
          auVar73._28_4_ = auVar334._28_4_;
          auVar74._4_4_ = fVar235 * fVar235 * fVar235 * auVar323._4_4_ * 0.5;
          auVar74._0_4_ = fVar222 * fVar222 * fVar222 * auVar323._0_4_ * 0.5;
          auVar74._8_4_ = fVar240 * fVar240 * fVar240 * auVar323._8_4_ * 0.5;
          auVar74._12_4_ = fVar246 * fVar246 * fVar246 * auVar323._12_4_ * 0.5;
          auVar74._16_4_ = fVar255 * fVar255 * fVar255 * auVar323._16_4_ * 0.5;
          auVar74._20_4_ = fVar257 * fVar257 * fVar257 * auVar323._20_4_ * 0.5;
          auVar74._24_4_ = fVar259 * fVar259 * fVar259 * auVar323._24_4_ * 0.5;
          auVar74._28_4_ = auVar323._28_4_;
          auVar22 = vsubps_avx(auVar73,auVar74);
          fVar193 = auVar22._0_4_;
          fVar213 = auVar22._4_4_;
          fVar137 = auVar22._8_4_;
          fVar157 = auVar22._12_4_;
          fVar160 = auVar22._16_4_;
          fVar163 = auVar22._20_4_;
          fVar164 = auVar22._24_4_;
          fVar222 = auVar140._0_4_;
          fVar235 = auVar140._4_4_;
          fVar240 = auVar140._8_4_;
          fVar246 = auVar140._12_4_;
          fVar255 = auVar140._16_4_;
          fVar257 = auVar140._20_4_;
          fVar259 = auVar140._24_4_;
          auVar299._0_4_ = fVar222 * fVar222 + fVar260 * fVar260;
          auVar299._4_4_ = fVar235 * fVar235 + fVar190 * fVar190;
          auVar299._8_4_ = fVar240 * fVar240 + fVar302 * fVar302;
          auVar299._12_4_ = fVar246 * fVar246 + fVar191 * fVar191;
          auVar299._16_4_ = fVar255 * fVar255 + fVar304 * fVar304;
          auVar299._20_4_ = fVar257 * fVar257 + fVar192 * fVar192;
          auVar299._24_4_ = fVar259 * fVar259 + fVar306 * fVar306;
          auVar299._28_4_ = auVar21._28_4_ + auVar20._28_4_;
          auVar140 = vrsqrtps_avx(auVar299);
          fVar239 = auVar140._0_4_;
          fVar301 = auVar140._4_4_;
          auVar75._4_4_ = fVar301 * 1.5;
          auVar75._0_4_ = fVar239 * 1.5;
          fVar242 = auVar140._8_4_;
          auVar75._8_4_ = fVar242 * 1.5;
          fVar303 = auVar140._12_4_;
          auVar75._12_4_ = fVar303 * 1.5;
          fVar245 = auVar140._16_4_;
          auVar75._16_4_ = fVar245 * 1.5;
          fVar305 = auVar140._20_4_;
          auVar75._20_4_ = fVar305 * 1.5;
          fVar247 = auVar140._24_4_;
          auVar75._24_4_ = fVar247 * 1.5;
          auVar75._28_4_ = auVar334._28_4_;
          auVar76._4_4_ = fVar301 * fVar301 * fVar301 * auVar299._4_4_ * 0.5;
          auVar76._0_4_ = fVar239 * fVar239 * fVar239 * auVar299._0_4_ * 0.5;
          auVar76._8_4_ = fVar242 * fVar242 * fVar242 * auVar299._8_4_ * 0.5;
          auVar76._12_4_ = fVar303 * fVar303 * fVar303 * auVar299._12_4_ * 0.5;
          auVar76._16_4_ = fVar245 * fVar245 * fVar245 * auVar299._16_4_ * 0.5;
          auVar76._20_4_ = fVar305 * fVar305 * fVar305 * auVar299._20_4_ * 0.5;
          auVar76._24_4_ = fVar247 * fVar247 * fVar247 * auVar299._24_4_ * 0.5;
          auVar76._28_4_ = auVar299._28_4_;
          auVar20 = vsubps_avx(auVar75,auVar76);
          fVar239 = auVar20._0_4_;
          fVar301 = auVar20._4_4_;
          fVar242 = auVar20._8_4_;
          fVar303 = auVar20._12_4_;
          fVar245 = auVar20._16_4_;
          fVar305 = auVar20._20_4_;
          fVar247 = auVar20._24_4_;
          fVar277 = (float)local_760._0_4_ * fVar193 * fVar277;
          fVar233 = (float)local_760._4_4_ * fVar213 * fVar233;
          auVar77._4_4_ = fVar233;
          auVar77._0_4_ = fVar277;
          fVar237 = (float)uStack_758 * fVar137 * fVar237;
          auVar77._8_4_ = fVar237;
          fVar243 = uStack_758._4_4_ * fVar157 * fVar243;
          auVar77._12_4_ = fVar243;
          fVar248 = fStack_750 * fVar160 * fVar248;
          auVar77._16_4_ = fVar248;
          fVar256 = fStack_74c * fVar163 * fVar256;
          auVar77._20_4_ = fVar256;
          fVar258 = fStack_748 * fVar164 * fVar258;
          auVar77._24_4_ = fVar258;
          auVar77._28_4_ = auVar140._28_4_;
          local_500._4_4_ = fVar233 + local_360._4_4_;
          local_500._0_4_ = fVar277 + local_360._0_4_;
          fStack_4f8 = fVar237 + local_360._8_4_;
          fStack_4f4 = fVar243 + local_360._12_4_;
          fStack_4f0 = fVar248 + local_360._16_4_;
          fStack_4ec = fVar256 + local_360._20_4_;
          fStack_4e8 = fVar258 + local_360._24_4_;
          fStack_4e4 = auVar140._28_4_ + local_360._28_4_;
          fVar277 = (float)local_760._0_4_ * fVar193 * -fVar165;
          fVar233 = (float)local_760._4_4_ * fVar213 * -fVar166;
          auVar78._4_4_ = fVar233;
          auVar78._0_4_ = fVar277;
          fVar237 = (float)uStack_758 * fVar137 * -fVar223;
          auVar78._8_4_ = fVar237;
          fVar243 = uStack_758._4_4_ * fVar157 * -fVar234;
          auVar78._12_4_ = fVar243;
          fVar248 = fStack_750 * fVar160 * -fVar236;
          auVar78._16_4_ = fVar248;
          fVar256 = fStack_74c * fVar163 * -fVar238;
          auVar78._20_4_ = fVar256;
          fVar258 = fStack_748 * fVar164 * -fVar241;
          auVar78._24_4_ = fVar258;
          auVar78._28_4_ = -fVar244;
          local_5c0._4_4_ = local_5a0._4_4_ + fVar233;
          local_5c0._0_4_ = (float)local_5a0._0_4_ + fVar277;
          fStack_5b8 = local_5a0._8_4_ + fVar237;
          fStack_5b4 = local_5a0._12_4_ + fVar243;
          fStack_5b0 = local_5a0._16_4_ + fVar248;
          fStack_5ac = local_5a0._20_4_ + fVar256;
          fStack_5a8 = local_5a0._24_4_ + fVar258;
          fStack_5a4 = local_5a0._28_4_ + -fVar244;
          fVar277 = fVar193 * 0.0 * (float)local_760._0_4_;
          fVar233 = fVar213 * 0.0 * (float)local_760._4_4_;
          auVar79._4_4_ = fVar233;
          auVar79._0_4_ = fVar277;
          fVar237 = fVar137 * 0.0 * (float)uStack_758;
          auVar79._8_4_ = fVar237;
          fVar243 = fVar157 * 0.0 * uStack_758._4_4_;
          auVar79._12_4_ = fVar243;
          fVar248 = fVar160 * 0.0 * fStack_750;
          auVar79._16_4_ = fVar248;
          fVar256 = fVar163 * 0.0 * fStack_74c;
          auVar79._20_4_ = fVar256;
          fVar258 = fVar164 * 0.0 * fStack_748;
          auVar79._24_4_ = fVar258;
          auVar79._28_4_ = fVar244;
          auVar25 = vsubps_avx(local_360,auVar77);
          auVar357._0_4_ = fVar277 + auVar152._0_4_;
          auVar357._4_4_ = fVar233 + auVar152._4_4_;
          auVar357._8_4_ = fVar237 + auVar152._8_4_;
          auVar357._12_4_ = fVar243 + auVar152._12_4_;
          auVar357._16_4_ = fVar248 + auVar152._16_4_;
          auVar357._20_4_ = fVar256 + auVar152._20_4_;
          auVar357._24_4_ = fVar258 + auVar152._24_4_;
          auVar357._28_4_ = fVar244 + auVar152._28_4_;
          fVar277 = (float)local_6c0._0_4_ * fVar239 * fVar222;
          fVar222 = local_6c0._4_4_ * fVar301 * fVar235;
          auVar80._4_4_ = fVar222;
          auVar80._0_4_ = fVar277;
          fVar233 = local_6c0._8_4_ * fVar242 * fVar240;
          auVar80._8_4_ = fVar233;
          fVar235 = local_6c0._12_4_ * fVar303 * fVar246;
          auVar80._12_4_ = fVar235;
          fVar237 = local_6c0._16_4_ * fVar245 * fVar255;
          auVar80._16_4_ = fVar237;
          fVar240 = local_6c0._20_4_ * fVar305 * fVar257;
          auVar80._20_4_ = fVar240;
          fVar243 = local_6c0._24_4_ * fVar247 * fVar259;
          auVar80._24_4_ = fVar243;
          auVar80._28_4_ = fStack_744;
          auVar141 = vsubps_avx(local_5a0,auVar78);
          auVar339._0_4_ = local_380._0_4_ + fVar277;
          auVar339._4_4_ = local_380._4_4_ + fVar222;
          auVar339._8_4_ = local_380._8_4_ + fVar233;
          auVar339._12_4_ = local_380._12_4_ + fVar235;
          auVar339._16_4_ = local_380._16_4_ + fVar237;
          auVar339._20_4_ = local_380._20_4_ + fVar240;
          auVar339._24_4_ = local_380._24_4_ + fVar243;
          auVar339._28_4_ = local_380._28_4_ + fStack_744;
          fVar277 = fVar239 * -fVar260 * (float)local_6c0._0_4_;
          fVar222 = fVar301 * -fVar190 * local_6c0._4_4_;
          auVar81._4_4_ = fVar222;
          auVar81._0_4_ = fVar277;
          fVar233 = fVar242 * -fVar302 * local_6c0._8_4_;
          auVar81._8_4_ = fVar233;
          fVar235 = fVar303 * -fVar191 * local_6c0._12_4_;
          auVar81._12_4_ = fVar235;
          fVar237 = fVar245 * -fVar304 * local_6c0._16_4_;
          auVar81._16_4_ = fVar237;
          fVar240 = fVar305 * -fVar192 * local_6c0._20_4_;
          auVar81._20_4_ = fVar240;
          fVar243 = fVar247 * -fVar306 * local_6c0._24_4_;
          auVar81._24_4_ = fVar243;
          auVar81._28_4_ = local_360._28_4_;
          auVar142 = vsubps_avx(auVar152,auVar79);
          auVar231._0_4_ = (float)local_460._0_4_ + fVar277;
          auVar231._4_4_ = (float)local_460._4_4_ + fVar222;
          auVar231._8_4_ = fStack_458 + fVar233;
          auVar231._12_4_ = fStack_454 + fVar235;
          auVar231._16_4_ = fStack_450 + fVar237;
          auVar231._20_4_ = fStack_44c + fVar240;
          auVar231._24_4_ = fStack_448 + fVar243;
          auVar231._28_4_ = fStack_444 + local_360._28_4_;
          fVar277 = fVar239 * 0.0 * (float)local_6c0._0_4_;
          fVar222 = fVar301 * 0.0 * local_6c0._4_4_;
          auVar82._4_4_ = fVar222;
          auVar82._0_4_ = fVar277;
          fVar233 = fVar242 * 0.0 * local_6c0._8_4_;
          auVar82._8_4_ = fVar233;
          fVar235 = fVar303 * 0.0 * local_6c0._12_4_;
          auVar82._12_4_ = fVar235;
          fVar237 = fVar245 * 0.0 * local_6c0._16_4_;
          auVar82._16_4_ = fVar237;
          fVar240 = fVar305 * 0.0 * local_6c0._20_4_;
          auVar82._20_4_ = fVar240;
          fVar243 = fVar247 * 0.0 * local_6c0._24_4_;
          auVar82._24_4_ = fVar243;
          auVar82._28_4_ = auVar152._28_4_;
          auVar140 = vsubps_avx(local_380,auVar80);
          auVar117._4_4_ = fStack_49c;
          auVar117._0_4_ = local_4a0;
          auVar117._8_4_ = fStack_498;
          auVar117._12_4_ = fStack_494;
          auVar117._16_4_ = fStack_490;
          auVar117._20_4_ = fStack_48c;
          auVar117._24_4_ = fStack_488;
          auVar117._28_4_ = fStack_484;
          auVar313._0_4_ = local_4a0 + fVar277;
          auVar313._4_4_ = fStack_49c + fVar222;
          auVar313._8_4_ = fStack_498 + fVar233;
          auVar313._12_4_ = fStack_494 + fVar235;
          auVar313._16_4_ = fStack_490 + fVar237;
          auVar313._20_4_ = fStack_48c + fVar240;
          auVar313._24_4_ = fStack_488 + fVar243;
          auVar313._28_4_ = fStack_484 + auVar152._28_4_;
          auVar21 = vsubps_avx(_local_460,auVar81);
          auVar22 = vsubps_avx(auVar117,auVar82);
          auVar23 = vsubps_avx(auVar231,auVar141);
          auVar24 = vsubps_avx(auVar313,auVar142);
          auVar83._4_4_ = auVar142._4_4_ * auVar23._4_4_;
          auVar83._0_4_ = auVar142._0_4_ * auVar23._0_4_;
          auVar83._8_4_ = auVar142._8_4_ * auVar23._8_4_;
          auVar83._12_4_ = auVar142._12_4_ * auVar23._12_4_;
          auVar83._16_4_ = auVar142._16_4_ * auVar23._16_4_;
          auVar83._20_4_ = auVar142._20_4_ * auVar23._20_4_;
          auVar83._24_4_ = auVar142._24_4_ * auVar23._24_4_;
          auVar83._28_4_ = auVar334._28_4_;
          auVar84._4_4_ = auVar141._4_4_ * auVar24._4_4_;
          auVar84._0_4_ = auVar141._0_4_ * auVar24._0_4_;
          auVar84._8_4_ = auVar141._8_4_ * auVar24._8_4_;
          auVar84._12_4_ = auVar141._12_4_ * auVar24._12_4_;
          auVar84._16_4_ = auVar141._16_4_ * auVar24._16_4_;
          auVar84._20_4_ = auVar141._20_4_ * auVar24._20_4_;
          auVar84._24_4_ = auVar141._24_4_ * auVar24._24_4_;
          auVar84._28_4_ = fStack_484;
          auVar26 = vsubps_avx(auVar84,auVar83);
          auVar85._4_4_ = auVar25._4_4_ * auVar24._4_4_;
          auVar85._0_4_ = auVar25._0_4_ * auVar24._0_4_;
          auVar85._8_4_ = auVar25._8_4_ * auVar24._8_4_;
          auVar85._12_4_ = auVar25._12_4_ * auVar24._12_4_;
          auVar85._16_4_ = auVar25._16_4_ * auVar24._16_4_;
          auVar85._20_4_ = auVar25._20_4_ * auVar24._20_4_;
          auVar85._24_4_ = auVar25._24_4_ * auVar24._24_4_;
          auVar85._28_4_ = auVar24._28_4_;
          auVar24 = vsubps_avx(auVar339,auVar25);
          auVar86._4_4_ = auVar142._4_4_ * auVar24._4_4_;
          auVar86._0_4_ = auVar142._0_4_ * auVar24._0_4_;
          auVar86._8_4_ = auVar142._8_4_ * auVar24._8_4_;
          auVar86._12_4_ = auVar142._12_4_ * auVar24._12_4_;
          auVar86._16_4_ = auVar142._16_4_ * auVar24._16_4_;
          auVar86._20_4_ = auVar142._20_4_ * auVar24._20_4_;
          auVar86._24_4_ = auVar142._24_4_ * auVar24._24_4_;
          auVar86._28_4_ = auVar20._28_4_;
          auVar27 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = auVar141._4_4_ * auVar24._4_4_;
          auVar87._0_4_ = auVar141._0_4_ * auVar24._0_4_;
          auVar87._8_4_ = auVar141._8_4_ * auVar24._8_4_;
          auVar87._12_4_ = auVar141._12_4_ * auVar24._12_4_;
          auVar87._16_4_ = auVar141._16_4_ * auVar24._16_4_;
          auVar87._20_4_ = auVar141._20_4_ * auVar24._20_4_;
          auVar87._24_4_ = auVar141._24_4_ * auVar24._24_4_;
          auVar87._28_4_ = auVar20._28_4_;
          auVar88._4_4_ = auVar25._4_4_ * auVar23._4_4_;
          auVar88._0_4_ = auVar25._0_4_ * auVar23._0_4_;
          auVar88._8_4_ = auVar25._8_4_ * auVar23._8_4_;
          auVar88._12_4_ = auVar25._12_4_ * auVar23._12_4_;
          auVar88._16_4_ = auVar25._16_4_ * auVar23._16_4_;
          auVar88._20_4_ = auVar25._20_4_ * auVar23._20_4_;
          auVar88._24_4_ = auVar25._24_4_ * auVar23._24_4_;
          auVar88._28_4_ = auVar23._28_4_;
          auVar20 = vsubps_avx(auVar88,auVar87);
          auVar181._0_4_ = auVar26._0_4_ * 0.0 + auVar20._0_4_ + auVar27._0_4_ * 0.0;
          auVar181._4_4_ = auVar26._4_4_ * 0.0 + auVar20._4_4_ + auVar27._4_4_ * 0.0;
          auVar181._8_4_ = auVar26._8_4_ * 0.0 + auVar20._8_4_ + auVar27._8_4_ * 0.0;
          auVar181._12_4_ = auVar26._12_4_ * 0.0 + auVar20._12_4_ + auVar27._12_4_ * 0.0;
          auVar181._16_4_ = auVar26._16_4_ * 0.0 + auVar20._16_4_ + auVar27._16_4_ * 0.0;
          auVar181._20_4_ = auVar26._20_4_ * 0.0 + auVar20._20_4_ + auVar27._20_4_ * 0.0;
          auVar181._24_4_ = auVar26._24_4_ * 0.0 + auVar20._24_4_ + auVar27._24_4_ * 0.0;
          auVar181._28_4_ = auVar26._28_4_ + auVar20._28_4_ + auVar27._28_4_;
          auVar19 = vcmpps_avx(auVar181,ZEXT832(0) << 0x20,2);
          auVar208 = ZEXT3264(auVar19);
          auVar140 = vblendvps_avx(auVar140,_local_500,auVar19);
          auVar20 = vblendvps_avx(auVar21,_local_5c0,auVar19);
          auVar21 = vblendvps_avx(auVar22,auVar357,auVar19);
          auVar22 = vblendvps_avx(auVar25,auVar339,auVar19);
          auVar23 = vblendvps_avx(auVar141,auVar231,auVar19);
          auVar24 = vblendvps_avx(auVar142,auVar313,auVar19);
          auVar25 = vblendvps_avx(auVar339,auVar25,auVar19);
          auVar26 = vblendvps_avx(auVar231,auVar141,auVar19);
          auVar27 = vblendvps_avx(auVar313,auVar142,auVar19);
          _local_7c0 = vandps_avx(local_3c0,auVar310);
          auVar25 = vsubps_avx(auVar25,auVar140);
          auVar175 = vsubps_avx(auVar26,auVar20);
          auVar27 = vsubps_avx(auVar27,auVar21);
          auVar310 = vsubps_avx(auVar20,auVar23);
          fVar277 = auVar175._0_4_;
          fVar161 = auVar21._0_4_;
          fVar246 = auVar175._4_4_;
          fVar162 = auVar21._4_4_;
          auVar89._4_4_ = fVar162 * fVar246;
          auVar89._0_4_ = fVar161 * fVar277;
          fVar260 = auVar175._8_4_;
          fVar194 = auVar21._8_4_;
          auVar89._8_4_ = fVar194 * fVar260;
          fVar303 = auVar175._12_4_;
          fVar195 = auVar21._12_4_;
          auVar89._12_4_ = fVar195 * fVar303;
          fVar193 = auVar175._16_4_;
          fVar209 = auVar21._16_4_;
          auVar89._16_4_ = fVar209 * fVar193;
          fVar165 = auVar175._20_4_;
          fVar210 = auVar21._20_4_;
          auVar89._20_4_ = fVar210 * fVar165;
          fVar244 = auVar175._24_4_;
          fVar211 = auVar21._24_4_;
          auVar89._24_4_ = fVar211 * fVar244;
          auVar89._28_4_ = auVar26._28_4_;
          fVar222 = auVar20._0_4_;
          fVar167 = auVar27._0_4_;
          fVar248 = auVar20._4_4_;
          fVar278 = auVar27._4_4_;
          auVar91._4_4_ = fVar278 * fVar248;
          auVar91._0_4_ = fVar167 * fVar222;
          fVar239 = auVar20._8_4_;
          fVar212 = auVar27._8_4_;
          auVar91._8_4_ = fVar212 * fVar239;
          fVar304 = auVar20._12_4_;
          fVar261 = auVar27._12_4_;
          auVar91._12_4_ = fVar261 * fVar304;
          fVar213 = auVar20._16_4_;
          fVar263 = auVar27._16_4_;
          auVar91._16_4_ = fVar263 * fVar213;
          fVar166 = auVar20._20_4_;
          fVar271 = auVar27._20_4_;
          auVar91._20_4_ = fVar271 * fVar166;
          fVar135 = auVar20._24_4_;
          fVar273 = auVar27._24_4_;
          uVar90 = auVar141._28_4_;
          auVar91._24_4_ = fVar273 * fVar135;
          auVar91._28_4_ = uVar90;
          auVar26 = vsubps_avx(auVar91,auVar89);
          fVar233 = auVar140._0_4_;
          fVar255 = auVar140._4_4_;
          auVar92._4_4_ = fVar278 * fVar255;
          auVar92._0_4_ = fVar167 * fVar233;
          fVar190 = auVar140._8_4_;
          auVar92._8_4_ = fVar212 * fVar190;
          fVar245 = auVar140._12_4_;
          auVar92._12_4_ = fVar261 * fVar245;
          fVar137 = auVar140._16_4_;
          auVar92._16_4_ = fVar263 * fVar137;
          fVar223 = auVar140._20_4_;
          auVar92._20_4_ = fVar271 * fVar223;
          fVar136 = auVar140._24_4_;
          auVar92._24_4_ = fVar273 * fVar136;
          auVar92._28_4_ = uVar90;
          fVar235 = auVar25._0_4_;
          fVar256 = auVar25._4_4_;
          auVar93._4_4_ = fVar162 * fVar256;
          auVar93._0_4_ = fVar161 * fVar235;
          fVar301 = auVar25._8_4_;
          auVar93._8_4_ = fVar194 * fVar301;
          fVar192 = auVar25._12_4_;
          auVar93._12_4_ = fVar195 * fVar192;
          fVar157 = auVar25._16_4_;
          auVar93._16_4_ = fVar209 * fVar157;
          fVar234 = auVar25._20_4_;
          auVar93._20_4_ = fVar210 * fVar234;
          fVar155 = auVar25._24_4_;
          auVar93._24_4_ = fVar211 * fVar155;
          auVar93._28_4_ = auVar339._28_4_;
          auVar141 = vsubps_avx(auVar93,auVar92);
          auVar94._4_4_ = fVar248 * fVar256;
          auVar94._0_4_ = fVar222 * fVar235;
          auVar94._8_4_ = fVar239 * fVar301;
          auVar94._12_4_ = fVar304 * fVar192;
          auVar94._16_4_ = fVar213 * fVar157;
          auVar94._20_4_ = fVar166 * fVar234;
          auVar94._24_4_ = fVar135 * fVar155;
          auVar94._28_4_ = uVar90;
          auVar95._4_4_ = fVar255 * fVar246;
          auVar95._0_4_ = fVar233 * fVar277;
          auVar95._8_4_ = fVar190 * fVar260;
          auVar95._12_4_ = fVar245 * fVar303;
          auVar95._16_4_ = fVar137 * fVar193;
          auVar95._20_4_ = fVar223 * fVar165;
          auVar95._24_4_ = fVar136 * fVar244;
          auVar95._28_4_ = auVar142._28_4_;
          auVar142 = vsubps_avx(auVar95,auVar94);
          auVar28 = vsubps_avx(auVar21,auVar24);
          fVar240 = auVar142._28_4_ + auVar141._28_4_;
          auVar324._0_4_ = auVar142._0_4_ + auVar141._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
          auVar324._4_4_ = auVar142._4_4_ + auVar141._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
          auVar324._8_4_ = auVar142._8_4_ + auVar141._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
          auVar324._12_4_ = auVar142._12_4_ + auVar141._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
          auVar324._16_4_ = auVar142._16_4_ + auVar141._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
          auVar324._20_4_ = auVar142._20_4_ + auVar141._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
          auVar324._24_4_ = auVar142._24_4_ + auVar141._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
          auVar324._28_4_ = fVar240 + auVar26._28_4_;
          fVar237 = auVar310._0_4_;
          fVar257 = auVar310._4_4_;
          auVar96._4_4_ = auVar24._4_4_ * fVar257;
          auVar96._0_4_ = auVar24._0_4_ * fVar237;
          fVar302 = auVar310._8_4_;
          auVar96._8_4_ = auVar24._8_4_ * fVar302;
          fVar305 = auVar310._12_4_;
          auVar96._12_4_ = auVar24._12_4_ * fVar305;
          fVar160 = auVar310._16_4_;
          auVar96._16_4_ = auVar24._16_4_ * fVar160;
          fVar236 = auVar310._20_4_;
          auVar96._20_4_ = auVar24._20_4_ * fVar236;
          fVar156 = auVar310._24_4_;
          auVar96._24_4_ = auVar24._24_4_ * fVar156;
          auVar96._28_4_ = fVar240;
          fVar240 = auVar28._0_4_;
          fVar258 = auVar28._4_4_;
          auVar97._4_4_ = auVar23._4_4_ * fVar258;
          auVar97._0_4_ = auVar23._0_4_ * fVar240;
          fVar242 = auVar28._8_4_;
          auVar97._8_4_ = auVar23._8_4_ * fVar242;
          fVar306 = auVar28._12_4_;
          auVar97._12_4_ = auVar23._12_4_ * fVar306;
          fVar163 = auVar28._16_4_;
          auVar97._16_4_ = auVar23._16_4_ * fVar163;
          fVar238 = auVar28._20_4_;
          auVar97._20_4_ = auVar23._20_4_ * fVar238;
          fVar158 = auVar28._24_4_;
          auVar97._24_4_ = auVar23._24_4_ * fVar158;
          auVar97._28_4_ = auVar142._28_4_;
          auVar310 = vsubps_avx(auVar97,auVar96);
          auVar141 = vsubps_avx(auVar140,auVar22);
          fVar243 = auVar141._0_4_;
          fVar259 = auVar141._4_4_;
          auVar98._4_4_ = auVar24._4_4_ * fVar259;
          auVar98._0_4_ = auVar24._0_4_ * fVar243;
          fVar191 = auVar141._8_4_;
          auVar98._8_4_ = auVar24._8_4_ * fVar191;
          fVar247 = auVar141._12_4_;
          auVar98._12_4_ = auVar24._12_4_ * fVar247;
          fVar164 = auVar141._16_4_;
          auVar98._16_4_ = auVar24._16_4_ * fVar164;
          fVar241 = auVar141._20_4_;
          auVar98._20_4_ = auVar24._20_4_ * fVar241;
          fVar159 = auVar141._24_4_;
          auVar98._24_4_ = auVar24._24_4_ * fVar159;
          auVar98._28_4_ = auVar24._28_4_;
          auVar99._4_4_ = fVar258 * auVar22._4_4_;
          auVar99._0_4_ = fVar240 * auVar22._0_4_;
          auVar99._8_4_ = fVar242 * auVar22._8_4_;
          auVar99._12_4_ = fVar306 * auVar22._12_4_;
          auVar99._16_4_ = fVar163 * auVar22._16_4_;
          auVar99._20_4_ = fVar238 * auVar22._20_4_;
          auVar99._24_4_ = fVar158 * auVar22._24_4_;
          auVar99._28_4_ = auVar26._28_4_;
          auVar24 = vsubps_avx(auVar98,auVar99);
          auVar100._4_4_ = auVar23._4_4_ * fVar259;
          auVar100._0_4_ = auVar23._0_4_ * fVar243;
          auVar100._8_4_ = auVar23._8_4_ * fVar191;
          auVar100._12_4_ = auVar23._12_4_ * fVar247;
          auVar100._16_4_ = auVar23._16_4_ * fVar164;
          auVar100._20_4_ = auVar23._20_4_ * fVar241;
          auVar100._24_4_ = auVar23._24_4_ * fVar159;
          auVar100._28_4_ = auVar23._28_4_;
          auVar101._4_4_ = fVar257 * auVar22._4_4_;
          auVar101._0_4_ = fVar237 * auVar22._0_4_;
          auVar101._8_4_ = fVar302 * auVar22._8_4_;
          auVar101._12_4_ = fVar305 * auVar22._12_4_;
          auVar101._16_4_ = fVar160 * auVar22._16_4_;
          auVar101._20_4_ = fVar236 * auVar22._20_4_;
          auVar101._24_4_ = fVar156 * auVar22._24_4_;
          auVar101._28_4_ = auVar22._28_4_;
          auVar22 = vsubps_avx(auVar101,auVar100);
          auVar153._0_4_ = auVar310._0_4_ * 0.0 + auVar22._0_4_ + auVar24._0_4_ * 0.0;
          auVar153._4_4_ = auVar310._4_4_ * 0.0 + auVar22._4_4_ + auVar24._4_4_ * 0.0;
          auVar153._8_4_ = auVar310._8_4_ * 0.0 + auVar22._8_4_ + auVar24._8_4_ * 0.0;
          auVar153._12_4_ = auVar310._12_4_ * 0.0 + auVar22._12_4_ + auVar24._12_4_ * 0.0;
          auVar153._16_4_ = auVar310._16_4_ * 0.0 + auVar22._16_4_ + auVar24._16_4_ * 0.0;
          auVar153._20_4_ = auVar310._20_4_ * 0.0 + auVar22._20_4_ + auVar24._20_4_ * 0.0;
          auVar153._24_4_ = auVar310._24_4_ * 0.0 + auVar22._24_4_ + auVar24._24_4_ * 0.0;
          auVar153._28_4_ = auVar24._28_4_ + auVar22._28_4_ + auVar24._28_4_;
          auVar154 = ZEXT3264(auVar153);
          auVar310 = vmaxps_avx(auVar324,auVar153);
          auVar310 = vcmpps_avx(auVar310,ZEXT432(0) << 0x20,2);
          auVar22 = _local_7c0 & auVar310;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
LAB_009b6ac3:
            auVar330 = auVar28._4_12_;
            auVar183 = ZEXT3264(CONCAT824(uStack_4c8,
                                          CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
          }
          else {
            auVar22 = vandps_avx(auVar310,_local_7c0);
            auVar102._4_4_ = fVar258 * fVar246;
            auVar102._0_4_ = fVar240 * fVar277;
            auVar102._8_4_ = fVar242 * fVar260;
            auVar102._12_4_ = fVar306 * fVar303;
            auVar102._16_4_ = fVar163 * fVar193;
            auVar102._20_4_ = fVar238 * fVar165;
            auVar102._24_4_ = fVar158 * fVar244;
            auVar102._28_4_ = local_7c0._28_4_;
            auVar103._4_4_ = fVar257 * fVar278;
            auVar103._0_4_ = fVar237 * fVar167;
            auVar103._8_4_ = fVar302 * fVar212;
            auVar103._12_4_ = fVar305 * fVar261;
            auVar103._16_4_ = fVar160 * fVar263;
            auVar103._20_4_ = fVar236 * fVar271;
            auVar103._24_4_ = fVar156 * fVar273;
            auVar103._28_4_ = auVar310._28_4_;
            auVar23 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = fVar259 * fVar278;
            auVar104._0_4_ = fVar243 * fVar167;
            auVar104._8_4_ = fVar191 * fVar212;
            auVar104._12_4_ = fVar247 * fVar261;
            auVar104._16_4_ = fVar164 * fVar263;
            auVar104._20_4_ = fVar241 * fVar271;
            auVar104._24_4_ = fVar159 * fVar273;
            auVar104._28_4_ = auVar27._28_4_;
            auVar105._4_4_ = fVar258 * fVar256;
            auVar105._0_4_ = fVar240 * fVar235;
            auVar105._8_4_ = fVar242 * fVar301;
            auVar105._12_4_ = fVar306 * fVar192;
            auVar105._16_4_ = fVar163 * fVar157;
            auVar105._20_4_ = fVar238 * fVar234;
            auVar105._24_4_ = fVar158 * fVar155;
            auVar105._28_4_ = auVar28._28_4_;
            auVar24 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = fVar257 * fVar256;
            auVar106._0_4_ = fVar237 * fVar235;
            auVar106._8_4_ = fVar302 * fVar301;
            auVar106._12_4_ = fVar305 * fVar192;
            auVar106._16_4_ = fVar160 * fVar157;
            auVar106._20_4_ = fVar236 * fVar234;
            auVar106._24_4_ = fVar156 * fVar155;
            auVar106._28_4_ = auVar25._28_4_;
            auVar107._4_4_ = fVar259 * fVar246;
            auVar107._0_4_ = fVar243 * fVar277;
            auVar107._8_4_ = fVar191 * fVar260;
            auVar107._12_4_ = fVar247 * fVar303;
            auVar107._16_4_ = fVar164 * fVar193;
            auVar107._20_4_ = fVar241 * fVar165;
            auVar107._24_4_ = fVar159 * fVar244;
            auVar107._28_4_ = auVar175._28_4_;
            auVar26 = vsubps_avx(auVar107,auVar106);
            auVar182._0_4_ = auVar23._0_4_ * 0.0 + auVar26._0_4_ + auVar24._0_4_ * 0.0;
            auVar182._4_4_ = auVar23._4_4_ * 0.0 + auVar26._4_4_ + auVar24._4_4_ * 0.0;
            auVar182._8_4_ = auVar23._8_4_ * 0.0 + auVar26._8_4_ + auVar24._8_4_ * 0.0;
            auVar182._12_4_ = auVar23._12_4_ * 0.0 + auVar26._12_4_ + auVar24._12_4_ * 0.0;
            auVar182._16_4_ = auVar23._16_4_ * 0.0 + auVar26._16_4_ + auVar24._16_4_ * 0.0;
            auVar182._20_4_ = auVar23._20_4_ * 0.0 + auVar26._20_4_ + auVar24._20_4_ * 0.0;
            auVar182._24_4_ = auVar23._24_4_ * 0.0 + auVar26._24_4_ + auVar24._24_4_ * 0.0;
            auVar182._28_4_ = auVar175._28_4_ + auVar26._28_4_ + auVar25._28_4_;
            auVar310 = vrcpps_avx(auVar182);
            fVar235 = auVar310._0_4_;
            fVar237 = auVar310._4_4_;
            auVar108._4_4_ = auVar182._4_4_ * fVar237;
            auVar108._0_4_ = auVar182._0_4_ * fVar235;
            fVar240 = auVar310._8_4_;
            auVar108._8_4_ = auVar182._8_4_ * fVar240;
            fVar243 = auVar310._12_4_;
            auVar108._12_4_ = auVar182._12_4_ * fVar243;
            fVar277 = auVar310._16_4_;
            auVar108._16_4_ = auVar182._16_4_ * fVar277;
            fVar246 = auVar310._20_4_;
            auVar108._20_4_ = auVar182._20_4_ * fVar246;
            fVar256 = auVar310._24_4_;
            auVar108._24_4_ = auVar182._24_4_ * fVar256;
            auVar108._28_4_ = auVar28._28_4_;
            auVar335._8_4_ = 0x3f800000;
            auVar335._0_8_ = 0x3f8000003f800000;
            auVar335._12_4_ = 0x3f800000;
            auVar335._16_4_ = 0x3f800000;
            auVar335._20_4_ = 0x3f800000;
            auVar335._24_4_ = 0x3f800000;
            auVar335._28_4_ = 0x3f800000;
            auVar310 = vsubps_avx(auVar335,auVar108);
            auVar327._0_4_ = auVar310._0_4_ * fVar235;
            auVar327._4_4_ = auVar310._4_4_ * fVar237;
            auVar327._8_4_ = auVar310._8_4_ * fVar240;
            auVar327._12_4_ = auVar310._12_4_ * fVar243;
            fVar257 = auVar310._16_4_ * fVar277;
            auVar28._16_4_ = fVar257;
            auVar28._0_16_ = auVar327;
            fVar258 = auVar310._20_4_ * fVar246;
            auVar28._20_4_ = fVar258;
            fVar259 = auVar310._24_4_ * fVar256;
            auVar28._24_4_ = fVar259;
            auVar28._28_4_ = auVar310._28_4_;
            auVar330 = auVar327._4_12_;
            fVar235 = auVar327._0_4_ + fVar235;
            fVar237 = auVar327._4_4_ + fVar237;
            fVar240 = auVar327._8_4_ + fVar240;
            fVar243 = auVar327._12_4_ + fVar243;
            fVar257 = fVar257 + fVar277;
            fVar258 = fVar258 + fVar246;
            fVar259 = fVar259 + fVar256;
            auVar109._4_4_ =
                 (fVar255 * auVar23._4_4_ + auVar24._4_4_ * fVar248 + auVar26._4_4_ * fVar162) *
                 fVar237;
            auVar109._0_4_ =
                 (fVar233 * auVar23._0_4_ + auVar24._0_4_ * fVar222 + auVar26._0_4_ * fVar161) *
                 fVar235;
            auVar109._8_4_ =
                 (fVar190 * auVar23._8_4_ + auVar24._8_4_ * fVar239 + auVar26._8_4_ * fVar194) *
                 fVar240;
            auVar109._12_4_ =
                 (fVar245 * auVar23._12_4_ + auVar24._12_4_ * fVar304 + auVar26._12_4_ * fVar195) *
                 fVar243;
            auVar109._16_4_ =
                 (fVar137 * auVar23._16_4_ + auVar24._16_4_ * fVar213 + auVar26._16_4_ * fVar209) *
                 fVar257;
            auVar109._20_4_ =
                 (fVar223 * auVar23._20_4_ + auVar24._20_4_ * fVar166 + auVar26._20_4_ * fVar210) *
                 fVar258;
            auVar109._24_4_ =
                 (fVar136 * auVar23._24_4_ + auVar24._24_4_ * fVar135 + auVar26._24_4_ * fVar211) *
                 fVar259;
            auVar109._28_4_ = auVar140._28_4_ + auVar20._28_4_ + auVar21._28_4_;
            fVar277 = ray->tfar;
            auVar232._4_4_ = fVar277;
            auVar232._0_4_ = fVar277;
            auVar232._8_4_ = fVar277;
            auVar232._12_4_ = fVar277;
            auVar232._16_4_ = fVar277;
            auVar232._20_4_ = fVar277;
            auVar232._24_4_ = fVar277;
            auVar232._28_4_ = fVar277;
            auVar121._8_8_ = uStack_f8;
            auVar121._0_8_ = local_100;
            auVar121._16_8_ = uStack_f0;
            auVar121._24_8_ = uStack_e8;
            auVar140 = vcmpps_avx(auVar121,auVar109,2);
            auVar310 = vcmpps_avx(auVar109,auVar232,2);
            auVar140 = vandps_avx(auVar140,auVar310);
            auVar20 = auVar22 & auVar140;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0x7f,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0xbf,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar20[0x1f]) goto LAB_009b6ac3;
            auVar140 = vandps_avx(auVar22,auVar140);
            auVar20 = vcmpps_avx(ZEXT432(0) << 0x20,auVar182,4);
            auVar21 = auVar140 & auVar20;
            auVar183 = ZEXT3264(CONCAT824(uStack_4c8,
                                          CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar140 = vandps_avx(auVar20,auVar140);
              auVar183 = ZEXT3264(auVar140);
              auVar110._4_4_ = auVar324._4_4_ * fVar237;
              auVar110._0_4_ = auVar324._0_4_ * fVar235;
              auVar110._8_4_ = auVar324._8_4_ * fVar240;
              auVar110._12_4_ = auVar324._12_4_ * fVar243;
              auVar110._16_4_ = auVar324._16_4_ * fVar257;
              auVar110._20_4_ = auVar324._20_4_ * fVar258;
              auVar110._24_4_ = auVar324._24_4_ * fVar259;
              auVar110._28_4_ = auVar310._28_4_;
              auVar111._4_4_ = auVar153._4_4_ * fVar237;
              auVar111._0_4_ = auVar153._0_4_ * fVar235;
              auVar111._8_4_ = auVar153._8_4_ * fVar240;
              auVar111._12_4_ = auVar153._12_4_ * fVar243;
              auVar111._16_4_ = auVar153._16_4_ * fVar257;
              auVar111._20_4_ = auVar153._20_4_ * fVar258;
              auVar111._24_4_ = auVar153._24_4_ * fVar259;
              auVar111._28_4_ = auVar153._28_4_;
              auVar269._8_4_ = 0x3f800000;
              auVar269._0_8_ = 0x3f8000003f800000;
              auVar269._12_4_ = 0x3f800000;
              auVar269._16_4_ = 0x3f800000;
              auVar269._20_4_ = 0x3f800000;
              auVar269._24_4_ = 0x3f800000;
              auVar269._28_4_ = 0x3f800000;
              auVar140 = vsubps_avx(auVar269,auVar110);
              _local_180 = vblendvps_avx(auVar140,auVar110,auVar19);
              auVar140 = vsubps_avx(auVar269,auVar111);
              _local_400 = vblendvps_avx(auVar140,auVar111,auVar19);
              auVar154 = ZEXT3264(_local_400);
              local_1a0 = auVar109;
            }
          }
          uVar130 = uVar130 & 0xffffffff;
          auVar314 = ZEXT3264(local_720);
          auVar300 = ZEXT3264(local_700);
          auVar140 = auVar183._0_32_;
          auVar347 = ZEXT3264(_local_600);
          if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0x7f,0) == '\0') &&
                (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar140 >> 0xbf,0) == '\0') &&
              (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar183[0x1f]) {
            auVar325 = ZEXT3264(local_6e0);
            auVar290 = ZEXT3264(_local_580);
          }
          else {
            auVar310 = vsubps_avx(local_6c0,_local_760);
            fVar222 = (float)local_760._0_4_ + auVar310._0_4_ * (float)local_180._0_4_;
            fVar233 = (float)local_760._4_4_ + auVar310._4_4_ * (float)local_180._4_4_;
            fVar235 = (float)uStack_758 + auVar310._8_4_ * fStack_178;
            fVar237 = uStack_758._4_4_ + auVar310._12_4_ * fStack_174;
            fVar240 = fStack_750 + auVar310._16_4_ * fStack_170;
            fVar243 = fStack_74c + auVar310._20_4_ * fStack_16c;
            fVar246 = fStack_748 + auVar310._24_4_ * fStack_168;
            fVar248 = fStack_744 + auVar310._28_4_;
            fVar277 = local_7e8->depth_scale;
            auVar208 = ZEXT3264(CONCAT428(fVar277,CONCAT424(fVar277,CONCAT420(fVar277,CONCAT416(
                                                  fVar277,CONCAT412(fVar277,CONCAT48(fVar277,
                                                  CONCAT44(fVar277,fVar277))))))));
            auVar112._4_4_ = (fVar233 + fVar233) * fVar277;
            auVar112._0_4_ = (fVar222 + fVar222) * fVar277;
            auVar112._8_4_ = (fVar235 + fVar235) * fVar277;
            auVar112._12_4_ = (fVar237 + fVar237) * fVar277;
            auVar112._16_4_ = (fVar240 + fVar240) * fVar277;
            auVar112._20_4_ = (fVar243 + fVar243) * fVar277;
            auVar112._24_4_ = (fVar246 + fVar246) * fVar277;
            auVar112._28_4_ = fVar248 + fVar248;
            auVar310 = vcmpps_avx(local_1a0,auVar112,6);
            auVar154 = ZEXT3264(auVar310);
            auVar20 = auVar140 & auVar310;
            auVar290 = ZEXT3264(_local_580);
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0x7f,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0xbf,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar20[0x1f]) {
              auVar325 = ZEXT3264(local_6e0);
            }
            else {
              local_220 = vandps_avx(auVar310,auVar140);
              auVar154 = ZEXT3264(local_220);
              auVar173._0_8_ =
                   CONCAT44((float)local_400._4_4_ + (float)local_400._4_4_ + -1.0,
                            (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0);
              auVar173._8_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
              auVar173._12_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
              auVar174._16_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
              auVar174._0_16_ = auVar173;
              auVar174._20_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
              fStack_2a8 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
              _local_2c0 = auVar174;
              fStack_2a4 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
              auVar183 = ZEXT3264(_local_2c0);
              local_2e0 = _local_180;
              local_2a0 = local_1a0;
              local_27c = uVar124;
              local_270 = local_7d0;
              uStack_268 = uStack_7c8;
              local_260 = local_530;
              uStack_258 = uStack_528;
              local_250 = local_540;
              uStack_248 = uStack_538;
              auVar208 = ZEXT1664(_local_550);
              local_240 = _local_550;
              pGVar17 = (context->scene->geometries).items[local_728].ptr;
              local_760 = (undefined1  [8])pGVar17;
              _local_400 = _local_2c0;
              auVar140 = _local_400;
              if ((pGVar17->mask & ray->mask) == 0) {
                pRVar128 = (RTCIntersectArguments *)0x0;
LAB_009b6aa3:
                uVar134 = local_780._0_4_;
              }
              else {
                pRVar128 = context->args;
                if ((pRVar128->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar128 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pGVar17 >> 8),1),
                   pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar200._0_4_ = (float)(int)local_280;
                  auVar200._4_12_ = auVar330;
                  auVar362 = vshufps_avx(auVar200,auVar200,0);
                  auVar208 = ZEXT3264(CONCAT1616(auVar362,auVar362));
                  local_200[0] = (auVar362._0_4_ + (float)local_180._0_4_ + 0.0) *
                                 (float)local_120._0_4_;
                  local_200[1] = (auVar362._4_4_ + (float)local_180._4_4_ + 1.0) *
                                 (float)local_120._4_4_;
                  local_200[2] = (auVar362._8_4_ + fStack_178 + 2.0) * fStack_118;
                  local_200[3] = (auVar362._12_4_ + fStack_174 + 3.0) * fStack_114;
                  fStack_1f0 = (auVar362._0_4_ + fStack_170 + 4.0) * fStack_110;
                  fStack_1ec = (auVar362._4_4_ + fStack_16c + 5.0) * fStack_10c;
                  fStack_1e8 = (auVar362._8_4_ + fStack_168 + 6.0) * fStack_108;
                  fStack_1e4 = auVar362._12_4_ + fStack_164 + 7.0;
                  uStack_3f8 = auVar173._8_8_;
                  uStack_3f0 = auVar174._16_8_;
                  uStack_3e8 = local_2c0._24_8_;
                  local_1e0 = auVar173._0_8_;
                  uStack_1d8 = uStack_3f8;
                  uStack_1d0 = uStack_3f0;
                  uStack_1c8 = uStack_3e8;
                  auVar183 = ZEXT3264(local_1a0);
                  local_1c0 = local_1a0;
                  uVar134 = vmovmskps_avx(local_220);
                  uVar130 = CONCAT44((int)((ulong)pRVar128 >> 0x20),uVar134);
                  lVar129 = 0;
                  _local_400 = auVar140;
                  if (uVar130 != 0) {
                    for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
                    }
                  }
                  while( true ) {
                    local_7c0 = (undefined1  [8])lVar129;
                    local_6c0._0_8_ = uVar130;
                    if (uVar130 == 0) break;
                    local_624 = local_200[lVar129];
                    auVar154 = ZEXT464((uint)local_624);
                    local_620 = *(uint *)((long)&local_1e0 + lVar129 * 4);
                    auVar183 = ZEXT464(local_620);
                    local_5a0._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1c0 + lVar129 * 4);
                    local_690.context = context->user;
                    fVar270 = 1.0 - local_624;
                    fVar262 = local_624 * fVar270 * 4.0;
                    auVar362 = ZEXT416((uint)(local_624 * local_624 * 0.5));
                    auVar362 = vshufps_avx(auVar362,auVar362,0);
                    auVar201 = ZEXT416((uint)((fVar270 * fVar270 + fVar262) * 0.5));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar221 = ZEXT416((uint)((-local_624 * local_624 - fVar262) * 0.5));
                    auVar221 = vshufps_avx(auVar221,auVar221,0);
                    auVar215 = ZEXT416((uint)(fVar270 * -fVar270 * 0.5));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar202._0_4_ =
                         auVar215._0_4_ * (float)local_7d0._0_4_ +
                         auVar221._0_4_ * (float)local_530._0_4_ +
                         auVar362._0_4_ * (float)local_550._0_4_ +
                         auVar201._0_4_ * (float)local_540._0_4_;
                    auVar202._4_4_ =
                         auVar215._4_4_ * (float)local_7d0._4_4_ +
                         auVar221._4_4_ * (float)local_530._4_4_ +
                         auVar362._4_4_ * (float)local_550._4_4_ +
                         auVar201._4_4_ * (float)local_540._4_4_;
                    auVar202._8_4_ =
                         auVar215._8_4_ * (float)uStack_7c8 +
                         auVar221._8_4_ * (float)uStack_528 +
                         auVar362._8_4_ * fStack_548 + auVar201._8_4_ * (float)uStack_538;
                    auVar202._12_4_ =
                         auVar215._12_4_ * uStack_7c8._4_4_ +
                         auVar221._12_4_ * uStack_528._4_4_ +
                         auVar362._12_4_ * fStack_544 + auVar201._12_4_ * uStack_538._4_4_;
                    auVar208 = ZEXT1664(auVar202);
                    local_630 = vmovlps_avx(auVar202);
                    local_628 = vextractps_avx(auVar202,2);
                    local_61c = local_7d4;
                    local_618 = (int)local_728;
                    local_614 = (local_690.context)->instID[0];
                    local_610 = (local_690.context)->instPrimID[0];
                    local_804 = -1;
                    local_690.valid = &local_804;
                    local_690.geometryUserPtr = *(void **)((long)local_760 + 0x18);
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_630;
                    local_690.N = 1;
                    if (*(code **)((long)local_760 + 0x48) == (code *)0x0) {
LAB_009b6a17:
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_760 + 0x3e) & 0x40) != 0)))) {
                        auVar208 = ZEXT1664(auVar208._0_16_);
                        auVar362 = (*p_Var18)(&local_690);
                        auVar183._0_8_ = auVar362._8_8_;
                        auVar154._0_8_ = auVar362._0_8_;
                        auVar183._8_56_ = extraout_var_02;
                        auVar154._8_56_ = extraout_var_00;
                        if (*local_690.valid == 0) goto LAB_009b6a62;
                      }
                      pRVar128 = (RTCIntersectArguments *)0x1;
                      goto LAB_009b6b0d;
                    }
                    auVar208 = ZEXT1664(auVar202);
                    auVar362 = (**(code **)((long)local_760 + 0x48))(&local_690);
                    auVar183._0_8_ = auVar362._8_8_;
                    auVar154._0_8_ = auVar362._0_8_;
                    auVar183._8_56_ = extraout_var_01;
                    auVar154._8_56_ = extraout_var;
                    if (*local_690.valid != 0) goto LAB_009b6a17;
LAB_009b6a62:
                    auVar154 = ZEXT464((uint)local_5a0._0_4_);
                    ray->tfar = (float)local_5a0._0_4_;
                    uVar130 = local_6c0._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                    lVar129 = 0;
                    if (uVar130 != 0) {
                      for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
                      }
                    }
                  }
                  pRVar128 = (RTCIntersectArguments *)0x0;
LAB_009b6b0d:
                  auVar300 = ZEXT3264(local_700);
                  auVar314 = ZEXT3264(local_720);
                  auVar290 = ZEXT3264(_local_580);
                  auVar347 = ZEXT3264(_local_600);
                  fVar168 = (float)local_7a0._0_4_;
                  fVar184 = (float)local_7a0._4_4_;
                  fVar186 = fStack_798;
                  fVar188 = fStack_794;
                  fVar262 = fStack_790;
                  fVar270 = fStack_78c;
                  fVar272 = fStack_788;
                  fVar169 = (float)local_660._0_4_;
                  fVar185 = (float)local_660._4_4_;
                  fVar187 = fStack_658;
                  fVar189 = fStack_654;
                  fVar274 = fStack_650;
                  fVar275 = fStack_64c;
                  fVar276 = fStack_648;
                  goto LAB_009b6aa3;
                }
              }
              auVar325 = ZEXT3264(local_6e0);
              uVar130 = (ulong)CONCAT31((int3)((uint)uVar134 >> 8),(byte)uVar134 | (byte)pRVar128);
              lVar129 = local_800._0_8_;
            }
          }
        }
      }
    }
    if ((uVar130 & 1) != 0) break;
    fVar262 = ray->tfar;
    auVar150._4_4_ = fVar262;
    auVar150._0_4_ = fVar262;
    auVar150._8_4_ = fVar262;
    auVar150._12_4_ = fVar262;
    auVar150._16_4_ = fVar262;
    auVar150._20_4_ = fVar262;
    auVar150._24_4_ = fVar262;
    auVar150._28_4_ = fVar262;
    auVar140 = vcmpps_avx(local_80,auVar150,2);
    uVar124 = vmovmskps_avx(auVar140);
    uVar133 = (ulong)((uint)uVar132 & uVar124);
  }
  return uVar133 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }